

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  undefined1 *__dest;
  long lVar4;
  byte *__dest_00;
  bool bVar5;
  lzham_decompress_status_t lVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  ushort *puVar14;
  uint64 uVar15;
  uint *puVar16;
  uint *puVar17;
  byte bVar18;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  undefined1 *puVar23;
  decoder_tables *pdVar24;
  undefined1 *puVar25;
  uint uVar26;
  char cVar27;
  int iVar28;
  void *pvVar29;
  byte *pbVar30;
  byte *pbVar31;
  int iVar32;
  lzham_decompressor *pState;
  quasi_adaptive_huffman_data_model *pqVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  size_t sVar48;
  long lVar49;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  int iStack_84;
  undefined8 uStack_80;
  undefined8 uStack_78;
  uint *puStack_70;
  uint *puStack_68;
  undefined8 uStack_58;
  uint *puStack_48;
  ulong uStack_40;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x13c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      ((pOut_buf == (lzham_uint8 *)0x0 && (*pOut_buf_size != 0)))))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x100) = pIn_buf;
  *(size_t **)((long)p + 0x108) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x110) = pOut_buf;
  *(size_t **)((long)p + 0x118) = pOut_buf_size;
  *(bool *)((long)p + 0x120) = no_more_input_bytes_flag != 0;
  if ((*(byte *)((long)p + 0x144) & 1) != 0) {
    if (*(lzham_uint8 **)((long)p + 0x128) == (lzham_uint8 *)0x0) {
      *(lzham_uint8 **)((long)p + 0x128) = pOut_buf;
      *(size_t *)((long)p + 0x130) = *pOut_buf_size;
      lVar6 = lzham_decompressor::decompress<true>((lzham_decompressor *)p);
      return lVar6;
    }
    if (*(lzham_uint8 **)((long)p + 0x128) != pOut_buf) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    if (*(size_t *)((long)p + 0x130) != *pOut_buf_size) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    puVar13 = *(ulong **)((long)p + 0x118);
    uVar44 = *puVar13;
    __dest = *(undefined1 **)((long)p + 0x110);
    iVar47 = *(int *)((long)p + 8);
    if (iVar47 < 0x318) {
      if (iVar47 < 0x22b) {
        if (iVar47 < 0x1e2) {
          if (iVar47 < 0x19a) {
            if (iVar47 == 0) {
              uStack_40 = 0;
              bVar5 = symbol_codec::start_decoding
                                ((symbol_codec *)((long)p + 0x18),*(uint8 **)((long)p + 0x100),
                                 **(size_t **)((long)p + 0x108),*(bool *)((long)p + 0x120),
                                 (need_bytes_func_ptr)0x0,(void *)0x0);
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              puStack_48 = *(uint **)((long)p + 0x28);
              uVar19 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uVar40 = 0;
              uVar45 = 0;
              uVar35 = 0;
              uVar26 = 0;
              uStack_80._4_4_ = 0;
              uStack_90 = 0;
              lVar49 = 0;
              uStack_8c = 0;
              uVar8 = 0;
              uVar37 = 0;
              if ((*(byte *)((long)p + 0x144) & 4) != 0) goto LAB_0010811d;
LAB_001089f5:
              uVar9 = *(uint *)((long)p + 0x158);
              uVar36 = *(uint *)((long)p + 0x15c);
              if (uVar36 == 0 && uVar9 == 0) {
                uVar45 = *(uint *)((long)p + 0x140);
                uVar26 = 0x14;
                if (uVar45 < 0x14) {
                  uVar26 = uVar45;
                }
                uVar21 = 7;
                if (uVar45 != 0) {
                  uVar21 = (ulong)(uVar26 - 1);
                }
                uVar9 = (uint)*(ushort *)(g_table_update_settings + uVar21 * 4);
                uVar36 = (uint)*(ushort *)(g_table_update_settings + uVar21 * 4 + 2);
              }
              bVar5 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x168),*p,false,
                                 0x100,uVar9,uVar36,(uint16 *)0x0);
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::assign
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x1f8),
                                 (quasi_adaptive_huffman_data_model *)((long)p + 0x168));
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x288),*p,false,
                                 *(int *)((long)p + 0x14) * 8 - 6,uVar9,uVar36,(uint16 *)0x0);
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x318),*p,false,
                                 0x101,uVar9,uVar36,(uint16 *)0x0);
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::assign
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x3a8),
                                 (quasi_adaptive_huffman_data_model *)((long)p + 0x318));
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x438),*p,false,
                                 0xfa,uVar9,uVar36,(uint16 *)0x0);
              if (!bVar5) {
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              bVar5 = quasi_adaptive_huffman_data_model::assign
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x4c8),
                                 (quasi_adaptive_huffman_data_model *)((long)p + 0x438));
              if (bVar5) {
                bVar5 = quasi_adaptive_huffman_data_model::init2
                                  ((quasi_adaptive_huffman_data_model *)((long)p + 0x558),*p,false,
                                   0x10,uVar9,uVar36,(uint16 *)0x0);
                if (bVar5) goto LAB_0010a04f;
                return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
              }
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            if (iVar47 == 0x188) {
              puStack_48 = *(uint **)((long)p + 0x100);
              plVar12 = *(long **)((long)p + 0x108);
              lVar22 = *plVar12;
              *(uint **)((long)p + 0x20) = puStack_48;
              *(uint **)((long)p + 0x28) = puStack_48;
              *(long *)((long)p + 0x38) = lVar22;
              *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
              *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
              puVar17 = puStack_48;
              if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                uVar8 = *(uint *)((long)p + 0x690);
                uVar26 = *(uint *)((long)p + 0x694);
                uVar35 = *(uint *)((long)p + 0x698);
                uVar45 = *(uint *)((long)p + 0x69c);
                uVar40 = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar19 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                if (lVar22 < 1) {
                  uVar21 = 0;
                  goto LAB_0010810b;
                }
                do {
                  uVar21 = (ulong)(byte)*puStack_48;
                  puStack_48 = (uint *)((long)puStack_48 + 1);
LAB_0010810b:
                  while( true ) {
                    cVar27 = (char)uVar46;
                    uVar46 = uVar46 + 8;
                    uVar19 = uVar19 | uVar21 << (0x38U - cVar27 & 0x3f);
                    uVar37 = uVar8;
LAB_0010811d:
                    uVar8 = uVar37;
                    if (7 < (int)uVar46) {
                      *(uint *)((long)p + 0x710) = (uint)(byte)(uVar19 >> 0x38);
                      uVar19 = uVar19 << 8;
                      iVar47 = uVar46 - 8;
                      goto LAB_0010813f;
                    }
                    if (puStack_48 != *(uint **)((long)p + 0x30)) break;
                    uVar21 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar19;
                      *(uint *)((long)p + 0x60) = uVar46;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      *(uint *)((long)p + 0x690) = uVar8;
                      *(uint *)((long)p + 0x694) = uVar26;
                      *(uint *)((long)p + 0x698) = uVar35;
                      *(uint *)((long)p + 0x69c) = uVar45;
                      *(uint *)((long)p + 0x6a0) = uVar40;
                      *(int *)((long)p + 0x678) = (int)uStack_40;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar17 = *(uint **)((long)p + 0x20);
                      goto LAB_00108937;
                    }
                  }
                } while( true );
              }
LAB_00108937:
              *plVar12 = (long)puStack_48 - (long)puVar17;
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x188;
            }
            else {
              if (iVar47 != 0x189) goto switchD_00105fec_caseD_458;
              puStack_48 = *(uint **)((long)p + 0x100);
              plVar12 = *(long **)((long)p + 0x108);
              lVar22 = *plVar12;
              *(uint **)((long)p + 0x20) = puStack_48;
              *(uint **)((long)p + 0x28) = puStack_48;
              *(long *)((long)p + 0x38) = lVar22;
              *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
              *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
              puVar17 = puStack_48;
              if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                uVar8 = *(uint *)((long)p + 0x690);
                uVar26 = *(uint *)((long)p + 0x694);
                uVar35 = *(uint *)((long)p + 0x698);
                uVar45 = *(uint *)((long)p + 0x69c);
                uVar40 = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar19 = *(ulong *)((long)p + 0x58);
                iVar47 = *(int *)((long)p + 0x60);
                if (lVar22 < 1) {
                  uVar21 = 0;
                  goto LAB_0010675c;
                }
                do {
                  uVar21 = (ulong)(byte)*puStack_48;
                  puStack_48 = (uint *)((long)puStack_48 + 1);
LAB_0010675c:
                  while( true ) {
                    cVar27 = (char)iVar47;
                    iVar47 = iVar47 + 8;
                    uVar19 = uVar19 | uVar21 << (0x38U - cVar27 & 0x3f);
LAB_0010813f:
                    if (7 < iVar47) {
                      uVar46 = (uint)(byte)(uVar19 >> 0x38);
                      *(uint *)((long)p + 0x714) = uVar46;
                      if ((*(uint *)((long)p + 0x710) & 0xf) != 0xe) {
                        return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                      }
                      if ((*(uint *)((long)p + 0x710) << 8 | uVar46) % 0x1f != 0) {
                        return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                      }
                      if ((uVar19 >> 0x38 & 0x20) != 0) {
                        return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
                      }
                      uVar46 = iVar47 - 8;
                      uVar19 = uVar19 << 8;
                      lVar49 = (ulong)uVar35 << 0x20;
                      uStack_80._4_4_ = uVar40;
                      uStack_90 = uVar45;
                      uStack_8c = uVar26;
                      goto LAB_001089f5;
                    }
                    if (puStack_48 != *(uint **)((long)p + 0x30)) break;
                    uVar21 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar19;
                      *(int *)((long)p + 0x60) = iVar47;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      *(uint *)((long)p + 0x690) = uVar8;
                      *(uint *)((long)p + 0x694) = uVar26;
                      *(uint *)((long)p + 0x698) = uVar35;
                      *(uint *)((long)p + 0x69c) = uVar45;
                      *(uint *)((long)p + 0x6a0) = uVar40;
                      *(int *)((long)p + 0x678) = (int)uStack_40;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar17 = *(uint **)((long)p + 0x20);
                      goto LAB_001087db;
                    }
                  }
                } while( true );
              }
LAB_001087db:
              *plVar12 = (long)puStack_48 - (long)puVar17;
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x189;
            }
          }
          else if (iVar47 < 0x1d8) {
            if (iVar47 == 0x19a) {
              puVar16 = *(uint **)((long)p + 0x100);
              lVar22 = **(long **)((long)p + 0x108);
              bVar18 = *(byte *)((long)p + 0x120);
              *(uint **)((long)p + 0x20) = puVar16;
              *(uint **)((long)p + 0x28) = puVar16;
              *(long *)((long)p + 0x38) = lVar22;
              puVar17 = (uint *)((long)puVar16 + lVar22);
              *(uint **)((long)p + 0x30) = puVar17;
              *(byte *)((long)p + 0x40) = bVar18;
              puVar20 = puVar16;
              if ((lVar22 != 0 | bVar18) == 1) {
                uVar8 = *(uint *)((long)p + 0x690);
                uStack_8c = *(uint *)((long)p + 0x694);
                lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
                uStack_90 = *(uint *)((long)p + 0x69c);
                uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar21 = *(ulong *)((long)p + 0x58);
                uVar45 = *(uint *)((long)p + 0x718);
                uVar26 = *(uint *)((long)p + 0x71c);
                puStack_48 = puVar16;
                uVar35 = *(uint *)((long)p + 0x60);
                do {
                  uVar40 = uVar26;
                  if (puVar17 <= puStack_48) {
                    uVar19 = 0;
                    goto LAB_0010772b;
                  }
                  do {
                    uVar19 = (ulong)(byte)*puStack_48;
                    puStack_48 = (uint *)((long)puStack_48 + 1);
LAB_0010772b:
                    uVar46 = uVar35 + 8;
                    uVar21 = uVar19 << (0x38U - (char)uVar35 & 0x3f) | uVar21;
                    if (-1 < (int)uVar35) {
                      do {
                        uVar46 = uVar35;
                        uVar19 = uVar21 << 8;
                        uVar45 = uVar45 << 8 | (uint)(byte)(uVar21 >> 0x38);
                        uVar26 = uVar40 + 1;
                        if (3 < uVar26) {
                          *(uint *)((long)p + 0x718) = uVar45;
                          *(uint *)((long)p + 0x71c) = uVar40 + 1;
                          uVar9 = adler32(*(void **)((long)p + 0x150),
                                          (ulong)*(uint *)((long)p + 0x148),1);
                          if (uVar9 != *(uint *)((long)p + 0x718)) {
                            return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                          }
                          goto LAB_001089f5;
                        }
                        uVar21 = uVar19;
                        uVar40 = uVar26;
                        uVar35 = uVar46 - 8;
                      } while (0xf < (int)(uVar46 + 8));
                      *(uint *)((long)p + 0x718) = uVar45;
                      *(uint *)((long)p + 0x71c) = uVar26;
                    }
                    uVar35 = uVar46;
                  } while (puStack_48 != puVar17);
                  puStack_48 = puVar17;
                } while (bVar18 != 0);
                *(ulong *)((long)p + 0x58) = uVar21;
                *(uint *)((long)p + 0x60) = uVar46;
                *(uint **)((long)p + 0x28) = puVar17;
                puVar20 = puVar17;
              }
              **(long **)((long)p + 0x108) = (long)puVar20 - (long)puVar16;
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x19a;
            }
            else {
              if (iVar47 != 0x1d2) goto switchD_00105fec_caseD_458;
              puVar17 = *(uint **)((long)p + 0x100);
              plVar12 = *(long **)((long)p + 0x108);
              lVar22 = *plVar12;
              *(uint **)((long)p + 0x20) = puVar17;
              *(uint **)((long)p + 0x28) = puVar17;
              *(long *)((long)p + 0x38) = lVar22;
              *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
              *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
              puStack_48 = puVar17;
              if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                uVar8 = *(uint *)((long)p + 0x690);
                uStack_8c = *(uint *)((long)p + 0x694);
                uVar45 = *(uint *)((long)p + 0x698);
                uStack_90 = *(uint *)((long)p + 0x69c);
                uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
                uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar19 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                if (0 < lVar22) goto LAB_00105e62;
                lVar49 = (ulong)uVar45 << 0x20;
                uVar21 = 0;
                goto LAB_00105e70;
              }
LAB_0010858f:
              *plVar12 = (long)puStack_48 - (long)puVar17;
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x1d2;
            }
          }
          else if (iVar47 == 0x1d8) {
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puStack_48 = puVar17;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar19 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00107878;
              uVar21 = 0;
              goto LAB_0010787e;
            }
LAB_00108757:
            *plVar12 = (long)puStack_48 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1d8;
          }
          else {
            if (iVar47 != 0x1e0) goto switchD_00105fec_caseD_458;
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puStack_48 = puVar17;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00106c79;
              uVar19 = 0;
              goto LAB_00106c7f;
            }
LAB_001085e7:
            *plVar12 = (long)puStack_48 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1e0;
          }
        }
        else {
          if (0x1f0 < iVar47) {
            if (iVar47 < 0x213) {
              if (iVar47 == 0x1f1) {
LAB_0010a2b4:
                *(undefined4 *)((long)p + 8) = 0x1f1;
                return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
              }
              if (iVar47 == 0x1fc) {
                puStack_48 = *(uint **)((long)p + 0x100);
                lVar22 = **(long **)((long)p + 0x108);
                *(uint **)((long)p + 0x20) = puStack_48;
                *(uint **)((long)p + 0x28) = puStack_48;
                *(long *)((long)p + 0x38) = lVar22;
                *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_48);
                *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
                *(void **)((long)p + 0x6b0) = pvVar29;
                uVar19 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
                *(ulong *)((long)p + 0x6b8) = uVar19;
                if (uVar19 != 0) {
                  uVar44 = *puVar13;
                  if (uVar19 < *puVar13) {
                    uVar44 = uVar19;
                  }
                  *(ulong *)((long)p + 0x6c0) = uVar44;
                  if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                    memcpy(__dest,pvVar29,uVar44);
                  }
                  else if (uVar44 != 0) {
                    uVar19 = 0;
                    do {
                      sVar48 = uVar44 - uVar19;
                      if (0x1fff < sVar48) {
                        sVar48 = 0x2000;
                      }
                      memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                             (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                      uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                      *(uint *)((long)p + 0xf8));
                      *(uint *)((long)p + 0xf8) = uVar9;
                      uVar19 = uVar19 + sVar48;
                      uVar44 = *(ulong *)((long)p + 0x6c0);
                    } while (uVar19 < uVar44);
                  }
                  **(long **)((long)p + 0x108) =
                       *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                  lVar22 = *(long *)((long)p + 0x6c0);
                  **(long **)((long)p + 0x118) = lVar22;
                  *(undefined4 *)((long)p + 8) = 0x1fc;
                  goto LAB_00108fa5;
                }
                uVar11 = *(uint *)((long)p + 0x678);
                uVar8 = *(uint *)((long)p + 0x690);
                uStack_8c = *(uint *)((long)p + 0x694);
                uVar46 = *(uint *)((long)p + 0x698);
                uStack_90 = *(uint *)((long)p + 0x69c);
                uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
LAB_001078fc:
                lVar49 = (ulong)uVar46 << 0x20;
                uStack_40 = (ulong)uVar11;
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar19 = *(ulong *)((long)p + 0x58);
                uVar46 = *(uint *)((long)p + 0x60);
                goto LAB_0010a191;
              }
            }
            else {
              if (iVar47 == 0x213) {
                uVar8 = *(uint *)((long)p + 0x690);
                uStack_8c = *(uint *)((long)p + 0x694);
                uVar46 = *(uint *)((long)p + 0x698);
                uStack_90 = *(uint *)((long)p + 0x69c);
                uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
                uVar11 = *(uint *)((long)p + 0x678);
                puStack_48 = *(uint **)((long)p + 0x100);
                lVar22 = **(long **)((long)p + 0x108);
                *(uint **)((long)p + 0x20) = puStack_48;
                *(uint **)((long)p + 0x28) = puStack_48;
                *(long *)((long)p + 0x38) = lVar22;
                *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_48);
                *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                goto LAB_001078fc;
              }
              if (iVar47 == 0x228) {
                puStack_48 = *(uint **)((long)p + 0x100);
                plVar12 = *(long **)((long)p + 0x108);
                lVar22 = *plVar12;
                *(uint **)((long)p + 0x20) = puStack_48;
                *(uint **)((long)p + 0x28) = puStack_48;
                *(long *)((long)p + 0x38) = lVar22;
                *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
                *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
                puVar17 = puStack_48;
                if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                  uVar7 = *(undefined4 *)((long)p + 0x6f0);
                  uVar8 = *(uint *)((long)p + 0x690);
                  uStack_8c = *(uint *)((long)p + 0x694);
                  lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
                  uStack_90 = *(uint *)((long)p + 0x69c);
                  uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
                  uStack_40 = (ulong)*(uint *)((long)p + 0x678);
                  uVar11 = *(uint *)((long)p + 0xb8);
                  uVar10 = *(uint *)((long)p + 0xbc);
                  uVar19 = *(ulong *)((long)p + 0x58);
                  uVar46 = *(uint *)((long)p + 0x60);
                  if (0 < lVar22) goto LAB_00106d54;
                  uVar21 = 0;
                  goto LAB_00106d5e;
                }
LAB_0010860b:
                *plVar12 = (long)puStack_48 - (long)puVar17;
                **(undefined8 **)((long)p + 0x118) = 0;
                *(undefined4 *)((long)p + 8) = 0x228;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
            }
            goto switchD_00105fec_caseD_458;
          }
          if (iVar47 == 0x1e2) {
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puStack_48 = puVar17;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00108045;
              uVar19 = 0;
              goto LAB_0010804b;
            }
LAB_001088b3:
            *plVar12 = (long)puStack_48 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1e2;
          }
          else {
            if (iVar47 == 0x1e8) {
LAB_0010a3be:
              *(undefined4 *)((long)p + 8) = 0x1e8;
              return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
            }
            if (iVar47 != 0x1eb) goto switchD_00105fec_caseD_458;
            puStack_48 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_48;
            *(uint **)((long)p + 0x28) = puStack_48;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_48;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar39 = *(ulong *)((long)p + 0x58);
              iVar47 = *(int *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00106834;
              uVar19 = 0;
              goto LAB_0010683a;
            }
LAB_001087ff:
            *plVar12 = (long)puStack_48 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1eb;
          }
        }
      }
      else if (iVar47 < 0x283) {
        if (0x249 < iVar47) {
          if (iVar47 < 0x26b) {
            if (iVar47 == 0x24a) {
LAB_00109b9e:
              *(undefined4 *)((long)p + 8) = 0x24a;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            if (iVar47 == 0x252) {
              puStack_48 = *(uint **)((long)p + 0x100);
              lVar22 = **(long **)((long)p + 0x108);
              *(uint **)((long)p + 0x20) = puStack_48;
              *(uint **)((long)p + 0x28) = puStack_48;
              *(long *)((long)p + 0x38) = lVar22;
              *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_48);
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
              *(void **)((long)p + 0x6b0) = pvVar29;
              uVar19 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
              *(ulong *)((long)p + 0x6b8) = uVar19;
              if (uVar19 == 0) {
                uVar45 = *(uint *)((long)p + 0x6f0);
                uVar8 = *(uint *)((long)p + 0x690);
                uStack_8c = *(uint *)((long)p + 0x694);
                lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
                uStack_90 = *(uint *)((long)p + 0x69c);
                uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
                uVar11 = *(uint *)((long)p + 0xb8);
                uVar10 = *(uint *)((long)p + 0xbc);
                uVar19 = *(ulong *)((long)p + 0x58);
                uVar26 = *(uint *)((long)p + 0x60);
                uStack_40 = 0;
                goto LAB_00109b0c;
              }
              uVar44 = *puVar13;
              if (uVar19 < *puVar13) {
                uVar44 = uVar19;
              }
              *(ulong *)((long)p + 0x6c0) = uVar44;
              if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                memcpy(__dest,pvVar29,uVar44);
              }
              else if (uVar44 != 0) {
                uVar19 = 0;
                do {
                  sVar48 = uVar44 - uVar19;
                  if (0x1fff < sVar48) {
                    sVar48 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                         (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                  uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                  *(uint *)((long)p + 0xf8));
                  *(uint *)((long)p + 0xf8) = uVar9;
                  uVar19 = uVar19 + sVar48;
                  uVar44 = *(ulong *)((long)p + 0x6c0);
                } while (uVar19 < uVar44);
              }
              **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
              lVar22 = *(long *)((long)p + 0x6c0);
              **(long **)((long)p + 0x118) = lVar22;
              *(undefined4 *)((long)p + 8) = 0x252;
              goto LAB_00108fa5;
            }
          }
          else {
            if (iVar47 == 0x26b) {
LAB_00109a8e:
              *(undefined4 *)((long)p + 8) = 0x26b;
              return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
            }
            if (iVar47 == 0x26f) {
              uVar45 = *(uint *)((long)p + 0x6f0);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uVar21 = (ulong)*(uint *)((long)p + 0x678);
              lVar22 = *(long *)((long)p + 0x100);
              puVar13 = *(ulong **)((long)p + 0x108);
              uVar19 = *puVar13;
              *(long *)((long)p + 0x20) = lVar22;
              *(long *)((long)p + 0x28) = lVar22;
              *(ulong *)((long)p + 0x38) = uVar19;
              *(ulong *)((long)p + 0x30) = lVar22 + uVar19;
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              uVar19 = *puVar13;
              uVar39 = 0;
              goto LAB_001099c6;
            }
          }
          goto switchD_00105fec_caseD_458;
        }
        if (iVar47 == 0x22b) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_48 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar21 = (ulong)*(uint *)((long)p + 0x6f0);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00107bda;
            uVar39 = 0;
            goto LAB_00107be0;
          }
LAB_00108823:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x22b;
        }
        else {
          if (iVar47 == 0x235) {
LAB_00107c88:
            *(undefined4 *)((long)p + 8) = 0x235;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
          }
          if (iVar47 != 0x23b) goto switchD_00105fec_caseD_458;
          puStack_48 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puStack_48;
          *(uint **)((long)p + 0x28) = puStack_48;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puStack_48;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar45 = *(uint *)((long)p + 0x6f0);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar39 = *(ulong *)((long)p + 0x58);
            uVar26 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_0010667a;
            uVar19 = 0;
            goto LAB_00106680;
          }
LAB_00108733:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x23b;
        }
      }
      else if (iVar47 < 0x2cd) {
        if (iVar47 < 0x2a3) {
          if (iVar47 == 0x283) {
LAB_00109ab1:
            *(undefined4 *)((long)p + 8) = 0x283;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          if (iVar47 == 0x294) {
            puStack_48 = *(uint **)((long)p + 0x100);
            lVar22 = **(long **)((long)p + 0x108);
            *(uint **)((long)p + 0x20) = puStack_48;
            *(uint **)((long)p + 0x28) = puStack_48;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_48);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar29;
            uVar19 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar19;
            if (uVar19 == 0) {
              uVar45 = *(uint *)((long)p + 0x6f0);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = 0;
              goto LAB_0010999f;
            }
            uVar44 = *puVar13;
            if (uVar19 < *puVar13) {
              uVar44 = uVar19;
            }
            *(ulong *)((long)p + 0x6c0) = uVar44;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(__dest,pvVar29,uVar44);
            }
            else if (uVar44 != 0) {
              uVar19 = 0;
              do {
                sVar48 = uVar44 - uVar19;
                if (0x1fff < sVar48) {
                  sVar48 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                       (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                *(uint *)((long)p + 0xf8));
                *(uint *)((long)p + 0xf8) = uVar9;
                uVar19 = uVar19 + sVar48;
                uVar44 = *(ulong *)((long)p + 0x6c0);
              } while (uVar19 < uVar44);
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            lVar22 = *(long *)((long)p + 0x6c0);
            **(long **)((long)p + 0x118) = lVar22;
            *(undefined4 *)((long)p + 8) = 0x294;
LAB_00108fa5:
            return (uint)(lVar22 == 0);
          }
          goto switchD_00105fec_caseD_458;
        }
        if (iVar47 == 0x2a3) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_48 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar45 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00108365;
            uVar19 = 0;
            goto LAB_0010836b;
          }
LAB_0010897f:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x2a3;
        }
        else {
          if (iVar47 != 0x2ae) goto switchD_00105fec_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_68 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uVar45 = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00106e41;
            uVar19 = 0;
            do {
              cVar27 = (char)uVar46;
              uVar46 = uVar46 + 8;
              uVar21 = uVar21 | uVar19 << (0x38U - cVar27 & 0x3f);
LAB_0010aa52:
              if (1 < (int)uVar46) {
                uVar19 = uVar21 << 2;
                uVar46 = uVar46 - 2;
                if (uVar21 >> 0x3e == 2) {
                  lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                }
                else if ((uint)(uVar21 >> 0x3e) == 1) {
                  lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                }
LAB_00109bb0:
                while( true ) {
                  while( true ) {
                    puVar14 = (ushort *)((long)p + (ulong)uVar45 * 2 + 0x5e8);
                    for (; uVar10 < 0x1000000; uVar10 = uVar10 << 8) {
                      *(ushort **)((long)p + 0xd0) = puVar14;
                      uVar21 = uVar19;
                      for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                        puVar17 = puStack_68;
                        if (puStack_68 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_68;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uVar45;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010895b;
                          }
                        }
                        else {
LAB_00108279:
                          uVar19 = (ulong)(byte)*puVar17;
                          puStack_68 = (uint *)((long)puVar17 + 1);
                        }
LAB_0010827f:
                        uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar19 = uVar21 << 8;
                      uVar46 = uVar46 - 8;
                      puVar14 = *(ushort **)((long)p + 0xd0);
                      uVar11 = uVar11 << 8 | (uint)(byte)(uVar21 >> 0x38);
                    }
                    uVar3 = *puVar14;
                    uVar26 = (uVar10 >> 0xb) * (uint)uVar3;
                    if (uVar26 <= uVar11) break;
                    *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    if (uVar44 <= (uStack_40 & 0xffffffff)) {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar26;
                      *(ulong *)((long)p + 0x58) = uVar19;
                      *(uint *)((long)p + 0x60) = uVar46;
                      *(uint **)((long)p + 0x28) = puStack_68;
                      **(long **)((long)p + 0x108) = (long)puStack_68 - *(long *)((long)p + 0x20);
                      **(undefined8 **)((long)p + 0x118) = 0;
                      goto LAB_00106285;
                    }
                    if (uVar45 < 7) {
                      pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x168);
                      pdVar24 = *(decoder_tables **)((long)p + 0x1d0);
                      if ((int)uVar46 < 0x18) {
                        puVar17 = *(uint **)((long)p + 0x30);
                        if (puStack_68 + 1 < puVar17) {
                          uVar10 = *puStack_68;
                          uVar46 = uVar46 + 0x20;
                          uVar19 = uVar19 | (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                                    (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <<
                                            (-(char)uVar46 & 0x3fU);
                          puStack_68 = puStack_68 + 1;
                        }
                        else {
                          for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                              *(uint *)((long)p + 0xb8) = uVar11;
                              *(uint *)((long)p + 0xbc) = uVar26;
                              *(ulong *)((long)p + 0x58) = uVar19;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = puStack_68;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uStack_8c;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uVar45;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              puVar16 = *(uint **)((long)p + 0x20);
                              plVar12 = *(long **)((long)p + 0x108);
                              goto LAB_0010ad3d;
                            }
LAB_0010abfd:
                            uVar21 = 0;
                            if (puStack_68 < puVar17) {
                              uVar21 = (ulong)(byte)*puStack_68;
                              puStack_68 = (uint *)((long)puStack_68 + 1);
                            }
                            uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                          }
                        }
                      }
                      uVar10 = (uint)(ushort)(uVar19 >> 0x30);
                      if (uVar10 < pdVar24->m_table_max_code) {
                        uVar40 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 & 0xffff;
                        uVar10 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 >> 0x10;
                      }
                      else {
                        iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                        do {
                          iVar43 = iVar47;
                          iVar47 = iVar43 + 1;
                        } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar10);
                        uVar35 = (int)(uVar19 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                 pdVar24->m_val_ptrs[iVar43 + 0x40U];
                        uVar10 = 0;
                        if (uVar35 < pqVar33->m_total_syms) {
                          uVar10 = uVar35;
                        }
                        uVar40 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                        uVar10 = iVar43 + 0x41;
                      }
                      uVar19 = uVar19 << ((byte)uVar10 & 0x3f);
                      puVar2 = (pqVar33->m_sym_freq).m_p + uVar40;
                      *puVar2 = *puVar2 + 1;
                      uVar46 = uVar46 - uVar10;
                      puVar1 = &pqVar33->m_symbols_until_update;
                      *puVar1 = *puVar1 - 1;
                      uVar10 = uVar26;
                      if (*puVar1 == 0) {
                        quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                      }
                    }
                    else {
                      uVar35 = (uint)(byte)__dest[(int)uStack_40 - uVar8];
                      pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x1f8);
                      pdVar24 = *(decoder_tables **)((long)p + 0x260);
                      uVar10 = uStack_8c;
                      if ((int)uVar46 < 0x18) {
                        uStack_78 = *(uint **)((long)p + 0x30);
                        if (puStack_68 + 1 < uStack_78) {
                          uVar40 = *puStack_68;
                          uVar46 = uVar46 + 0x20;
                          uVar19 = uVar19 | (ulong)(uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 |
                                                    (uVar40 & 0xff00) << 8 | uVar40 << 0x18) <<
                                            (-(char)uVar46 & 0x3fU);
                          puStack_68 = puStack_68 + 1;
                        }
                        else {
                          for (; uStack_8c = uVar35, uVar35 = uStack_8c, (int)uVar46 < 0x18;
                              uVar46 = uVar46 + 8) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                              *(uint *)((long)p + 0xb8) = uVar11;
                              *(uint *)((long)p + 0xbc) = uVar26;
                              *(ulong *)((long)p + 0x58) = uVar19;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = puStack_68;
                              *(uint *)((long)p + 0x6d0) = uStack_8c;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uVar10;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uVar45;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              plVar12 = *(long **)((long)p + 0x108);
                              puVar17 = *(uint **)((long)p + 0x20);
                              goto LAB_0010af1f;
                            }
LAB_0010add2:
                            uVar21 = 0;
                            if (puStack_68 < uStack_78) {
                              uVar21 = (ulong)(byte)*puStack_68;
                              puStack_68 = (uint *)((long)puStack_68 + 1);
                            }
                            uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                            uVar35 = uStack_8c;
                          }
                        }
                      }
                      uStack_8c = uVar35;
                      uVar35 = (uint)(ushort)(uVar19 >> 0x30);
                      if (uVar35 < pdVar24->m_table_max_code) {
                        uVar40 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 & 0xffff;
                        uVar35 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 >> 0x10;
                      }
                      else {
                        iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                        do {
                          iVar43 = iVar47;
                          iVar47 = iVar43 + 1;
                        } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar35);
                        uVar40 = (int)(uVar19 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                 pdVar24->m_val_ptrs[iVar43 + 0x40U];
                        uVar35 = 0;
                        if (uVar40 < pqVar33->m_total_syms) {
                          uVar35 = uVar40;
                        }
                        uVar40 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar35];
                        uVar35 = iVar43 + 0x41;
                      }
                      uVar19 = uVar19 << ((byte)uVar35 & 0x3f);
                      puVar2 = (pqVar33->m_sym_freq).m_p + uVar40;
                      *puVar2 = *puVar2 + 1;
                      uVar46 = uVar46 - uVar35;
                      puVar1 = &pqVar33->m_symbols_until_update;
                      *puVar1 = *puVar1 - 1;
                      if (*puVar1 == 0) {
                        quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                      }
                      uVar40 = uVar40 ^ uStack_8c;
                      uStack_8c = uVar10;
                      uVar10 = uVar26;
                    }
                    __dest[uStack_40 & 0xffffffff] = (char)uVar40;
                    uVar45 = (uint)(byte)(&s_literal_next_state)[uVar45];
                    uStack_40 = (ulong)((int)uStack_40 + 1);
                  }
                  *puVar14 = uVar3 - (uVar3 >> 5);
                  puVar14 = (ushort *)((long)p + (ulong)uVar45 * 2 + 0x600);
                  uVar35 = 1;
                  uVar11 = uVar11 - uVar26;
                  for (uVar40 = uVar10 - uVar26; uVar40 < 0x1000000; uVar40 = uVar40 << 8) {
                    *(ushort **)((long)p + 0xd0) = puVar14;
                    uVar21 = uVar19;
                    for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                      if (puStack_68 == *(uint **)((long)p + 0x30)) {
                        uVar19 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar40;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_68;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uVar45;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar17 = *(uint **)((long)p + 0x20);
                          goto LAB_00108847;
                        }
                      }
                      else {
LAB_00107d36:
                        uVar19 = (ulong)(byte)*puStack_68;
                        puStack_68 = (uint *)((long)puStack_68 + 1);
                      }
LAB_00107d3c:
                      uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar19 = uVar21 << 8;
                    uVar46 = uVar46 - 8;
                    puVar14 = *(ushort **)((long)p + 0xd0);
                    uVar11 = uVar11 << 8 | (uint)(byte)(uVar21 >> 0x38);
                  }
                  uStack_80 = (ulong)uVar45 << 0x20;
                  uVar3 = *puVar14;
                  uVar10 = (uVar40 >> 0xb) * (uint)uVar3;
                  uVar26 = uVar11 - uVar10;
                  if (uVar11 < uVar10) break;
                  *puVar14 = uVar3 - (uVar3 >> 5);
                  puVar14 = (ushort *)((long)p + (ulong)uVar45 * 2 + 0x618);
                  for (uVar40 = uVar40 - uVar10; uVar40 < 0x1000000; uVar40 = uVar40 << 8) {
                    *(ushort **)((long)p + 0xd0) = puVar14;
                    uVar21 = uVar19;
                    for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                      puVar17 = puStack_68;
                      if (puStack_68 == *(uint **)((long)p + 0x30)) {
                        uVar19 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar26;
                          *(uint *)((long)p + 0xbc) = uVar40;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_68;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_001086c7;
                        }
                      }
                      else {
LAB_00106356:
                        uVar19 = (ulong)(byte)*puVar17;
                        puStack_68 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010635c:
                      uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar19 = uVar21 << 8;
                    uVar46 = uVar46 - 8;
                    puVar14 = *(ushort **)((long)p + 0xd0);
                    uVar26 = uVar26 << 8 | (uint)(byte)(uVar21 >> 0x38);
                  }
                  uVar3 = *puVar14;
                  uVar10 = (uVar40 >> 0xb) * (uint)uVar3;
                  uVar45 = uVar26 - uVar10;
                  if (uVar26 < uVar10) {
                    *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    pqVar33 = (quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x318);
                    pdVar24 = *(decoder_tables **)
                               ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x380);
                    if ((int)uVar46 < 0x18) {
                      puVar17 = *(uint **)((long)p + 0x30);
                      if (puStack_68 + 1 < puVar17) {
                        uVar11 = *puStack_68;
                        uVar46 = uVar46 + 0x20;
                        uVar19 = uVar19 | (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                                  (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        puStack_68 = puStack_68 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                            *(uint *)((long)p + 0xb8) = uVar26;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar19;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_68;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar16 = *(uint **)((long)p + 0x20);
                            goto LAB_0010b4ac;
                          }
LAB_0010b38a:
                          uVar21 = 0;
                          if (puStack_68 < puVar17) {
                            uVar21 = (ulong)(byte)*puStack_68;
                            puStack_68 = (uint *)((long)puStack_68 + 1);
                          }
                          uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar11 = (uint)(ushort)(uVar19 >> 0x30);
                    if (uVar11 < pdVar24->m_table_max_code) {
                      uVar35 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar11 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                      do {
                        iVar43 = iVar47;
                        iVar47 = iVar43 + 1;
                      } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar11);
                      uVar45 = (int)(uVar19 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                               pdVar24->m_val_ptrs[iVar43 + 0x40U];
                      uVar11 = 0;
                      if (uVar45 < pqVar33->m_total_syms) {
                        uVar11 = uVar45;
                      }
                      uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar11];
                      uVar11 = iVar43 + 0x41;
                    }
                    uVar19 = uVar19 << ((byte)uVar11 & 0x3f);
                    puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                    *puVar2 = *puVar2 + 1;
                    uVar46 = uVar46 - uVar11;
                    puVar1 = &pqVar33->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                    }
                    uVar35 = uVar35 + 2;
                    uVar21 = 0;
                    if (uVar35 == 0x102) {
                      do {
                        while (uVar11 = uVar46, (int)uVar11 < 1) {
                          if (puStack_68 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar26;
                              *(uint *)((long)p + 0xbc) = uVar10;
                              *(ulong *)((long)p + 0x58) = uVar19;
                              *(uint *)((long)p + 0x60) = uVar11;
                              *(uint **)((long)p + 0x28) = puStack_68;
                              *(int *)((long)p + 0x6d4) = (int)uVar21;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uStack_8c;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              puVar17 = *(uint **)((long)p + 0x20);
                              plVar12 = *(long **)((long)p + 0x108);
                              goto LAB_0010888f;
                            }
                            uVar39 = 0;
                            puVar17 = puStack_68;
                          }
                          else {
LAB_0010b6dc:
                            uVar39 = (ulong)(byte)*puStack_68;
                            puVar17 = (uint *)((long)puStack_68 + 1);
                          }
LAB_0010b6e6:
                          uVar19 = uVar39 << (0x38U - (char)uVar11 & 0x3f) | uVar19;
                          puStack_68 = puVar17;
                          uVar46 = uVar11 + 8;
                        }
                        uVar39 = uVar19 * 2;
                        if (-1 < (long)uVar19) break;
                        uVar45 = (int)uVar21 + 1;
                        uVar21 = (ulong)uVar45;
                        uVar19 = uVar39;
                        uVar46 = uVar11 - 1;
                      } while (uVar45 < 3);
                      iVar47 = uVar11 - 1;
                      while( true ) {
                        bVar18 = *(byte *)((long)&s_huge_match_code_len + uVar21);
                        uVar46 = iVar47 - (uint)bVar18;
                        if ((int)(uint)bVar18 <= iVar47) break;
                        if (puStack_68 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar26;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar39;
                            *(int *)((long)p + 0x60) = iVar47;
                            *(uint **)((long)p + 0x28) = puStack_68;
                            *(int *)((long)p + 0x6d4) = (int)uVar21;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010870f;
                          }
                        }
                        else {
LAB_00106590:
                          uVar19 = (ulong)(byte)*puStack_68;
                          puStack_68 = (uint *)((long)puStack_68 + 1);
                        }
LAB_00106596:
                        cVar27 = (char)iVar47;
                        iVar47 = iVar47 + 8;
                        uVar39 = uVar39 | uVar19 << (0x38U - cVar27 & 0x3f);
                      }
                      uVar19 = uVar39 << (bVar18 & 0x3f);
                      uVar35 = (int)(uVar39 >> (-bVar18 & 0x3f)) +
                               *(int *)(s_huge_match_base_len + uVar21 * 4);
                    }
                    puVar14 = (ushort *)((long)p + (uStack_80 >> 0x20) * 2 + 0x648);
                    uVar40 = uStack_8c;
                    for (; uStack_8c = uVar8, uVar10 < 0x1000000; uVar10 = uVar10 << 8) {
                      *(ushort **)((long)p + 0xd0) = puVar14;
                      uVar21 = uVar19;
                      for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                        puVar17 = puStack_68;
                        if (puStack_68 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar26;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_68;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(uint *)((long)p + 0x690) = uStack_8c;
                            *(uint *)((long)p + 0x694) = uVar40;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_00108677;
                          }
                        }
                        else {
LAB_001074a9:
                          uVar19 = (ulong)(byte)*puVar17;
                          puStack_68 = (uint *)((long)puVar17 + 1);
                        }
LAB_001074af:
                        uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar19 = uVar21 << 8;
                      uVar46 = uVar46 - 8;
                      puVar14 = *(ushort **)((long)p + 0xd0);
                      uVar26 = uVar26 << 8 | (uint)(byte)(uVar21 >> 0x38);
                      uVar8 = uStack_8c;
                    }
                    uVar3 = *puVar14;
                    uVar37 = (uVar10 >> 0xb) * (uint)uVar3;
                    uVar11 = uVar26 - uVar37;
                    if (uVar26 < uVar37) {
                      *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                      puVar14 = (ushort *)((long)p + (uStack_80 >> 0x20) * 2 + 0x660);
                      uVar45 = (uint)((ulong)lVar49 >> 0x20);
                      uVar8 = uVar40;
                      uVar40 = uStack_90;
                      for (; uVar37 < 0x1000000; uVar37 = uVar37 << 8) {
                        *(ushort **)((long)p + 0xd0) = puVar14;
                        uVar21 = uVar19;
                        for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                          if (puStack_68 == *(uint **)((long)p + 0x30)) {
                            uVar19 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar26;
                              *(uint *)((long)p + 0xbc) = uVar37;
                              *(ulong *)((long)p + 0x58) = uVar21;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = puStack_68;
                              *(uint *)((long)p + 0x6d4) = uVar35;
                              *(uint *)((long)p + 0x690) = uStack_8c;
                              *(uint *)((long)p + 0x694) = uVar8;
                              *(uint *)((long)p + 0x698) = uVar45;
                              *(uint *)((long)p + 0x69c) = uVar40;
                              *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              puVar17 = *(uint **)((long)p + 0x20);
                              plVar12 = *(long **)((long)p + 0x108);
                              goto LAB_001084d7;
                            }
                          }
                          else {
LAB_00105f57:
                            uVar19 = (ulong)(byte)*puStack_68;
                            puStack_68 = (uint *)((long)puStack_68 + 1);
                          }
LAB_00105f67:
                          uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                        }
                        uVar19 = uVar21 << 8;
                        uVar46 = uVar46 - 8;
                        puVar14 = *(ushort **)((long)p + 0xd0);
                        uVar26 = uVar26 << 8 | (uint)(byte)(uVar21 >> 0x38);
                      }
                      uVar3 = *puVar14;
                      uVar10 = (uVar37 >> 0xb) * (uint)uVar3;
                      uVar11 = uVar26 - uVar10;
                      if (uVar26 < uVar10) {
                        *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                        uVar11 = uVar26;
                        uStack_90 = uVar45;
                      }
                      else {
                        *puVar14 = uVar3 - (uVar3 >> 5);
                        uVar10 = uVar37 - uVar10;
                        uStack_90 = uVar40;
                        uVar40 = uVar45;
                      }
                      lVar49 = (ulong)uVar8 << 0x20;
                    }
                    else {
                      *puVar14 = uVar3 - (uVar3 >> 5);
                      uVar10 = uVar10 - uVar37;
                    }
                    uVar45 = (uint)(6 < uStack_80._4_4_) * 3 + 8;
                    uVar8 = uVar40;
                  }
                  else {
                    *puVar14 = uVar3 - (uVar3 >> 5);
                    puVar14 = (ushort *)((long)p + (ulong)uStack_80._4_4_ * 2 + 0x630);
                    for (uVar40 = uVar40 - uVar10; uVar40 < 0x1000000; uVar40 = uVar40 << 8) {
                      *(ushort **)((long)p + 0xd0) = puVar14;
                      uVar21 = uVar19;
                      for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
                        if (puStack_68 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar45;
                            *(uint *)((long)p + 0xbc) = uVar40;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_68;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar17 = *(uint **)((long)p + 0x20);
                            goto LAB_0010862f;
                          }
                        }
                        else {
LAB_001072e8:
                          uVar19 = (ulong)(byte)*puStack_68;
                          puStack_68 = (uint *)((long)puStack_68 + 1);
                        }
LAB_001072ee:
                        uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar19 = uVar21 << 8;
                      uVar46 = uVar46 - 8;
                      puVar14 = *(ushort **)((long)p + 0xd0);
                      uVar45 = uVar45 << 8 | (uint)(byte)(uVar21 >> 0x38);
                    }
                    uVar3 = *puVar14;
                    uVar10 = (uVar40 >> 0xb) * (uint)uVar3;
                    uVar11 = uVar45 - uVar10;
                    if (uVar45 < uVar10) {
                      *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                      pqVar33 = (quasi_adaptive_huffman_data_model *)
                                ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x318);
                      pdVar24 = *(decoder_tables **)
                                 ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x380);
                      puVar17 = puStack_68;
                      uVar11 = uVar45;
                      if ((int)uVar46 < 0x18) {
                        puVar16 = *(uint **)((long)p + 0x30);
                        if (puStack_68 + 1 < *(uint **)((long)p + 0x30)) {
                          uVar45 = *puStack_68;
                          uVar46 = uVar46 + 0x20;
                          uVar19 = uVar19 | (ulong)(uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                                    (uVar45 & 0xff00) << 8 | uVar45 << 0x18) <<
                                            (-(char)uVar46 & 0x3fU);
                          puVar17 = puStack_68 + 1;
                        }
                        else {
                          for (; puStack_68 = puVar16, uVar11 = uVar45, (int)uVar46 < 0x18;
                              uVar46 = uVar46 + 8) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                              *(uint *)((long)p + 0xb8) = uVar45;
                              *(uint *)((long)p + 0xbc) = uVar10;
                              *(ulong *)((long)p + 0x58) = uVar19;
                              *(uint *)((long)p + 0x60) = uVar46;
                              *(uint **)((long)p + 0x28) = puVar17;
                              *(uint *)((long)p + 0x6d4) = uVar35;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uStack_8c;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              plVar12 = *(long **)((long)p + 0x108);
                              puVar16 = *(uint **)((long)p + 0x20);
                              goto LAB_0010b0e8;
                            }
LAB_0010afdc:
                            uVar21 = 0;
                            if (puVar17 < puStack_68) {
                              uVar21 = (ulong)(byte)*puVar17;
                              puVar17 = (uint *)((long)puVar17 + 1);
                            }
                            uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                            puVar16 = puStack_68;
                          }
                        }
                      }
                      uVar45 = (uint)(ushort)(uVar19 >> 0x30);
                      if (uVar45 < pdVar24->m_table_max_code) {
                        uVar35 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 & 0xffff;
                        uVar45 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                                 >> 0x10;
                      }
                      else {
                        iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                        do {
                          iVar43 = iVar47;
                          iVar47 = iVar43 + 1;
                        } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar45);
                        uVar26 = (int)(uVar19 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                                 pdVar24->m_val_ptrs[iVar43 + 0x40U];
                        uVar45 = 0;
                        if (uVar26 < pqVar33->m_total_syms) {
                          uVar45 = uVar26;
                        }
                        uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar45];
                        uVar45 = iVar43 + 0x41;
                      }
                      uVar19 = uVar19 << ((byte)uVar45 & 0x3f);
                      puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                      *puVar2 = *puVar2 + 1;
                      uVar46 = uVar46 - uVar45;
                      puVar1 = &pqVar33->m_symbols_until_update;
                      *puVar1 = *puVar1 - 1;
                      if (*puVar1 == 0) {
                        quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                      }
                      uVar35 = uVar35 + 2;
                      uVar21 = 0;
                      if (uVar35 == 0x102) {
                        do {
                          while (uVar45 = uVar46, (int)uVar45 < 1) {
                            if (puVar17 == *(uint **)((long)p + 0x30)) {
                              if (*(char *)((long)p + 0x40) == '\0') {
                                *(uint *)((long)p + 0xb8) = uVar11;
                                *(uint *)((long)p + 0xbc) = uVar10;
                                *(ulong *)((long)p + 0x58) = uVar19;
                                *(uint *)((long)p + 0x60) = uVar45;
                                *(uint **)((long)p + 0x28) = puVar17;
                                *(int *)((long)p + 0x6d4) = (int)uVar21;
                                *(uint *)((long)p + 0x690) = uVar8;
                                *(uint *)((long)p + 0x694) = uStack_8c;
                                *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                                *(uint *)((long)p + 0x69c) = uStack_90;
                                *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                                *(int *)((long)p + 0x678) = (int)uStack_40;
                                puVar16 = *(uint **)((long)p + 0x20);
                                plVar12 = *(long **)((long)p + 0x108);
                                goto LAB_0010869b;
                              }
                              uVar39 = 0;
                              puVar16 = puVar17;
                            }
                            else {
LAB_0010b20c:
                              uVar39 = (ulong)(byte)*puVar17;
                              puVar16 = (uint *)((long)puVar17 + 1);
                            }
LAB_0010b216:
                            uVar19 = uVar39 << (0x38U - (char)uVar45 & 0x3f) | uVar19;
                            puVar17 = puVar16;
                            uVar46 = uVar45 + 8;
                          }
                          uVar39 = uVar19 * 2;
                          if (-1 < (long)uVar19) break;
                          uVar26 = (int)uVar21 + 1;
                          uVar21 = (ulong)uVar26;
                          uVar19 = uVar39;
                          uVar46 = uVar45 - 1;
                        } while (uVar26 < 3);
                        iVar47 = uVar45 - 1;
                        while( true ) {
                          bVar18 = *(byte *)((long)&s_huge_match_code_len + uVar21);
                          uVar46 = iVar47 - (uint)bVar18;
                          if ((int)(uint)bVar18 <= iVar47) break;
                          if (puVar17 == *(uint **)((long)p + 0x30)) {
                            uVar19 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar11;
                              *(uint *)((long)p + 0xbc) = uVar10;
                              *(ulong *)((long)p + 0x58) = uVar39;
                              *(int *)((long)p + 0x60) = iVar47;
                              *(uint **)((long)p + 0x28) = puVar17;
                              *(int *)((long)p + 0x6d4) = (int)uVar21;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uStack_8c;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              puVar16 = *(uint **)((long)p + 0x20);
                              plVar12 = *(long **)((long)p + 0x108);
                              goto LAB_001084fb;
                            }
                          }
                          else {
LAB_0010693e:
                            uVar19 = (ulong)(byte)*puVar17;
                            puVar17 = (uint *)((long)puVar17 + 1);
                          }
LAB_00106948:
                          cVar27 = (char)iVar47;
                          iVar47 = iVar47 + 8;
                          uVar39 = uVar39 | uVar19 << (0x38U - cVar27 & 0x3f);
                        }
                        uVar19 = uVar39 << (bVar18 & 0x3f);
                        uVar35 = (int)(uVar39 >> (-bVar18 & 0x3f)) +
                                 *(int *)(s_huge_match_base_len + uVar21 * 4);
                      }
                      uVar45 = (uint)(6 < uStack_80._4_4_) * 3 + 8;
                      puStack_68 = puVar17;
                    }
                    else {
                      *puVar14 = uVar3 - (uVar3 >> 5);
                      uVar10 = uVar40 - uVar10;
                      uVar45 = (uint)(6 < uStack_80._4_4_) * 2 + 9;
                    }
                  }
LAB_0010b875:
                  iVar47 = (int)uStack_40;
                  uVar21 = uStack_40 & 0xffffffff;
                  if ((uVar21 < (ulong)(long)(int)uVar8) ||
                     (uStack_40 = (ulong)(iVar47 + uVar35), uVar44 < uStack_40)) {
                    *(uint *)((long)p + 0xb8) = uVar11;
                    *(uint *)((long)p + 0xbc) = uVar10;
                    *(ulong *)((long)p + 0x58) = uVar19;
                    *(uint *)((long)p + 0x60) = uVar46;
                    *(uint **)((long)p + 0x28) = puStack_68;
                    **(long **)((long)p + 0x108) = (long)puStack_68 - *(long *)((long)p + 0x20);
                    **(undefined8 **)((long)p + 0x118) = 0;
                    goto LAB_0010b913;
                  }
                  uVar26 = iVar47 - uVar8;
                  puVar25 = __dest + uVar21;
                  if (uVar8 == 1) {
                    bVar18 = __dest[uVar26];
                    if (7 < uVar35) {
                      memset(puVar25,(uint)bVar18,(ulong)uVar35);
                      goto LAB_0010bbaa;
                    }
                    uVar8 = 1;
                    if (uVar35 != 0) {
                      memset(puVar25,(uint)bVar18,(ulong)uVar35);
                      uVar8 = 1;
                    }
                  }
                  else if ((uVar35 < 8) || ((int)uVar8 < (int)uVar35)) {
                    if (0 < (int)uVar35) {
                      uVar35 = uVar35 + 1;
                      puVar25 = __dest;
                      do {
                        puVar25[uVar21] = puVar25[uVar26];
                        uVar35 = uVar35 - 1;
                        puVar25 = puVar25 + 1;
                      } while (1 < uVar35);
                    }
                  }
                  else {
                    memcpy(puVar25,__dest + uVar26,(ulong)uVar35);
                  }
                }
                *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x288);
                pdVar24 = *(decoder_tables **)((long)p + 0x2f0);
                uStack_80._4_4_ = uVar45;
                if ((int)uVar46 < 0x18) {
                  puStack_48 = puStack_68 + 1;
                  puVar17 = *(uint **)((long)p + 0x30);
                  if (puStack_48 < puVar17) {
                    uVar45 = *puStack_68;
                    uVar46 = uVar46 + 0x20;
                    uVar19 = uVar19 | (ulong)(uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                              (uVar45 & 0xff00) << 8 | uVar45 << 0x18) <<
                                      (-(char)uVar46 & 0x3fU);
                  }
                  else {
                    for (; puStack_48 = puStack_68, (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                        *(uint *)((long)p + 0xb8) = uVar11;
                        *(uint *)((long)p + 0xbc) = uVar10;
                        *(ulong *)((long)p + 0x58) = uVar19;
                        *(uint *)((long)p + 0x60) = uVar46;
                        *(uint **)((long)p + 0x28) = puStack_68;
                        *(uint *)((long)p + 0x6d4) = uVar35;
                        *(uint *)((long)p + 0x690) = uVar8;
                        *(uint *)((long)p + 0x694) = uStack_8c;
                        *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                        *(uint *)((long)p + 0x69c) = uStack_90;
                        *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                        *(int *)((long)p + 0x678) = (int)uStack_40;
                        puVar16 = *(uint **)((long)p + 0x20);
                        plVar12 = *(long **)((long)p + 0x108);
                        goto LAB_0010bada;
                      }
LAB_0010b98f:
                      uVar21 = 0;
                      if (puStack_68 < puVar17) {
                        uVar21 = (ulong)(byte)*puStack_68;
                        puStack_68 = (uint *)((long)puStack_68 + 1);
                      }
                      uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                    }
                  }
                }
                else {
                  puStack_48 = puStack_68;
                }
                uVar45 = (uint)(ushort)(uVar19 >> 0x30);
                if (uVar45 < pdVar24->m_table_max_code) {
                  uVar26 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                           0xffff;
                  uVar45 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                           0x10;
                }
                else {
                  iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                  do {
                    iVar43 = iVar47;
                    iVar47 = iVar43 + 1;
                  } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar45);
                  uVar26 = (int)(uVar19 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                           pdVar24->m_val_ptrs[iVar43 + 0x40U];
                  uVar45 = 0;
                  if (uVar26 < pqVar33->m_total_syms) {
                    uVar45 = uVar26;
                  }
                  uVar26 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar45];
                  uVar45 = iVar43 + 0x41;
                }
                uVar19 = uVar19 << ((byte)uVar45 & 0x3f);
                puVar2 = (pqVar33->m_sym_freq).m_p + uVar26;
                *puVar2 = *puVar2 + 1;
                uVar46 = uVar46 - uVar45;
                puVar1 = &pqVar33->m_symbols_until_update;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                }
                if (1 < uVar26) {
                  uVar35 = (uVar26 - 2 & 7) + 2;
                  uStack_58 = (uint *)((ulong)((uVar26 - 2 >> 3) + 1) << 0x20);
                  if (uVar35 == 9) {
                    pqVar33 = (quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x438);
                    pdVar24 = *(decoder_tables **)
                               ((long)p + (ulong)((uint)(6 < uStack_80._4_4_) * 0x90) + 0x4a0);
                    iVar47 = 9;
                    if ((int)uVar46 < 0x18) {
                      puVar17 = *(uint **)((long)p + 0x30);
                      if (puStack_48 + 1 < puVar17) {
                        uVar45 = *puStack_48;
                        uVar46 = uVar46 + 0x20;
                        uVar19 = uVar19 | (ulong)(uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                                  (uVar45 & 0xff00) << 8 | uVar45 << 0x18) <<
                                          (-(char)uVar46 & 0x3fU);
                        puStack_48 = puStack_48 + 1;
                      }
                      else {
                        for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar19;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(int *)((long)p + 0x6d4) = iVar47;
                            *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar16 = *(uint **)((long)p + 0x20);
                            goto LAB_0010c234;
                          }
LAB_0010c186:
                          uVar21 = 0;
                          if (puStack_48 < puVar17) {
                            uVar21 = (ulong)(byte)*puStack_48;
                            puStack_48 = (uint *)((long)puStack_48 + 1);
                          }
                          uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                        }
                      }
                    }
                    uVar45 = (uint)(ushort)(uVar19 >> 0x30);
                    if (uVar45 < pdVar24->m_table_max_code) {
                      uVar35 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar45 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                      do {
                        iVar28 = iVar43;
                        iVar43 = iVar28 + 1;
                      } while (pdVar24->m_max_codes[iVar28 + 0x40U] <= uVar45);
                      uVar26 = (int)(uVar19 >> (-(char)(iVar28 + 1) & 0x3fU)) +
                               pdVar24->m_val_ptrs[iVar28 + 0x40U];
                      uVar45 = 0;
                      if (uVar26 < pqVar33->m_total_syms) {
                        uVar45 = uVar26;
                      }
                      uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar45];
                      uVar45 = iVar28 + 0x41;
                    }
                    uVar19 = uVar19 << ((byte)uVar45 & 0x3f);
                    puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                    *puVar2 = *puVar2 + 1;
                    uVar46 = uVar46 - uVar45;
                    puVar1 = &pqVar33->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                    }
                    uVar35 = uVar35 + iVar47;
                    uVar26 = 0;
                    if (uVar35 == 0x102) {
                      do {
                        while (uVar45 = uVar46, (int)uVar45 < 1) {
                          if (puStack_48 == *(uint **)((long)p + 0x30)) {
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar11;
                              *(uint *)((long)p + 0xbc) = uVar10;
                              *(ulong *)((long)p + 0x58) = uVar19;
                              *(uint *)((long)p + 0x60) = uVar45;
                              *(uint **)((long)p + 0x28) = puStack_48;
                              *(uint *)((long)p + 0x6d4) = uVar26;
                              *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                              *(uint *)((long)p + 0x690) = uVar8;
                              *(uint *)((long)p + 0x694) = uStack_8c;
                              *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                              *(uint *)((long)p + 0x69c) = uStack_90;
                              *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                              *(int *)((long)p + 0x678) = (int)uStack_40;
                              plVar12 = *(long **)((long)p + 0x108);
                              puVar17 = *(uint **)((long)p + 0x20);
                              goto LAB_001087af;
                            }
                            uVar21 = 0;
                          }
                          else {
LAB_0010be99:
                            uVar21 = (ulong)(byte)*puStack_48;
                            puStack_48 = (uint *)((long)puStack_48 + 1);
                          }
LAB_0010bea0:
                          uVar19 = uVar21 << (0x38U - (char)uVar45 & 0x3f) | uVar19;
                          uVar46 = uVar45 + 8;
                        }
                        uVar21 = uVar19 * 2;
                        if (-1 < (long)uVar19) break;
                        uVar26 = uVar26 + 1;
                        uVar19 = uVar21;
                        uVar46 = uVar45 - 1;
                      } while (uVar26 < 3);
                      iVar47 = uVar45 - 1;
                      while( true ) {
                        bVar18 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar26);
                        uVar46 = iVar47 - (uint)bVar18;
                        if ((int)(uint)bVar18 <= iVar47) break;
                        if (puStack_48 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(int *)((long)p + 0x60) = iVar47;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(uint *)((long)p + 0x6d4) = uVar26;
                            *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010886b;
                          }
                        }
                        else {
LAB_00107e2e:
                          uVar19 = (ulong)(byte)*puStack_48;
                          puStack_48 = (uint *)((long)puStack_48 + 1);
                        }
LAB_00107e34:
                        cVar27 = (char)iVar47;
                        iVar47 = iVar47 + 8;
                        uVar21 = uVar21 | uVar19 << (0x38U - cVar27 & 0x3f);
                      }
                      uVar19 = uVar21 << (bVar18 & 0x3f);
                      uVar35 = (int)(uVar21 >> (-bVar18 & 0x3f)) +
                               *(int *)(s_huge_match_base_len + (ulong)uVar26 * 4);
                    }
                  }
                  uVar26 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits
                                       [(ulong)uStack_58 >> 0x20];
                  uVar45 = uVar46;
                  if (uVar26 < 3) {
                    while( true ) {
                      uVar40 = (uint)((ulong)lVar49 >> 0x20);
                      uVar46 = uVar45 - uVar26;
                      if ((int)uVar26 <= (int)uVar45) break;
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar21 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar19;
                          *(uint *)((long)p + 0x60) = uVar45;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                          *(uint *)((long)p + 0x6e0) = uVar26;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(uint *)((long)p + 0x698) = uVar40;
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar17 = *(uint **)((long)p + 0x20);
                          goto LAB_001086eb;
                        }
                      }
                      else {
LAB_00106479:
                        uVar21 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_0010647f:
                      uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar45 & 0x3f);
                      uVar45 = uVar45 + 8;
                    }
                    iVar47 = (int)(uVar19 >> (-(byte)uVar26 & 0x3f));
                    if (uVar26 == 0) {
                      iVar47 = 0;
                    }
                    uVar19 = uVar19 << ((byte)uVar26 & 0x3f);
                    puStack_68 = puStack_48;
                    uStack_90 = uVar40;
                  }
                  else {
                    iVar47 = 0;
                    if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[(ulong)uStack_58 >> 0x20]
                       ) {
                      while( true ) {
                        iVar43 = uVar26 - 4;
                        uVar45 = uVar46 - iVar43;
                        if (iVar43 <= (int)uVar46) break;
                        if (puStack_48 == *(uint **)((long)p + 0x30)) {
                          uVar21 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar19;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                            *(uint *)((long)p + 0x6e0) = uVar26;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_00108653;
                          }
                        }
                        else {
LAB_001073e5:
                          uVar21 = (ulong)(byte)*puStack_48;
                          puStack_48 = (uint *)((long)puStack_48 + 1);
                        }
LAB_001073f0:
                        cVar27 = (char)uVar46;
                        uVar46 = uVar46 + 8;
                        uVar19 = uVar19 | uVar21 << (0x38U - cVar27 & 0x3f);
                      }
                      iVar47 = (int)(uVar19 >> (0x44U - (char)uVar26 & 0x3f)) << 4;
                      if (iVar43 == 0) {
                        iVar47 = 0;
                      }
                      uVar19 = uVar19 << ((byte)iVar43 & 0x3f);
                    }
                    uVar26 = (uint)((ulong)lVar49 >> 0x20);
                    pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x558);
                    pdVar24 = *(decoder_tables **)((long)p + 0x5c0);
                    if ((int)uVar45 < 0x18) {
                      puVar17 = *(uint **)((long)p + 0x30);
                      if (puStack_48 + 1 < puVar17) {
                        uVar46 = *puStack_48;
                        uVar45 = uVar45 + 0x20;
                        uVar19 = uVar19 | (ulong)(uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 |
                                                  (uVar46 & 0xff00) << 8 | uVar46 << 0x18) <<
                                          (-(char)uVar45 & 0x3fU);
                        puStack_48 = puStack_48 + 1;
                      }
                      else {
                        for (; uVar26 = (uint)((ulong)lVar49 >> 0x20), (int)uVar45 < 0x18;
                            uVar45 = uVar45 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar19;
                            *(uint *)((long)p + 0x60) = uVar45;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(undefined4 *)((long)p + 0x6d8) = uStack_58._4_4_;
                            *(int *)((long)p + 0x6dc) = iVar47;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(uint *)((long)p + 0x698) = uVar26;
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar16 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010c325;
                          }
LAB_0010c264:
                          uVar21 = 0;
                          if (puStack_48 < puVar17) {
                            uVar21 = (ulong)(byte)*puStack_48;
                            puStack_48 = (uint *)((long)puStack_48 + 1);
                          }
                          uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar45 & 0x3f);
                        }
                      }
                    }
                    uVar46 = (uint)(ushort)(uVar19 >> 0x30);
                    if (uVar46 < pdVar24->m_table_max_code) {
                      uVar40 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar46 = pdVar24->m_lookup[uVar19 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                      do {
                        iVar28 = iVar43;
                        iVar43 = iVar28 + 1;
                      } while (pdVar24->m_max_codes[iVar28 + 0x40U] <= uVar46);
                      uVar40 = (int)(uVar19 >> (-(char)(iVar28 + 1) & 0x3fU)) +
                               pdVar24->m_val_ptrs[iVar28 + 0x40U];
                      uVar46 = 0;
                      if (uVar40 < pqVar33->m_total_syms) {
                        uVar46 = uVar40;
                      }
                      uVar40 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar46];
                      uVar46 = iVar28 + 0x41;
                    }
                    uVar19 = uVar19 << ((byte)uVar46 & 0x3f);
                    puVar2 = (pqVar33->m_sym_freq).m_p + uVar40;
                    *puVar2 = *puVar2 + 1;
                    uVar46 = uVar45 - uVar46;
                    puVar1 = &pqVar33->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                    }
                    iVar47 = uVar40 + iVar47;
                    puStack_68 = puStack_48;
                    uStack_90 = uVar26;
                  }
                  uVar45 = (uint)(6 < uStack_80._4_4_) * 3 + 7;
                  lVar49 = (ulong)uStack_8c << 0x20;
                  uStack_8c = uVar8;
                  uVar8 = iVar47 + *(int *)(CLZDecompBase::m_lzx_position_base +
                                           ((ulong)uStack_58 >> 0x20) * 4);
                  goto LAB_0010b875;
                }
                uVar45 = 0;
                if (uVar26 != 0) {
                  puStack_68 = puStack_48;
                  uStack_90 = 1;
                  lVar49 = 0x100000000;
                  uStack_8c = 1;
LAB_0010bbaa:
                  uVar8 = 1;
                  goto LAB_00109bb0;
                }
                if ((uVar46 & 7) != 0) {
                  for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
                    if (puStack_48 == *(uint **)((long)p + 0x30)) {
                      uVar21 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar11;
                        *(uint *)((long)p + 0xbc) = uVar10;
                        *(ulong *)((long)p + 0x58) = uVar19;
                        *(uint *)((long)p + 0x60) = uVar46;
                        *(uint **)((long)p + 0x28) = puStack_48;
                        *(uint *)((long)p + 0x690) = uVar8;
                        *(uint *)((long)p + 0x694) = uStack_8c;
                        *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                        *(uint *)((long)p + 0x69c) = uStack_90;
                        *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                        *(int *)((long)p + 0x678) = (int)uStack_40;
                        puVar17 = *(uint **)((long)p + 0x20);
                        plVar12 = *(long **)((long)p + 0x108);
                        goto LAB_00108bc9;
                      }
                    }
                    else {
LAB_00106fd0:
                      uVar21 = (ulong)(byte)*puStack_48;
                      puStack_48 = (uint *)((long)puStack_48 + 1);
                    }
LAB_00106fd6:
                    uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                  }
                  uVar19 = uVar19 << ((byte)uVar46 & 7);
                  uVar46 = uVar46 & 0x7ffffff8;
                }
LAB_0010a191:
                do {
                  *(int *)((long)p + 0x68c) = *(int *)((long)p + 0x68c) + 1;
                  iVar47 = *(int *)((long)p + 0x160);
                  if (iVar47 != 0) goto LAB_0010a1b2;
LAB_0010a04f:
                  for (; (int)uVar46 < 2; uVar46 = uVar46 + 8) {
                    uVar45 = (uint)((ulong)lVar49 >> 0x20);
                    if (puStack_48 == *(uint **)((long)p + 0x30)) {
                      uVar21 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar11;
                        *(uint *)((long)p + 0xbc) = uVar10;
                        *(ulong *)((long)p + 0x58) = uVar19;
                        *(uint *)((long)p + 0x60) = uVar46;
                        *(uint **)((long)p + 0x28) = puStack_48;
                        *(uint *)((long)p + 0x690) = uVar8;
                        *(uint *)((long)p + 0x694) = uStack_8c;
                        *(uint *)((long)p + 0x698) = uVar45;
                        *(uint *)((long)p + 0x69c) = uStack_90;
                        *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                        *(int *)((long)p + 0x678) = (int)uStack_40;
                        puVar17 = *(uint **)((long)p + 0x20);
                        plVar12 = *(long **)((long)p + 0x108);
                        goto LAB_0010858f;
                      }
                    }
                    else {
LAB_00105e62:
                      lVar49 = (ulong)uVar45 << 0x20;
                      uVar21 = (ulong)(byte)*puStack_48;
                      puStack_48 = (uint *)((long)puStack_48 + 1);
                    }
LAB_00105e70:
                    uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                  }
                  uVar21 = uVar19 >> 0x3e;
                  *(uint *)((long)p + 0x6a8) = (uint)(uVar19 >> 0x3e);
                  uVar19 = uVar19 << 2;
                  uVar46 = uVar46 - 2;
                  uVar7 = 0;
                  uVar45 = 0;
                  switch(uVar21) {
                  case 1:
                    goto switchD_0010a0da_caseD_1;
                  case 2:
                    for (; (int)uVar46 < 0x18; uVar46 = uVar46 + 8) {
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar21 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar19;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(undefined4 *)((long)p + 0x6f0) = uVar7;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar17 = *(uint **)((long)p + 0x20);
                          goto LAB_0010860b;
                        }
                      }
                      else {
LAB_00106d54:
                        uVar21 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_00106d5e:
                      uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar21 = uVar19 >> 0x28;
                    uVar19 = uVar19 << 0x18;
                    for (uVar46 = uVar46 - 0x18; uVar45 = (uint)uVar21, (int)uVar46 < 8;
                        uVar46 = uVar46 + 8) {
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar39 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar19;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(uint *)((long)p + 0x6f0) = uVar45;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_00108823;
                        }
                      }
                      else {
LAB_00107bda:
                        uVar39 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_00107be0:
                      uVar19 = uVar19 | uVar39 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar39 = uVar19 << 8;
                    uVar26 = uVar46 - 8;
                    if ((((uint)(uVar21 >> 0x10) ^ (uint)(uVar21 >> 8) ^ uVar45) & 0xff) !=
                        (uint)(byte)(uVar19 >> 0x38)) {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar39;
                      *(uint *)((long)p + 0x60) = uVar26;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      **(long **)((long)p + 0x108) = (long)puStack_48 - *(long *)((long)p + 0x20);
                      **(undefined8 **)((long)p + 0x118) = 0;
                      goto LAB_00107c88;
                    }
                    uVar45 = uVar45 + 1;
                    if ((uVar46 & 7) != 0) {
                      for (; (int)uVar26 < 0; uVar26 = uVar26 + 8) {
                        if (puStack_48 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar39;
                            *(uint *)((long)p + 0x60) = uVar26;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(uint *)((long)p + 0x6f0) = uVar45;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar17 = *(uint **)((long)p + 0x20);
                            goto LAB_00108733;
                          }
                        }
                        else {
LAB_0010667a:
                          uVar19 = (ulong)(byte)*puStack_48;
                          puStack_48 = (uint *)((long)puStack_48 + 1);
                        }
LAB_00106680:
                        uVar39 = uVar39 | uVar19 << (0x38U - (char)uVar26 & 0x3f);
                      }
                      bVar18 = (byte)uVar26;
                      uVar26 = uVar26 & 0x7ffffff8;
                      uVar39 = uVar39 << (bVar18 & 7);
                    }
                    do {
                      if ((int)uVar26 < 8) goto LAB_00109b3e;
                      uVar19 = uVar39 << 8;
                      uVar26 = uVar26 - 8;
                      uVar21 = uStack_40 & 0xffffffff;
                      if (uVar44 <= uVar21) {
                        *(uint *)((long)p + 0xb8) = uVar11;
                        *(uint *)((long)p + 0xbc) = uVar10;
                        *(ulong *)((long)p + 0x58) = uVar19;
                        *(uint *)((long)p + 0x60) = uVar26;
                        *(uint **)((long)p + 0x28) = puStack_48;
                        **(long **)((long)p + 0x108) = (long)puStack_48 - *(long *)((long)p + 0x20);
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_00109b9e;
                      }
                      uStack_40 = (ulong)((int)uStack_40 + 1);
                      __dest[uVar21] = (char)(uVar39 >> 0x38);
LAB_00109b0c:
                      uVar45 = uVar45 - 1;
                      uVar39 = uVar19;
                    } while (uVar45 != 0);
                    uVar45 = 0;
LAB_00109b3e:
                    *(uint *)((long)p + 0xb8) = uVar11;
                    *(uint *)((long)p + 0xbc) = uVar10;
                    *(ulong *)((long)p + 0x58) = uVar39;
                    *(uint *)((long)p + 0x60) = uVar26;
                    *(uint **)((long)p + 0x28) = puStack_48;
LAB_0010999f:
                    for (; uVar45 != 0; uVar45 = uVar45 - (int)uVar38) {
                      uVar39 = (long)puStack_48 - *(long *)((long)p + 0x20);
                      puVar13 = *(ulong **)((long)p + 0x108);
                      uVar19 = *puVar13 - uVar39;
                      uVar21 = uStack_40;
LAB_001099c6:
                      if (uVar19 == 0) {
                        *puVar13 = uVar39;
                        **(undefined8 **)((long)p + 0x118) = 0;
                        if (*(char *)((long)p + 0x120) != '\x01') {
                          *(uint *)((long)p + 0x6f0) = uVar45;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uVar21;
                          *(undefined4 *)((long)p + 8) = 0x26f;
                          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                        }
                        goto LAB_00109a8e;
                      }
                      uVar38 = (ulong)uVar45;
                      if (uVar19 < uVar45) {
                        uVar38 = uVar19;
                      }
                      uStack_40 = (ulong)(uint)((int)uVar21 + (int)uVar38);
                      if (uVar44 < uStack_40) {
                        *puVar13 = uVar39;
                        **(undefined8 **)((long)p + 0x118) = 0;
                        goto LAB_00109ab1;
                      }
                      memcpy(__dest + (uVar21 & 0xffffffff),
                             (void *)(*(long *)((long)p + 0x100) + uVar39),uVar38);
                      lVar22 = *(long *)((long)p + 0x100);
                      lVar4 = **(long **)((long)p + 0x108);
                      puStack_48 = (uint *)(uVar39 + lVar22 + uVar38);
                      *(long *)((long)p + 0x20) = lVar22;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      *(long *)((long)p + 0x38) = lVar4;
                      *(long *)((long)p + 0x30) = lVar22 + lVar4;
                      *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                    }
                    uVar11 = *(uint *)((long)p + 0xb8);
                    uVar10 = *(uint *)((long)p + 0xbc);
                    uVar19 = *(ulong *)((long)p + 0x58);
                    uVar46 = *(uint *)((long)p + 0x60);
                    break;
                  case 3:
                    *(undefined4 *)((long)p + 0x160) = 3;
                    break;
                  default:
                    for (; (int)uVar46 < 2; uVar46 = uVar46 + 8) {
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar21 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar19;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_00108757;
                        }
                      }
                      else {
LAB_00107878:
                        uVar21 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_0010787e:
                      uVar19 = uVar19 | uVar21 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar45 = (uint)(uVar19 >> 0x3e);
                    *(uint *)((long)p + 0x71c) = uVar45;
                    uVar21 = uVar19 << 2;
                    uVar46 = uVar46 - 2;
                    if (uVar19 >> 0x3e == 2) {
                      lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                    }
                    else if (uVar45 == 1) {
                      lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                    }
                    if ((uVar46 & 7) != 0) {
                      for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
                        if (puStack_48 == *(uint **)((long)p + 0x30)) {
                          uVar19 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar11;
                            *(uint *)((long)p + 0xbc) = uVar10;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(uint *)((long)p + 0x60) = uVar46;
                            *(uint **)((long)p + 0x28) = puStack_48;
                            *(uint *)((long)p + 0x690) = uVar8;
                            *(uint *)((long)p + 0x694) = uStack_8c;
                            *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                            *(uint *)((long)p + 0x69c) = uStack_90;
                            *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                            *(int *)((long)p + 0x678) = (int)uStack_40;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_001085e7;
                          }
                        }
                        else {
LAB_00106c79:
                          uVar19 = (ulong)(byte)*puStack_48;
                          puStack_48 = (uint *)((long)puStack_48 + 1);
                        }
LAB_00106c7f:
                        uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                      }
                      uVar21 = uVar21 << ((byte)uVar46 & 7);
                      uVar46 = uVar46 & 0x7ffffff8;
                    }
                    for (; (int)uVar46 < 0x10; uVar46 = uVar46 + 8) {
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar19 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar46;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = (int)uStack_40;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_001088b3;
                        }
                      }
                      else {
LAB_00108045:
                        uVar19 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_0010804b:
                      uVar21 = uVar21 | uVar19 << (0x38U - (char)uVar46 & 0x3f);
                    }
                    uVar39 = uVar21 << 0x10;
                    iVar47 = uVar46 - 0x10;
                    if (uVar21 >> 0x30 != 0) {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar39;
                      *(int *)((long)p + 0x60) = iVar47;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      **(long **)((long)p + 0x108) = (long)puStack_48 - *(long *)((long)p + 0x20);
                      **(undefined8 **)((long)p + 0x118) = 0;
                      goto LAB_0010a3be;
                    }
                    while( true ) {
                      iVar43 = (int)uStack_40;
                      uVar7 = (undefined4)((ulong)lVar49 >> 0x20);
                      if (0xf < iVar47) break;
                      if (puStack_48 == *(uint **)((long)p + 0x30)) {
                        uVar19 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar11;
                          *(uint *)((long)p + 0xbc) = uVar10;
                          *(ulong *)((long)p + 0x58) = uVar39;
                          *(int *)((long)p + 0x60) = iVar47;
                          *(uint **)((long)p + 0x28) = puStack_48;
                          *(uint *)((long)p + 0x690) = uVar8;
                          *(uint *)((long)p + 0x694) = uStack_8c;
                          *(undefined4 *)((long)p + 0x698) = uVar7;
                          *(uint *)((long)p + 0x69c) = uStack_90;
                          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                          *(int *)((long)p + 0x678) = iVar43;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar17 = *(uint **)((long)p + 0x20);
                          goto LAB_001087ff;
                        }
                      }
                      else {
LAB_00106834:
                        uVar19 = (ulong)(byte)*puStack_48;
                        puStack_48 = (uint *)((long)puStack_48 + 1);
                      }
LAB_0010683a:
                      cVar27 = (char)iVar47;
                      iVar47 = iVar47 + 8;
                      uVar39 = uVar39 | uVar19 << (0x38U - cVar27 & 0x3f);
                    }
                    uVar19 = uVar39 << 0x10;
                    uVar46 = iVar47 - 0x10;
                    if ((short)(uVar39 >> 0x30) != -1) {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar19;
                      *(uint *)((long)p + 0x60) = uVar46;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      **(long **)((long)p + 0x108) = (long)puStack_48 - *(long *)((long)p + 0x20);
                      **(undefined8 **)((long)p + 0x118) = 0;
                      goto LAB_0010a2b4;
                    }
                    if ((*(uint *)((long)p + 0x71c) & 0xfffffffe) == 2) {
                      *(uint *)((long)p + 0xb8) = uVar11;
                      *(uint *)((long)p + 0xbc) = uVar10;
                      *(ulong *)((long)p + 0x58) = uVar19;
                      *(uint *)((long)p + 0x60) = uVar46;
                      *(uint **)((long)p + 0x28) = puStack_48;
                      **(long **)((long)p + 0x108) = (long)puStack_48 - *(long *)((long)p + 0x20);
                      **(ulong **)((long)p + 0x118) =
                           (ulong)(uint)(iVar43 - *(int *)((long)p + 0x67c));
                      *(int *)((long)p + 0x67c) = iVar43;
                      *(uint *)((long)p + 0x690) = uVar8;
                      *(uint *)((long)p + 0x694) = uStack_8c;
                      *(undefined4 *)((long)p + 0x698) = uVar7;
                      *(uint *)((long)p + 0x69c) = uStack_90;
                      *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                      *(int *)((long)p + 0x678) = iVar43;
                      *(undefined4 *)((long)p + 8) = 0x213;
                      return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                    }
                  }
                } while( true );
              }
              if (puStack_68 == *(uint **)((long)p + 0x30)) {
                uVar19 = 0;
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = uVar11;
                  *(uint *)((long)p + 0xbc) = uVar10;
                  *(ulong *)((long)p + 0x58) = uVar21;
                  *(uint *)((long)p + 0x60) = uVar46;
                  *(uint **)((long)p + 0x28) = puStack_68;
                  *(uint *)((long)p + 0x690) = uVar8;
                  *(uint *)((long)p + 0x694) = uStack_8c;
                  *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
                  *(uint *)((long)p + 0x69c) = uStack_90;
                  *(uint *)((long)p + 0x6a0) = uVar45;
                  *(int *)((long)p + 0x678) = (int)uStack_40;
                  puVar17 = *(uint **)((long)p + 0x20);
                  plVar12 = *(long **)((long)p + 0x108);
                  break;
                }
              }
              else {
LAB_00106e41:
                uVar19 = (ulong)(byte)*puStack_68;
                puStack_68 = (uint *)((long)puStack_68 + 1);
              }
            } while( true );
          }
          *plVar12 = (long)puStack_68 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x2ae;
        }
      }
      else if (iVar47 < 0x2ea) {
        if (iVar47 != 0x2cd) {
          if (iVar47 == 0x2e4) {
LAB_00106285:
            *(undefined4 *)((long)p + 8) = 0x2e4;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          goto switchD_00105fec_caseD_458;
        }
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_68 = puVar17;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uVar45 = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          if (0 < lVar22) goto LAB_00108279;
          uVar19 = 0;
          goto LAB_0010827f;
        }
LAB_0010895b:
        *plVar12 = (long)puStack_68 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2cd;
      }
      else if (iVar47 == 0x2ea) {
        puVar16 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar16;
        *(uint **)((long)p + 0x28) = puVar16;
        *(long *)((long)p + 0x38) = lVar22;
        puVar17 = (uint *)((long)puVar16 + lVar22);
        *(uint **)((long)p + 0x30) = puVar17;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_68 = puVar16;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uVar45 = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar26 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_0010abfd;
        }
LAB_0010ad3d:
        *plVar12 = (long)puStack_68 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2ea;
      }
      else {
        if (iVar47 != 0x304) goto switchD_00105fec_caseD_458;
        puStack_68 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puStack_68;
        *(uint **)((long)p + 0x28) = puStack_68;
        *(long *)((long)p + 0x38) = lVar22;
        uStack_78 = (uint *)((long)puStack_68 + lVar22);
        *(uint **)((long)p + 0x30) = uStack_78;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puStack_68;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_8c = *(uint *)((long)p + 0x6d0);
          uVar8 = *(uint *)((long)p + 0x690);
          uVar10 = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uVar45 = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar26 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_0010add2;
        }
LAB_0010af1f:
        *plVar12 = (long)puStack_68 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x304;
      }
    }
    else if (iVar47 < 0x3ae) {
      if (iVar47 < 0x34d) {
        if (iVar47 < 0x32f) {
          if (iVar47 == 0x318) {
            puStack_68 = *(uint **)((long)p + 0x100);
            lVar22 = **(long **)((long)p + 0x108);
            *(uint **)((long)p + 0x20) = puStack_68;
            *(uint **)((long)p + 0x28) = puStack_68;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_68);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar29;
            uVar19 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar19;
            if (uVar19 == 0) {
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uVar45 = *(uint *)((long)p + 0x6a0);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar19 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uStack_40 = 0;
              goto LAB_00109bb0;
            }
            uVar44 = *puVar13;
            if (uVar19 < *puVar13) {
              uVar44 = uVar19;
            }
            *(ulong *)((long)p + 0x6c0) = uVar44;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(__dest,pvVar29,uVar44);
            }
            else if (uVar44 != 0) {
              uVar19 = 0;
              do {
                sVar48 = uVar44 - uVar19;
                if (0x1fff < sVar48) {
                  sVar48 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                       (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                *(uint *)((long)p + 0xf8));
                *(uint *)((long)p + 0xf8) = uVar9;
                uVar19 = uVar19 + sVar48;
                uVar44 = *(ulong *)((long)p + 0x6c0);
              } while (uVar19 < uVar44);
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            lVar22 = *(long *)((long)p + 0x6c0);
            **(long **)((long)p + 0x118) = lVar22;
            *(undefined4 *)((long)p + 8) = 0x318;
            goto LAB_00108fa5;
          }
          if (iVar47 == 0x329) {
            puStack_68 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_68;
            *(uint **)((long)p + 0x28) = puStack_68;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_68 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_68;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar35 = *(uint *)((long)p + 0x6d4);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uVar45 = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar40 = *(uint *)((long)p + 0xbc);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00107d36;
              uVar19 = 0;
              goto LAB_00107d3c;
            }
LAB_00108847:
            *plVar12 = (long)puStack_68 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x329;
          }
          else {
            if (iVar47 != 0x32c) goto switchD_00105fec_caseD_458;
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puStack_68 = puVar17;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar35 = *(uint *)((long)p + 0x6d4);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar26 = *(uint *)((long)p + 0xb8);
              uVar40 = *(uint *)((long)p + 0xbc);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_00106356;
              uVar19 = 0;
              goto LAB_0010635c;
            }
LAB_001086c7:
            *plVar12 = (long)puStack_68 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x32c;
          }
        }
        else if (iVar47 < 0x33f) {
          if (iVar47 == 0x32f) {
            puStack_68 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_68;
            *(uint **)((long)p + 0x28) = puStack_68;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_68 + lVar22);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_68;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar35 = *(uint *)((long)p + 0x6d4);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar45 = *(uint *)((long)p + 0xb8);
              uVar40 = *(uint *)((long)p + 0xbc);
              uVar21 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              if (0 < lVar22) goto LAB_001072e8;
              uVar19 = 0;
              goto LAB_001072ee;
            }
LAB_0010862f:
            *plVar12 = (long)puStack_68 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x32f;
          }
          else {
            if (iVar47 != 0x336) goto switchD_00105fec_caseD_458;
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar22 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar22;
            puStack_68 = (uint *)((long)puVar17 + lVar22);
            *(uint **)((long)p + 0x30) = puStack_68;
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar16 = puVar17;
            if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uVar35 = *(uint *)((long)p + 0x6d4);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
              uStack_40 = (ulong)*(uint *)((long)p + 0x678);
              uVar45 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar19 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
              pdVar24 = pqVar33->m_pDecode_tables;
              goto LAB_0010afdc;
            }
LAB_0010b0e8:
            *plVar12 = (long)puVar17 - (long)puVar16;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x336;
          }
        }
        else if (iVar47 == 0x33f) {
          puVar16 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar16;
          *(uint **)((long)p + 0x28) = puVar16;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar16 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puVar16;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar45 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_0010b20c;
            uVar39 = 0;
            goto LAB_0010b216;
          }
LAB_0010869b:
          *plVar12 = (long)puVar17 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x33f;
        }
        else {
          if (iVar47 != 0x344) goto switchD_00105fec_caseD_458;
          puVar16 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar16;
          *(uint **)((long)p + 0x28) = puVar16;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar16 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puVar16;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar39 = *(ulong *)((long)p + 0x58);
            iVar47 = *(int *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_0010693e;
            uVar19 = 0;
            goto LAB_00106948;
          }
LAB_001084fb:
          *plVar12 = (long)puVar17 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x344;
        }
      }
      else if (iVar47 < 0x35f) {
        if (iVar47 == 0x34d) {
          puStack_68 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puStack_68;
          *(uint **)((long)p + 0x28) = puStack_68;
          *(long *)((long)p + 0x38) = lVar22;
          puVar17 = (uint *)((long)puStack_68 + lVar22);
          *(uint **)((long)p + 0x30) = puVar17;
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar16 = puStack_68;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar26 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar24 = pqVar33->m_pDecode_tables;
            goto LAB_0010b38a;
          }
LAB_0010b4ac:
          *plVar12 = (long)puStack_68 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x34d;
        }
        else if (iVar47 == 0x356) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_68 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar26 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar11 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_0010b6dc;
            uVar39 = 0;
            goto LAB_0010b6e6;
          }
LAB_0010888f:
          *plVar12 = (long)puStack_68 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x356;
        }
        else {
          if (iVar47 != 0x35b) goto switchD_00105fec_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_68 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar26 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar39 = *(ulong *)((long)p + 0x58);
            iVar47 = *(int *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00106590;
            uVar19 = 0;
            goto LAB_00106596;
          }
LAB_0010870f:
          *plVar12 = (long)puStack_68 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x35b;
        }
      }
      else if (iVar47 < 899) {
        if (iVar47 == 0x35f) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_68 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_8c = *(uint *)((long)p + 0x690);
            uVar40 = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar26 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_001074a9;
            uVar19 = 0;
            goto LAB_001074af;
          }
LAB_00108677:
          *plVar12 = (long)puStack_68 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x35f;
        }
        else {
          if (iVar47 != 0x368) goto switchD_00105fec_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_68 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_8c = *(uint *)((long)p + 0x690);
            uVar8 = *(uint *)((long)p + 0x694);
            uVar45 = *(uint *)((long)p + 0x698);
            uVar40 = *(uint *)((long)p + 0x69c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar26 = *(uint *)((long)p + 0xb8);
            uVar37 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00105f57;
            uVar19 = 0;
            goto LAB_00105f67;
          }
LAB_001084d7:
          *plVar12 = (long)puStack_68 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x368;
        }
      }
      else if (iVar47 == 899) {
        puVar16 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar16;
        *(uint **)((long)p + 0x28) = puVar16;
        *(long *)((long)p + 0x38) = lVar22;
        puVar17 = (uint *)((long)puVar16 + lVar22);
        *(uint **)((long)p + 0x30) = puVar17;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_68 = puVar16;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80 = (ulong)*(uint *)((long)p + 0x6a0) << 0x20;
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_0010b98f;
        }
LAB_0010bada:
        *plVar12 = (long)puStack_68 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 899;
      }
      else {
        if (iVar47 != 0x3a5) goto switchD_00105fec_caseD_458;
        puStack_48 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puStack_48;
        *(uint **)((long)p + 0x28) = puStack_48;
        *(long *)((long)p + 0x38) = lVar22;
        puVar17 = (uint *)((long)puStack_48 + lVar22);
        *(uint **)((long)p + 0x30) = puVar17;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar16 = puStack_48;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          iVar47 = *(int *)((long)p + 0x6d4);
          uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_0010c186;
        }
LAB_0010c234:
        *plVar12 = (long)puStack_48 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3a5;
      }
    }
    else if (iVar47 < 0x442) {
      if (iVar47 < 0x3cb) {
        if (iVar47 == 0x3ae) {
          puStack_48 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puStack_48;
          *(uint **)((long)p + 0x28) = puStack_48;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puStack_48;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar26 = *(uint *)((long)p + 0x6d4);
            uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar45 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_0010be99;
            uVar21 = 0;
            goto LAB_0010bea0;
          }
LAB_001087af:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3ae;
        }
        else if (iVar47 == 0x3b3) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_48 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar26 = *(uint *)((long)p + 0x6d4);
            uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            iVar47 = *(int *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00107e2e;
            uVar19 = 0;
            goto LAB_00107e34;
          }
LAB_0010886b:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3b3;
        }
        else {
          if (iVar47 != 0x3c4) goto switchD_00105fec_caseD_458;
          puStack_48 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puStack_48;
          *(uint **)((long)p + 0x28) = puStack_48;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puStack_48 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puStack_48;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
            uVar26 = *(uint *)((long)p + 0x6e0);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar45 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_00106479;
            uVar21 = 0;
            goto LAB_0010647f;
          }
LAB_001086eb:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3c4;
        }
      }
      else {
        if (0x3f3 < iVar47) {
          if (iVar47 == 0x3f4) {
LAB_0010b913:
            *(undefined4 *)((long)p + 8) = 0x3f4;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
          }
          if (iVar47 == 0x40e) {
            puStack_68 = *(uint **)((long)p + 0x100);
            lVar22 = **(long **)((long)p + 0x108);
            *(uint **)((long)p + 0x20) = puStack_68;
            *(uint **)((long)p + 0x28) = puStack_68;
            *(long *)((long)p + 0x38) = lVar22;
            *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_68);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar29;
            uVar19 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar19;
            if (uVar19 == 0) {
              iVar47 = *(int *)((long)p + 0x6d4);
              uVar8 = *(uint *)((long)p + 0x690);
              uStack_8c = *(uint *)((long)p + 0x694);
              lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
              uStack_90 = *(uint *)((long)p + 0x69c);
              uVar45 = *(uint *)((long)p + 0x6a0);
              uVar11 = *(uint *)((long)p + 0xb8);
              uVar10 = *(uint *)((long)p + 0xbc);
              uVar19 = *(ulong *)((long)p + 0x58);
              uVar46 = *(uint *)((long)p + 0x60);
              uStack_40 = 0;
              if (iVar47 == 1) goto LAB_00109bb0;
              puVar25 = *(undefined1 **)((long)p + 0x6e8);
              uStack_40 = 0;
              do {
                puVar23 = puVar25 + 1;
                __dest[uStack_40] = *puVar25;
                puVar25 = puVar23;
                if (puVar23 == __dest + uVar44) {
                  puVar25 = __dest;
                }
                uStack_40 = uStack_40 + 1;
                if (iVar47 + -1 == (int)uStack_40) goto LAB_00109bb0;
              } while( true );
            }
            uVar44 = *puVar13;
            if (uVar19 < *puVar13) {
              uVar44 = uVar19;
            }
            *(ulong *)((long)p + 0x6c0) = uVar44;
            if ((*(byte *)((long)p + 0x144) & 2) == 0) {
              memcpy(__dest,pvVar29,uVar44);
            }
            else if (uVar44 != 0) {
              uVar19 = 0;
              do {
                sVar48 = uVar44 - uVar19;
                if (0x1fff < sVar48) {
                  sVar48 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                       (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                *(uint *)((long)p + 0xf8));
                *(uint *)((long)p + 0xf8) = uVar9;
                uVar19 = uVar19 + sVar48;
                uVar44 = *(ulong *)((long)p + 0x6c0);
              } while (uVar19 < uVar44);
            }
            **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
            lVar22 = *(long *)((long)p + 0x6c0);
            **(long **)((long)p + 0x118) = lVar22;
            *(undefined4 *)((long)p + 8) = 0x40e;
            goto LAB_00108fa5;
          }
          goto switchD_00105fec_caseD_458;
        }
        if (iVar47 == 0x3cb) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar22;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_48 = puVar17;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
            uVar26 = *(uint *)((long)p + 0x6e0);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar46 = *(uint *)((long)p + 0x60);
            if (0 < lVar22) goto LAB_001073e5;
            uVar21 = 0;
            goto LAB_001073f0;
          }
LAB_00108653:
          *plVar12 = (long)puStack_48 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3cb;
        }
        else {
          if (iVar47 != 0x3d4) goto switchD_00105fec_caseD_458;
          puVar16 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar22 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar16;
          *(uint **)((long)p + 0x28) = puVar16;
          *(long *)((long)p + 0x38) = lVar22;
          puVar17 = (uint *)((long)puVar16 + lVar22);
          *(uint **)((long)p + 0x30) = puVar17;
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_48 = puVar16;
          if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_58 = (uint *)((ulong)*(uint *)((long)p + 0x6d8) << 0x20);
            iVar47 = *(int *)((long)p + 0x6dc);
            uVar8 = *(uint *)((long)p + 0x690);
            uStack_8c = *(uint *)((long)p + 0x694);
            lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
            uStack_90 = *(uint *)((long)p + 0x69c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
            uStack_40 = (ulong)*(uint *)((long)p + 0x678);
            uVar11 = *(uint *)((long)p + 0xb8);
            uVar10 = *(uint *)((long)p + 0xbc);
            uVar19 = *(ulong *)((long)p + 0x58);
            uVar45 = *(uint *)((long)p + 0x60);
            pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar24 = pqVar33->m_pDecode_tables;
            goto LAB_0010c264;
          }
LAB_0010c325:
          *plVar12 = (long)puStack_48 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x3d4;
        }
      }
    }
    else {
      if (0x47b < iVar47) {
        if ((iVar47 == 0x47c) || (iVar47 == 0x482)) {
          **(undefined8 **)((long)p + 0x108) = 0;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x482;
        }
switchD_00105fec_caseD_458:
        return *(lzham_decompress_status_t *)((long)p + 0x160);
      }
      switch(iVar47) {
      case 0x457:
        puStack_48 = *(uint **)((long)p + 0x100);
        lVar22 = **(long **)((long)p + 0x108);
        *(uint **)((long)p + 0x20) = puStack_48;
        *(uint **)((long)p + 0x28) = puStack_48;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_48);
        *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
        pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
        *(void **)((long)p + 0x6b0) = pvVar29;
        uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
        *(ulong *)((long)p + 0x6b8) = uVar44;
        if (uVar44 != 0) {
          uVar19 = *puVar13;
          if (uVar44 < *puVar13) {
            uVar19 = uVar44;
          }
          *(ulong *)((long)p + 0x6c0) = uVar19;
          if ((*(byte *)((long)p + 0x144) & 2) == 0) {
            memcpy(__dest,pvVar29,uVar19);
          }
          else if (uVar19 != 0) {
            uVar44 = 0;
            do {
              sVar48 = uVar19 - uVar44;
              if (0x1fff < sVar48) {
                sVar48 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x110) + uVar44),
                     (void *)(*(long *)((long)p + 0x6b0) + uVar44),sVar48);
              uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar44),sVar48,
                              *(uint *)((long)p + 0xf8));
              *(uint *)((long)p + 0xf8) = uVar9;
              uVar44 = uVar44 + sVar48;
              uVar19 = *(ulong *)((long)p + 0x6c0);
            } while (uVar44 < uVar19);
          }
          **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
          lVar22 = *(long *)((long)p + 0x6c0);
          **(long **)((long)p + 0x118) = lVar22;
          *(undefined4 *)((long)p + 8) = 0x457;
          goto LAB_00108fa5;
        }
        uVar8 = *(uint *)((long)p + 0x690);
        uStack_8c = *(uint *)((long)p + 0x694);
        lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
        uStack_90 = *(uint *)((long)p + 0x69c);
        uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
        uStack_40 = (ulong)*(uint *)((long)p + 0x678);
        uVar11 = *(uint *)((long)p + 0xb8);
        uVar10 = *(uint *)((long)p + 0xbc);
        uVar19 = *(ulong *)((long)p + 0x58);
        uVar46 = *(uint *)((long)p + 0x60);
        iVar47 = *(int *)((long)p + 0x160);
LAB_0010a1b2:
        if (iVar47 == 3) {
          if ((uVar46 & 7) != 0) {
            for (; (int)uVar46 < 0; uVar46 = uVar46 + 8) {
              uVar45 = (uint)((ulong)lVar49 >> 0x20);
              if (puStack_48 == *(uint **)((long)p + 0x30)) {
                uVar44 = 0;
                if (*(char *)((long)p + 0x40) == '\0') {
                  *(uint *)((long)p + 0xb8) = uVar11;
                  *(uint *)((long)p + 0xbc) = uVar10;
                  *(ulong *)((long)p + 0x58) = uVar19;
                  *(uint *)((long)p + 0x60) = uVar46;
                  *(uint **)((long)p + 0x28) = puStack_48;
                  *(uint *)((long)p + 0x690) = uVar8;
                  *(uint *)((long)p + 0x694) = uStack_8c;
                  *(uint *)((long)p + 0x698) = uVar45;
                  *(uint *)((long)p + 0x69c) = uStack_90;
                  *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                  *(int *)((long)p + 0x678) = (int)uStack_40;
                  puVar17 = *(uint **)((long)p + 0x20);
                  plVar12 = *(long **)((long)p + 0x108);
                  goto LAB_0010847f;
                }
              }
              else {
LAB_00107163:
                lVar49 = (ulong)uVar45 << 0x20;
                uVar44 = (ulong)(byte)*puStack_48;
                puStack_48 = (uint *)((long)puStack_48 + 1);
              }
LAB_00107171:
              uVar19 = uVar19 | uVar44 << (0x38U - (char)uVar46 & 0x3f);
            }
            uVar19 = uVar19 << ((byte)uVar46 & 7);
            uVar46 = uVar46 & 0x7ffffff8;
          }
          for (; (int)uVar46 < 0x10; uVar46 = uVar46 + 8) {
            uVar45 = (uint)((ulong)lVar49 >> 0x20);
            if (puStack_48 == *(uint **)((long)p + 0x30)) {
              uVar44 = 0;
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = uVar11;
                *(uint *)((long)p + 0xbc) = uVar10;
                *(ulong *)((long)p + 0x58) = uVar19;
                *(uint *)((long)p + 0x60) = uVar46;
                *(uint **)((long)p + 0x28) = puStack_48;
                *(uint *)((long)p + 0x690) = uVar8;
                *(uint *)((long)p + 0x694) = uStack_8c;
                *(uint *)((long)p + 0x698) = uVar45;
                *(uint *)((long)p + 0x69c) = uStack_90;
                *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                *(int *)((long)p + 0x678) = (int)uStack_40;
                puVar17 = *(uint **)((long)p + 0x20);
                plVar12 = *(long **)((long)p + 0x108);
                goto LAB_001084a3;
              }
            }
            else {
LAB_00107224:
              lVar49 = (ulong)uVar45 << 0x20;
              uVar44 = (ulong)(byte)*puStack_48;
              puStack_48 = (uint *)((long)puStack_48 + 1);
            }
LAB_00107232:
            uVar19 = uVar19 | uVar44 << (0x38U - (char)uVar46 & 0x3f);
          }
          *(uint *)((long)p + 0x6cc) = (uint)(ushort)(uVar19 >> 0x30);
          uVar44 = uVar19 << 0x10;
          for (iVar47 = uVar46 - 0x10; iVar43 = (int)uStack_40, iVar47 < 0x10; iVar47 = iVar47 + 8)
          {
            uVar46 = (uint)((ulong)lVar49 >> 0x20);
            if (puStack_48 == *(uint **)((long)p + 0x30)) {
              uVar19 = 0;
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = uVar11;
                *(uint *)((long)p + 0xbc) = uVar10;
                *(ulong *)((long)p + 0x58) = uVar44;
                *(int *)((long)p + 0x60) = iVar47;
                *(uint **)((long)p + 0x28) = puStack_48;
                *(uint *)((long)p + 0x690) = uVar8;
                *(uint *)((long)p + 0x694) = uStack_8c;
                *(uint *)((long)p + 0x698) = uVar46;
                *(uint *)((long)p + 0x69c) = uStack_90;
                *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
                *(int *)((long)p + 0x678) = iVar43;
                puVar17 = *(uint **)((long)p + 0x20);
                plVar12 = *(long **)((long)p + 0x108);
                goto LAB_00108427;
              }
            }
            else {
LAB_001070a2:
              lVar49 = (ulong)uVar46 << 0x20;
              uVar19 = (ulong)(byte)*puStack_48;
              puStack_48 = (uint *)((long)puStack_48 + 1);
            }
LAB_001070b0:
            uVar44 = uVar44 | uVar19 << (0x38U - (char)iVar47 & 0x3f);
          }
          uVar19 = uVar44 << 0x10;
          uVar46 = iVar47 - 0x10;
          uVar8 = *(int *)((long)p + 0x6cc) << 0x10 | (uint)(ushort)(uVar44 >> 0x30);
          *(uint *)((long)p + 0x6cc) = uVar8;
          lVar22 = 0xf8;
          if ((*(byte *)((long)p + 0x144) & 2) != 0) {
            uVar9 = adler32(__dest,uStack_40 & 0xffffffff,1);
            *(uint *)((long)p + 0xf8) = uVar9;
            if (*(uint *)((long)p + 0x6cc) == uVar9) goto LAB_0010a3fb;
            uVar8 = 8;
            lVar22 = 0x160;
          }
          *(uint *)((long)p + lVar22) = uVar8;
        }
        else {
          iVar43 = (int)uStack_40;
        }
LAB_0010a3fb:
        *(uint *)((long)p + 0xb8) = uVar11;
        *(uint *)((long)p + 0xbc) = uVar10;
        *(ulong *)((long)p + 0x58) = uVar19;
        *(uint *)((long)p + 0x60) = uVar46;
        *(uint **)((long)p + 0x28) = puStack_48;
        uVar15 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x18));
        **(uint64 **)((long)p + 0x108) = uVar15;
        **(ulong **)((long)p + 0x118) = (ulong)(uint)(iVar43 - *(int *)((long)p + 0x67c));
        *(int *)((long)p + 0x67c) = iVar43;
        *(undefined4 *)((long)p + 8) = 0x47c;
        return *(lzham_decompress_status_t *)((long)p + 0x160);
      case 0x458:
      case 0x459:
      case 0x45a:
      case 0x45b:
      case 0x45c:
      case 0x45e:
        goto switchD_00105fec_caseD_458;
      case 0x45d:
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_48 = puVar17;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          uVar45 = *(uint *)((long)p + 0x698);
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          if (0 < lVar22) goto LAB_00107163;
          lVar49 = (ulong)uVar45 << 0x20;
          uVar44 = 0;
          goto LAB_00107171;
        }
LAB_0010847f:
        *plVar12 = (long)puStack_48 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x45d;
        break;
      case 0x45f:
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_48 = puVar17;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          uVar45 = *(uint *)((long)p + 0x698);
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          if (0 < lVar22) goto LAB_00107224;
          lVar49 = (ulong)uVar45 << 0x20;
          uVar44 = 0;
          goto LAB_00107232;
        }
LAB_001084a3:
        *plVar12 = (long)puStack_48 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x45f;
        break;
      case 0x460:
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_48 = puVar17;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          uVar46 = *(uint *)((long)p + 0x698);
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          iVar47 = *(int *)((long)p + 0x60);
          if (0 < lVar22) goto LAB_001070a2;
          lVar49 = (ulong)uVar46 << 0x20;
          uVar19 = 0;
          goto LAB_001070b0;
        }
LAB_00108427:
        *plVar12 = (long)puStack_48 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x460;
        break;
      default:
        if (iVar47 != 0x442) goto switchD_00105fec_caseD_458;
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar22 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar22;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_48 = puVar17;
        if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x690);
          uStack_8c = *(uint *)((long)p + 0x694);
          lVar49 = (ulong)*(uint *)((long)p + 0x698) << 0x20;
          uStack_90 = *(uint *)((long)p + 0x69c);
          uStack_80._4_4_ = *(uint *)((long)p + 0x6a0);
          uStack_40 = (ulong)*(uint *)((long)p + 0x678);
          uVar11 = *(uint *)((long)p + 0xb8);
          uVar10 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar46 = *(uint *)((long)p + 0x60);
          if (0 < lVar22) goto LAB_00106fd0;
          uVar21 = 0;
          goto LAB_00106fd6;
        }
LAB_00108bc9:
        *plVar12 = (long)puStack_48 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x442;
      }
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  lVar22 = 1L << (*(byte *)((long)p + 0x13c) & 0x3f);
  uVar46 = (uint)lVar22;
  uVar11 = uVar46 - 1;
  __dest_00 = *(byte **)((long)p + 0xf0);
  iVar47 = *(int *)((long)p + 8);
  if (iVar47 < 0x318) {
    if (iVar47 < 0x22b) {
      if (iVar47 < 0x1e2) {
        if (iVar47 < 0x19a) {
          if (iVar47 == 0) {
            uVar19 = 0;
            if ((ulong)*(uint *)((long)p + 0x148) != 0) {
              memcpy(__dest_00,*(void **)((long)p + 0x150),(ulong)*(uint *)((long)p + 0x148));
              uVar10 = *(uint *)((long)p + 0x148);
              if (uVar10 < uVar46) {
                *(uint *)((long)p + 0x6c8) = uVar10;
                uVar19 = (ulong)uVar10;
              }
            }
            uVar21 = 0;
            bVar5 = symbol_codec::start_decoding
                              ((symbol_codec *)((long)p + 0x18),*(uint8 **)((long)p + 0x100),
                               **(size_t **)((long)p + 0x108),*(bool *)((long)p + 0x120),
                               (need_bytes_func_ptr)0x0,(void *)0x0);
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            puStack_70 = *(uint **)((long)p + 0x28);
            uVar44 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            iVar32 = 0;
            iVar28 = 0;
            iVar43 = 0;
            iStack_84 = 0;
            iVar47 = 0;
            uStack_8c = 0;
            uStack_90 = 0;
            iVar42 = 0;
            if ((*(byte *)((long)p + 0x144) & 4) != 0) goto LAB_0010e77e;
LAB_0010ff1c:
            uVar9 = *(uint *)((long)p + 0x158);
            uVar36 = *(uint *)((long)p + 0x15c);
            if (uVar36 == 0 && uVar9 == 0) {
              uVar8 = *(uint *)((long)p + 0x140);
              uVar45 = 0x14;
              if (uVar8 < 0x14) {
                uVar45 = uVar8;
              }
              uVar39 = 7;
              if (uVar8 != 0) {
                uVar39 = (ulong)(uVar45 - 1);
              }
              uVar9 = (uint)*(ushort *)(g_table_update_settings + uVar39 * 4);
              uVar36 = (uint)*(ushort *)(g_table_update_settings + uVar39 * 4 + 2);
            }
            bVar5 = quasi_adaptive_huffman_data_model::init2
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x168),*p,false,0x100
                               ,uVar9,uVar36,(uint16 *)0x0);
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::assign
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x1f8),
                               (quasi_adaptive_huffman_data_model *)((long)p + 0x168));
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::init2
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x288),*p,false,
                               *(int *)((long)p + 0x14) * 8 - 6,uVar9,uVar36,(uint16 *)0x0);
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::init2
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x318),*p,false,0x101
                               ,uVar9,uVar36,(uint16 *)0x0);
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::assign
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x3a8),
                               (quasi_adaptive_huffman_data_model *)((long)p + 0x318));
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::init2
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x438),*p,false,0xfa,
                               uVar9,uVar36,(uint16 *)0x0);
            if (!bVar5) {
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            bVar5 = quasi_adaptive_huffman_data_model::assign
                              ((quasi_adaptive_huffman_data_model *)((long)p + 0x4c8),
                               (quasi_adaptive_huffman_data_model *)((long)p + 0x438));
            if (bVar5) {
              bVar5 = quasi_adaptive_huffman_data_model::init2
                                ((quasi_adaptive_huffman_data_model *)((long)p + 0x558),*p,false,
                                 0x10,uVar9,uVar36,(uint16 *)0x0);
              if (bVar5) goto LAB_00110d41;
              return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
            }
            return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
          }
          if (iVar47 == 0x188) {
            puStack_70 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar49 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_70;
            *(uint **)((long)p + 0x28) = puStack_70;
            *(long *)((long)p + 0x38) = lVar49;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_70;
            if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              iVar43 = *(int *)((long)p + 0x690);
              iVar47 = *(int *)((long)p + 0x694);
              iVar28 = *(int *)((long)p + 0x698);
              iVar32 = *(int *)((long)p + 0x69c);
              uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar19 = (ulong)*(uint *)((long)p + 0x678);
              puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uVar44 = *(ulong *)((long)p + 0x58);
              uVar10 = *(uint *)((long)p + 0x60);
              if (lVar49 < 1) {
                uVar39 = 0;
                goto LAB_0010e769;
              }
              do {
                uVar39 = (ulong)(byte)*puStack_70;
                puStack_70 = (uint *)((long)puStack_70 + 1);
LAB_0010e769:
                while( true ) {
                  cVar27 = (char)uVar10;
                  uVar10 = uVar10 + 8;
                  uVar44 = uVar44 | uVar39 << (0x38U - cVar27 & 0x3f);
                  iVar42 = iVar47;
LAB_0010e77e:
                  iVar47 = iVar42;
                  if (7 < (int)uVar10) {
                    *(uint *)((long)p + 0x710) = (uint)(byte)(uVar44 >> 0x38);
                    uVar39 = uVar44 << 8;
                    iVar42 = uVar10 - 8;
                    goto LAB_0010e79e;
                  }
                  if (puStack_70 != *(uint **)((long)p + 0x30)) break;
                  uVar39 = 0;
                  if (*(char *)((long)p + 0x40) == '\0') {
                    *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                    *(uint *)((long)p + 0xbc) = uStack_88;
                    *(ulong *)((long)p + 0x58) = uVar44;
                    *(uint *)((long)p + 0x60) = uVar10;
                    *(uint **)((long)p + 0x28) = puStack_70;
                    *(int *)((long)p + 0x690) = iVar43;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(int *)((long)p + 0x698) = iVar28;
                    *(int *)((long)p + 0x69c) = iVar32;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(int *)((long)p + 0x678) = (int)uVar19;
                    plVar12 = *(long **)((long)p + 0x108);
                    puVar17 = *(uint **)((long)p + 0x20);
                    goto LAB_0010ef08;
                  }
                }
              } while( true );
            }
LAB_0010ef08:
            *plVar12 = (long)puStack_70 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x188;
          }
          else {
            if (iVar47 != 0x189) goto switchD_0010c873_caseD_458;
            puStack_70 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar49 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_70;
            *(uint **)((long)p + 0x28) = puStack_70;
            *(long *)((long)p + 0x38) = lVar49;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_70;
            if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              iVar43 = *(int *)((long)p + 0x690);
              iVar47 = *(int *)((long)p + 0x694);
              iVar28 = *(int *)((long)p + 0x698);
              iVar32 = *(int *)((long)p + 0x69c);
              uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar19 = (ulong)*(uint *)((long)p + 0x678);
              puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uVar39 = *(ulong *)((long)p + 0x58);
              iVar42 = *(int *)((long)p + 0x60);
              if (lVar49 < 1) {
                uVar44 = 0;
                goto LAB_0010cebe;
              }
              do {
                uVar44 = (ulong)(byte)*puStack_70;
                puStack_70 = (uint *)((long)puStack_70 + 1);
LAB_0010cebe:
                while( true ) {
                  cVar27 = (char)iVar42;
                  iVar42 = iVar42 + 8;
                  uVar39 = uVar39 | uVar44 << (0x38U - cVar27 & 0x3f);
LAB_0010e79e:
                  if (7 < iVar42) {
                    uVar10 = (uint)(byte)(uVar39 >> 0x38);
                    *(uint *)((long)p + 0x714) = uVar10;
                    if ((*(uint *)((long)p + 0x710) & 0xf) != 0xe) {
                      return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                    }
                    if ((*(uint *)((long)p + 0x710) << 8 | uVar10) % 0x1f != 0) {
                      return LZHAM_DECOMP_STATUS_FAILED_BAD_ZLIB_HEADER;
                    }
                    uVar44 = uVar39 << 8;
                    uVar10 = iVar42 - 8;
                    uStack_8c = iVar28;
                    uStack_90 = iVar43;
                    iStack_84 = iVar32;
                    if ((uVar39 >> 0x38 & 0x20) != 0) {
                      if (*(long *)((long)p + 0x150) != 0) {
                        *(undefined8 *)((long)p + 0x718) = 0;
                        uVar8 = 0;
                        goto LAB_0010fec9;
                      }
                      return LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES;
                    }
                    goto LAB_0010ff1c;
                  }
                  if (puStack_70 != *(uint **)((long)p + 0x30)) break;
                  uVar44 = 0;
                  if (*(char *)((long)p + 0x40) == '\0') {
                    *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                    *(uint *)((long)p + 0xbc) = uStack_88;
                    *(ulong *)((long)p + 0x58) = uVar39;
                    *(int *)((long)p + 0x60) = iVar42;
                    *(uint **)((long)p + 0x28) = puStack_70;
                    *(int *)((long)p + 0x690) = iVar43;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(int *)((long)p + 0x698) = iVar28;
                    *(int *)((long)p + 0x69c) = iVar32;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(int *)((long)p + 0x678) = (int)uVar19;
                    plVar12 = *(long **)((long)p + 0x108);
                    puVar17 = *(uint **)((long)p + 0x20);
                    goto LAB_0010ede0;
                  }
                }
              } while( true );
            }
LAB_0010ede0:
            *plVar12 = (long)puStack_70 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x189;
          }
        }
        else if (iVar47 < 0x1d8) {
          if (iVar47 == 0x19a) {
            puStack_70 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar49 = *plVar12;
            *(uint **)((long)p + 0x20) = puStack_70;
            *(uint **)((long)p + 0x28) = puStack_70;
            *(long *)((long)p + 0x38) = lVar49;
            *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puVar17 = puStack_70;
            if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              iVar43 = *(int *)((long)p + 0x690);
              iVar47 = *(int *)((long)p + 0x694);
              iVar28 = *(int *)((long)p + 0x698);
              iVar32 = *(int *)((long)p + 0x69c);
              uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar19 = (ulong)*(uint *)((long)p + 0x678);
              puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uVar39 = *(ulong *)((long)p + 0x58);
              uVar10 = *(uint *)((long)p + 0x60);
              if (lVar49 < 1) {
                uVar44 = 0;
                goto LAB_0010de1f;
              }
              do {
                uVar44 = (ulong)(byte)*puStack_70;
                puStack_70 = (uint *)((long)puStack_70 + 1);
LAB_0010de1f:
                while( true ) {
                  cVar27 = (char)uVar10;
                  uVar10 = uVar10 + 8;
                  uVar39 = uVar39 | uVar44 << (0x38U - cVar27 & 0x3f);
                  while (7 < (int)uVar10) {
                    uVar44 = uVar39 << 8;
                    uVar10 = uVar10 - 8;
                    *(uint *)((long)p + 0x718) =
                         *(int *)((long)p + 0x718) << 8 | (uint)(byte)(uVar39 >> 0x38);
                    uVar8 = *(int *)((long)p + 0x71c) + 1;
                    *(uint *)((long)p + 0x71c) = uVar8;
LAB_0010fec9:
                    uVar39 = uVar44;
                    if (3 < uVar8) {
                      uVar9 = adler32(*(void **)((long)p + 0x150),(ulong)*(uint *)((long)p + 0x148),
                                      1);
                      uStack_8c = iVar28;
                      uStack_90 = iVar43;
                      iStack_84 = iVar32;
                      if (uVar9 != *(uint *)((long)p + 0x718)) {
                        return LZHAM_DECOMP_STATUS_FAILED_BAD_SEED_BYTES;
                      }
                      goto LAB_0010ff1c;
                    }
                  }
                  if (puStack_70 != *(uint **)((long)p + 0x30)) break;
                  uVar44 = 0;
                  if (*(char *)((long)p + 0x40) == '\0') {
                    *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                    *(uint *)((long)p + 0xbc) = uStack_88;
                    *(ulong *)((long)p + 0x58) = uVar39;
                    *(uint *)((long)p + 0x60) = uVar10;
                    *(uint **)((long)p + 0x28) = puStack_70;
                    *(int *)((long)p + 0x690) = iVar43;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(int *)((long)p + 0x698) = iVar28;
                    *(int *)((long)p + 0x69c) = iVar32;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(int *)((long)p + 0x678) = (int)uVar19;
                    plVar12 = *(long **)((long)p + 0x108);
                    puVar17 = *(uint **)((long)p + 0x20);
                    goto LAB_0010ed6c;
                  }
                }
              } while( true );
            }
LAB_0010ed6c:
            *plVar12 = (long)puStack_70 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x19a;
          }
          else {
            if (iVar47 != 0x1d2) goto switchD_0010c873_caseD_458;
            puVar17 = *(uint **)((long)p + 0x100);
            plVar12 = *(long **)((long)p + 0x108);
            lVar49 = *plVar12;
            *(uint **)((long)p + 0x20) = puVar17;
            *(uint **)((long)p + 0x28) = puVar17;
            *(long *)((long)p + 0x38) = lVar49;
            *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
            *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
            puStack_70 = puVar17;
            if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
              uStack_90 = *(int *)((long)p + 0x690);
              iVar47 = *(int *)((long)p + 0x694);
              uStack_8c = *(int *)((long)p + 0x698);
              iStack_84 = *(int *)((long)p + 0x69c);
              uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
              uVar19 = (ulong)*(uint *)((long)p + 0x678);
              puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
              uStack_88 = *(uint *)((long)p + 0xbc);
              uVar44 = *(ulong *)((long)p + 0x58);
              uVar10 = *(uint *)((long)p + 0x60);
              if (0 < lVar49) goto LAB_0010c708;
              uVar39 = 0;
              goto LAB_0010c712;
            }
LAB_0010ebd8:
            *plVar12 = (long)puStack_70 - (long)puVar17;
            **(undefined8 **)((long)p + 0x118) = 0;
            *(undefined4 *)((long)p + 8) = 0x1d2;
          }
        }
        else if (iVar47 == 0x1d8) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_70 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uVar44 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010ded4;
            uVar39 = 0;
            goto LAB_0010dede;
          }
LAB_0010ed90:
          *plVar12 = (long)puStack_70 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x1d8;
        }
        else {
          if (iVar47 != 0x1e0) goto switchD_0010c873_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_70 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uVar39 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010d3ab;
            uVar44 = 0;
            goto LAB_0010d3b5;
          }
LAB_0010ebfc:
          *plVar12 = (long)puStack_70 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x1e0;
        }
      }
      else {
        if (0x1f0 < iVar47) {
          if (iVar47 < 0x213) {
            if (iVar47 == 0x1f1) {
LAB_001103ad:
              *(undefined4 *)((long)p + 8) = 0x1f1;
              return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
            }
            if (iVar47 == 0x1fc) {
              puStack_70 = *(uint **)((long)p + 0x100);
              lVar49 = **(long **)((long)p + 0x108);
              *(uint **)((long)p + 0x20) = puStack_70;
              *(uint **)((long)p + 0x28) = puStack_70;
              *(long *)((long)p + 0x38) = lVar49;
              *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
              *(void **)((long)p + 0x6b0) = pvVar29;
              uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
              *(ulong *)((long)p + 0x6b8) = uVar44;
              goto LAB_00110315;
            }
          }
          else {
            if (iVar47 == 0x213) {
              uStack_90 = *(int *)((long)p + 0x690);
              iVar47 = *(int *)((long)p + 0x694);
              uStack_8c = *(int *)((long)p + 0x698);
              iStack_84 = *(int *)((long)p + 0x69c);
              uVar10 = *(uint *)((long)p + 0x6a0);
              uVar8 = *(uint *)((long)p + 0x678);
              puStack_70 = *(uint **)((long)p + 0x100);
              lVar49 = **(long **)((long)p + 0x108);
              *(uint **)((long)p + 0x20) = puStack_70;
              *(uint **)((long)p + 0x28) = puStack_70;
              *(long *)((long)p + 0x38) = lVar49;
              *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
              *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
              goto LAB_00110350;
            }
            if (iVar47 == 0x228) {
              puStack_70 = *(uint **)((long)p + 0x100);
              plVar12 = *(long **)((long)p + 0x108);
              lVar49 = *plVar12;
              *(uint **)((long)p + 0x20) = puStack_70;
              *(uint **)((long)p + 0x28) = puStack_70;
              *(long *)((long)p + 0x38) = lVar49;
              *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
              *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
              puVar17 = puStack_70;
              if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
                uVar7 = *(undefined4 *)((long)p + 0x6f0);
                uStack_90 = *(int *)((long)p + 0x690);
                iVar47 = *(int *)((long)p + 0x694);
                uStack_8c = *(int *)((long)p + 0x698);
                iStack_84 = *(int *)((long)p + 0x69c);
                uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
                uVar19 = (ulong)*(uint *)((long)p + 0x678);
                puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                uStack_88 = *(uint *)((long)p + 0xbc);
                uVar44 = *(ulong *)((long)p + 0x58);
                uVar10 = *(uint *)((long)p + 0x60);
                if (0 < lVar49) goto LAB_0010d485;
                uVar39 = 0;
                goto LAB_0010d48f;
              }
LAB_0010ec20:
              *plVar12 = (long)puStack_70 - (long)puVar17;
              **(undefined8 **)((long)p + 0x118) = 0;
              *(undefined4 *)((long)p + 8) = 0x228;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
          }
          goto switchD_0010c873_caseD_458;
        }
        if (iVar47 == 0x1e2) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puStack_70 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uVar39 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010e6ac;
            uVar44 = 0;
            goto LAB_0010e6b6;
          }
LAB_0010eeb8:
          *plVar12 = (long)puStack_70 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x1e2;
        }
        else {
          if (iVar47 == 0x1e8) {
LAB_001103f1:
            *(undefined4 *)((long)p + 8) = 0x1e8;
            return LZHAM_DECOMP_STATUS_FAILED_BAD_SYNC_BLOCK;
          }
          if (iVar47 != 0x1eb) goto switchD_0010c873_caseD_458;
          puStack_70 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puStack_70;
          *(uint **)((long)p + 0x28) = puStack_70;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar17 = puStack_70;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uVar38 = *(ulong *)((long)p + 0x58);
            iVar43 = *(int *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010cf92;
            uVar44 = 0;
            goto LAB_0010cf9c;
          }
LAB_0010ee04:
          *plVar12 = (long)puStack_70 - (long)puVar17;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x1eb;
        }
      }
    }
    else if (iVar47 < 0x283) {
      if (0x249 < iVar47) {
        if (iVar47 < 0x26b) {
          if (iVar47 == 0x24a) {
            *(undefined4 *)((long)p + 8) = 0x24a;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          if (iVar47 == 0x252) {
            puStack_70 = *(uint **)((long)p + 0x100);
            lVar49 = **(long **)((long)p + 0x108);
            *(uint **)((long)p + 0x20) = puStack_70;
            *(uint **)((long)p + 0x28) = puStack_70;
            *(long *)((long)p + 0x38) = lVar49;
            *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
            *(void **)((long)p + 0x6b0) = pvVar29;
            uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
            *(ulong *)((long)p + 0x6b8) = uVar44;
            goto LAB_0010fb94;
          }
        }
        else {
          if (iVar47 == 0x26b) {
LAB_0010fe2c:
            *(undefined4 *)((long)p + 8) = 0x26b;
            return LZHAM_DECOMP_STATUS_FAILED_EXPECTED_MORE_RAW_BYTES;
          }
          if (iVar47 == 0x26f) {
            uVar39 = (ulong)*(uint *)((long)p + 0x6f0);
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            lVar49 = *(long *)((long)p + 0x100);
            puVar13 = *(ulong **)((long)p + 0x108);
            uVar44 = *puVar13;
            *(long *)((long)p + 0x20) = lVar49;
            *(long *)((long)p + 0x28) = lVar49;
            *(ulong *)((long)p + 0x38) = uVar44;
            *(ulong *)((long)p + 0x30) = lVar49 + uVar44;
            *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
            uVar44 = *puVar13;
            uVar38 = 0;
            goto LAB_0010fcc4;
          }
        }
        goto switchD_0010c873_caseD_458;
      }
      if (iVar47 == 0x22b) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar39 = (ulong)*(uint *)((long)p + 0x6f0);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010e212;
          uVar38 = 0;
          goto LAB_0010e21c;
        }
LAB_0010ee28:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x22b;
      }
      else {
        if (iVar47 == 0x235) {
LAB_0010e2c5:
          *(undefined4 *)((long)p + 8) = 0x235;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_RAW_BLOCK;
        }
        if (iVar47 != 0x23b) goto switchD_0010c873_caseD_458;
        puStack_70 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puStack_70;
        *(uint **)((long)p + 0x28) = puStack_70;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puStack_70;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar39 = (ulong)*(uint *)((long)p + 0x6f0);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar38 = *(ulong *)((long)p + 0x58);
          uVar8 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010cde8;
          uVar44 = 0;
          goto LAB_0010cdf2;
        }
LAB_0010ed48:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x23b;
      }
    }
    else if (iVar47 < 0x2cd) {
      if (iVar47 < 0x2a3) {
        if (iVar47 == 0x283) {
          *(undefined4 *)((long)p + 8) = 0x283;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar47 == 0x294) {
          puStack_70 = *(uint **)((long)p + 0x100);
          lVar49 = **(long **)((long)p + 0x108);
          *(uint **)((long)p + 0x20) = puStack_70;
          *(uint **)((long)p + 0x28) = puStack_70;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
          *(void **)((long)p + 0x6b0) = pvVar29;
          uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          *(ulong *)((long)p + 0x6b8) = uVar44;
          goto LAB_0010fa7e;
        }
        goto switchD_0010c873_caseD_458;
      }
      if (iVar47 == 0x2a3) {
        puStack_70 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puStack_70;
        *(uint **)((long)p + 0x28) = puStack_70;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puStack_70;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uVar8 = *(uint *)((long)p + 0xbc);
          uVar39 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010e9c6;
          uVar44 = 0;
          goto LAB_0010e9d0;
        }
LAB_0010ef50:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2a3;
      }
      else {
        if (iVar47 != 0x2ae) goto switchD_0010c873_caseD_458;
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uStack_90 = *(int *)((long)p + 0x690);
          uVar45 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010d56f;
          uVar44 = 0;
LAB_0010d575:
          do {
            cVar27 = (char)uVar10;
            uVar10 = uVar10 + 8;
            uVar21 = uVar21 | uVar44 << (0x38U - cVar27 & 0x3f);
            while (1 < (int)uVar10) {
              uVar44 = uVar21 << 2;
              uVar10 = uVar10 - 2;
              if (uVar21 >> 0x3e == 2) {
                lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
              }
              else if ((uint)(uVar21 >> 0x3e) == 1) {
                lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
              }
LAB_001107cf:
              while( true ) {
                puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x5e8);
                uVar8 = (uint)puStack_68;
                for (; uVar35 = (uint)uVar19, uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
                  *(ushort **)((long)p + 0xd0) = puVar14;
                  uVar21 = uVar44;
                  for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                    if (puStack_70 == *(uint **)((long)p + 0x30)) {
                      uVar44 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar8;
                        *(uint *)((long)p + 0xbc) = uStack_88;
                        *(ulong *)((long)p + 0x58) = uVar21;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puStack_70;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(uint *)((long)p + 0x694) = uVar45;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(int *)((long)p + 0x6a0) = (int)uVar39;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        plVar12 = *(long **)((long)p + 0x108);
                        puVar17 = *(uint **)((long)p + 0x20);
                        goto LAB_0010ef2c;
                      }
                    }
                    else {
LAB_0010e8e2:
                      uVar44 = (ulong)(byte)*puStack_70;
                      puStack_70 = (uint *)((long)puStack_70 + 1);
                    }
LAB_0010e8e8:
                    uVar21 = uVar21 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                  }
                  uVar44 = uVar21 << 8;
                  uVar10 = uVar10 - 8;
                  puVar14 = *(ushort **)((long)p + 0xd0);
                  uVar8 = uVar8 << 8 | (uint)(byte)(uVar21 >> 0x38);
                }
                uVar3 = *puVar14;
                uVar26 = (uStack_88 >> 0xb) * (uint)uVar3;
                puStack_68._0_4_ = uVar8 - uVar26;
                if (uVar26 <= uVar8) break;
                *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                uStack_88 = uVar26;
                if ((uint)uVar39 < 7) {
                  pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x168);
                  pdVar24 = *(decoder_tables **)((long)p + 0x1d0);
                  if ((int)uVar10 < 0x18) {
                    uStack_58 = *(uint **)((long)p + 0x30);
                    if (puStack_70 + 1 < uStack_58) {
                      uVar26 = *puStack_70;
                      uVar10 = uVar10 + 0x20;
                      uVar44 = uVar44 | (ulong)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 |
                                                (uVar26 & 0xff00) << 8 | uVar26 << 0x18) <<
                                        (-(char)uVar10 & 0x3fU);
                      puStack_70 = puStack_70 + 1;
                    }
                    else {
                      for (; (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                        uVar26 = (uint)uVar19;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                          *(uint *)((long)p + 0xb8) = uVar8;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puStack_70;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(uint *)((long)p + 0x694) = uVar45;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(uint *)((long)p + 0x678) = uVar26;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar17 = *(uint **)((long)p + 0x20);
                          goto LAB_0011166a;
                        }
LAB_00111557:
                        uVar19 = 0;
                        if (puStack_70 < uStack_58) {
                          uVar19 = (ulong)(byte)*puStack_70;
                          puStack_70 = (uint *)((long)puStack_70 + 1);
                        }
                        uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
                        uVar19 = (ulong)uVar26;
                      }
                    }
                  }
                  uVar26 = (uint)(ushort)(uVar44 >> 0x30);
                  if (uVar26 < pdVar24->m_table_max_code) {
                    uVar35 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar26 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar43 = iVar47;
                      iVar47 = iVar43 + 1;
                    } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar26);
                    uVar35 = (int)(uVar44 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar43 + 0x40U];
                    uVar26 = 0;
                    if (uVar35 < pqVar33->m_total_syms) {
                      uVar26 = uVar35;
                    }
                    uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar26];
                    uVar26 = iVar43 + 0x41;
                  }
                  uVar44 = uVar44 << ((byte)uVar26 & 0x3f);
                  puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                  *puVar2 = *puVar2 + 1;
                  uVar10 = uVar10 - uVar26;
                  puVar1 = &pqVar33->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  puStack_68._0_4_ = uVar8;
                  uStack_58 = (uint *)uVar39;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                  }
                }
                else {
                  puStack_68._0_4_ = (uint)__dest_00[uVar35 - uStack_90 & uVar11];
                  pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x1f8);
                  pdVar24 = *(decoder_tables **)((long)p + 0x260);
                  uStack_58 = (uint *)uVar39;
                  if ((int)uVar10 < 0x18) {
                    puStack_68._0_4_ = (uint)__dest_00[uVar35 - uStack_90 & uVar11];
                    puVar17 = *(uint **)((long)p + 0x30);
                    if (puStack_70 + 1 < puVar17) {
                      uVar26 = *puStack_70;
                      uVar10 = uVar10 + 0x20;
                      uVar44 = uVar44 | (ulong)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 |
                                                (uVar26 & 0xff00) << 8 | uVar26 << 0x18) <<
                                        (-(char)uVar10 & 0x3fU);
                      puStack_70 = puStack_70 + 1;
                    }
                    else {
                      for (; uVar35 = (uint)uVar19, uStack_58 = (uint *)uVar39, (int)uVar10 < 0x18;
                          uVar10 = uVar10 + 8) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                          *(uint *)((long)p + 0xb8) = uVar8;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puStack_70;
                          *(uint *)((long)p + 0x6d0) = (uint)puStack_68;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(uint *)((long)p + 0x694) = uVar45;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(uint *)((long)p + 0x678) = uVar35;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar16 = *(uint **)((long)p + 0x20);
                          goto LAB_0011181a;
                        }
LAB_001116f3:
                        uVar19 = 0;
                        if (puStack_70 < puVar17) {
                          uVar19 = (ulong)(byte)*puStack_70;
                          puStack_70 = (uint *)((long)puStack_70 + 1);
                        }
                        uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
                        uVar19 = (ulong)uVar35;
                      }
                    }
                  }
                  uVar19 = (ulong)uVar35;
                  uVar26 = (uint)(ushort)(uVar44 >> 0x30);
                  if (uVar26 < pdVar24->m_table_max_code) {
                    uVar35 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar26 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar43 = iVar47;
                      iVar47 = iVar43 + 1;
                    } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar26);
                    uVar35 = (int)(uVar44 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar43 + 0x40U];
                    uVar26 = 0;
                    if (uVar35 < pqVar33->m_total_syms) {
                      uVar26 = uVar35;
                    }
                    uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar26];
                    uVar26 = iVar43 + 0x41;
                  }
                  uVar44 = uVar44 << ((byte)uVar26 & 0x3f);
                  puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                  *puVar2 = *puVar2 + 1;
                  uVar10 = uVar10 - uVar26;
                  puVar1 = &pqVar33->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                  }
                  uVar35 = uVar35 ^ (uint)puStack_68;
                  puStack_68._0_4_ = uVar8;
                }
                __dest_00[uVar19] = (byte)uVar35;
                bVar18 = (&s_literal_next_state)[(long)uStack_58];
                uVar39 = (ulong)bVar18;
                uVar8 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar8;
                if (uVar11 < uVar8) {
                  *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_88;
                  *(ulong *)((long)p + 0x58) = uVar44;
                  *(uint *)((long)p + 0x60) = uVar10;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  *(uint *)((long)p + 0x690) = uStack_90;
                  *(uint *)((long)p + 0x694) = uVar45;
                  *(uint *)((long)p + 0x698) = uStack_8c;
                  *(int *)((long)p + 0x69c) = iStack_84;
                  *(uint *)((long)p + 0x6a0) = (uint)bVar18;
                  *(uint *)((long)p + 0x678) = uVar8;
                  pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0) +
                                    (ulong)*(uint *)((long)p + 0x67c));
                  *(void **)((long)p + 0x6b0) = pvVar29;
                  uVar44 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) + *(uint *)((long)p + 0x6c8)
                                            ));
                  *(ulong *)((long)p + 0x6b8) = uVar44;
                  *(undefined4 *)((long)p + 0x6c8) = 0;
                  *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010dfb6:
                  if (uVar44 != 0) {
                    uVar19 = **(ulong **)((long)p + 0x118);
                    if (uVar19 <= uVar44) {
                      uVar44 = uVar19;
                    }
                    *(ulong *)((long)p + 0x6c0) = uVar44;
                    if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                      memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
                    }
                    else if (uVar19 != 0) {
                      uVar19 = 0;
                      do {
                        sVar48 = uVar44 - uVar19;
                        if (0x1fff < sVar48) {
                          sVar48 = 0x2000;
                        }
                        memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                               (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                        uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                        *(uint *)((long)p + 0xf8));
                        *(uint *)((long)p + 0xf8) = uVar9;
                        uVar19 = uVar19 + sVar48;
                        uVar44 = *(ulong *)((long)p + 0x6c0);
                      } while (uVar19 < uVar44);
                    }
                    **(long **)((long)p + 0x108) =
                         *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                    lVar22 = *(long *)((long)p + 0x6c0);
                    **(long **)((long)p + 0x118) = lVar22;
                    *(undefined4 *)((long)p + 8) = 0x318;
                    goto LAB_001110a3;
                  }
                  uVar45 = *(int *)((long)p + 0x694);
                  uStack_8c = *(int *)((long)p + 0x698);
                  iStack_84 = *(int *)((long)p + 0x69c);
                  uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
                  puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                  uStack_88 = *(uint *)((long)p + 0xbc);
                  uVar44 = *(ulong *)((long)p + 0x58);
                  uVar10 = *(uint *)((long)p + 0x60);
                  uVar19 = 0;
                  uStack_90 = *(int *)((long)p + 0x690);
                }
              }
              *puVar14 = uVar3 - (uVar3 >> 5);
              puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x600);
              uVar35 = 1;
              puVar17 = puStack_70;
              iVar47 = uVar45;
              for (uVar26 = uStack_88 - uVar26; uVar26 < 0x1000000; uVar26 = uVar26 << 8) {
                *(ushort **)((long)p + 0xd0) = puVar14;
                uVar21 = uVar44;
                for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                  if (puVar17 == *(uint **)((long)p + 0x30)) {
                    uVar44 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uVar26;
                      *(ulong *)((long)p + 0x58) = uVar21;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puVar17;
                      *(uint *)((long)p + 0x6d4) = uVar35;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar39;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar16 = *(uint **)((long)p + 0x20);
                      goto LAB_0010ee4c;
                    }
                  }
                  else {
LAB_0010e37a:
                    uVar44 = (ulong)(byte)*puVar17;
                    puVar17 = (uint *)((long)puVar17 + 1);
                  }
LAB_0010e380:
                  uVar21 = uVar21 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar44 = uVar21 << 8;
                uVar10 = uVar10 - 8;
                puVar14 = *(ushort **)((long)p + 0xd0);
                puStack_68._0_4_ = (uint)puStack_68 << 8 | (uint)(byte)(uVar21 >> 0x38);
              }
              uVar3 = *puVar14;
              uStack_88 = (uVar26 >> 0xb) * (uint)uVar3;
              uVar8 = (uint)puStack_68 - uStack_88;
              if (uStack_88 <= (uint)puStack_68) {
                *puVar14 = uVar3 - (uVar3 >> 5);
                puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x618);
                for (uVar26 = uVar26 - uStack_88; uVar26 < 0x1000000; uVar26 = uVar26 << 8) {
                  *(ushort **)((long)p + 0xd0) = puVar14;
                  uVar21 = uVar44;
                  for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                    if (puVar17 == *(uint **)((long)p + 0x30)) {
                      uVar44 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = uVar8;
                        *(uint *)((long)p + 0xbc) = uVar26;
                        *(ulong *)((long)p + 0x58) = uVar21;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puVar17;
                        *(uint *)((long)p + 0x6d4) = uVar35;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(int *)((long)p + 0x694) = iVar47;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(int *)((long)p + 0x6a0) = (int)uVar39;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        plVar12 = *(long **)((long)p + 0x108);
                        puVar16 = *(uint **)((long)p + 0x20);
                        goto LAB_0010ecdc;
                      }
                    }
                    else {
LAB_0010cada:
                      uVar44 = (ulong)(byte)*puVar17;
                      puVar17 = (uint *)((long)puVar17 + 1);
                    }
LAB_0010cae0:
                    uVar21 = uVar21 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                  }
                  uVar44 = uVar21 << 8;
                  uVar10 = uVar10 - 8;
                  puVar14 = *(ushort **)((long)p + 0xd0);
                  uVar8 = uVar8 << 8 | (uint)(byte)(uVar21 >> 0x38);
                }
                uVar3 = *puVar14;
                uStack_88 = (uVar26 >> 0xb) * (uint)uVar3;
                uVar40 = uVar8 - uStack_88;
                if (uVar8 < uStack_88) {
                  *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                  bVar5 = 6 < (uint)uVar39;
                  pqVar33 = (quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)((uint)bVar5 * 0x90) + 0x318);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)((uint)bVar5 * 0x90) + 0x380);
                  puStack_70 = puVar17;
                  if ((int)uVar10 < 0x18) {
                    puVar16 = *(uint **)((long)p + 0x30);
                    if (puVar17 + 1 < puVar16) {
                      uVar45 = *puVar17;
                      uVar10 = uVar10 + 0x20;
                      uVar44 = uVar44 | (ulong)(uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                                (uVar45 & 0xff00) << 8 | uVar45 << 0x18) <<
                                        (-(char)uVar10 & 0x3fU);
                      puStack_70 = puVar17 + 1;
                    }
                    else {
                      for (; puStack_70 = puVar17, (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                        uVar45 = (uint)uVar19;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                          *(uint *)((long)p + 0xb8) = uVar8;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(uint *)((long)p + 0x678) = uVar45;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar20 = *(uint **)((long)p + 0x20);
                          goto LAB_00111e24;
                        }
LAB_00111d1c:
                        uVar19 = 0;
                        if (puVar17 < puVar16) {
                          uVar19 = (ulong)(byte)*puVar17;
                          puVar17 = (uint *)((long)puVar17 + 1);
                        }
                        uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
                        uVar19 = (ulong)uVar45;
                      }
                    }
                  }
                  uVar45 = (uint)(ushort)(uVar44 >> 0x30);
                  if (uVar45 < pdVar24->m_table_max_code) {
                    uVar35 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar45 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar28 = iVar43;
                      iVar43 = iVar28 + 1;
                    } while (pdVar24->m_max_codes[iVar28 + 0x40U] <= uVar45);
                    uVar26 = (int)(uVar44 >> (-(char)(iVar28 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar28 + 0x40U];
                    uVar45 = 0;
                    if (uVar26 < pqVar33->m_total_syms) {
                      uVar45 = uVar26;
                    }
                    uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar45];
                    uVar45 = iVar28 + 0x41;
                  }
                  uVar44 = uVar44 << ((byte)uVar45 & 0x3f);
                  puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                  *puVar2 = *puVar2 + 1;
                  uVar10 = uVar10 - uVar45;
                  puVar1 = &pqVar33->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                  }
                  uVar35 = uVar35 + 2;
                  uVar21 = 0;
                  if (uVar35 == 0x102) {
                    do {
                      while (uVar45 = uVar10, (int)uVar45 < 1) {
                        puVar17 = puStack_70;
                        if (puStack_70 == *(uint **)((long)p + 0x30)) {
                          uVar38 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar8;
                            *(uint *)((long)p + 0xbc) = uStack_88;
                            *(ulong *)((long)p + 0x58) = uVar44;
                            *(uint *)((long)p + 0x60) = uVar45;
                            *(uint **)((long)p + 0x28) = puStack_70;
                            *(int *)((long)p + 0x6d4) = (int)uVar21;
                            *(uint *)((long)p + 0x690) = uStack_90;
                            *(int *)((long)p + 0x694) = iVar47;
                            *(uint *)((long)p + 0x698) = uStack_8c;
                            *(int *)((long)p + 0x69c) = iStack_84;
                            *(int *)((long)p + 0x6a0) = (int)uVar39;
                            *(int *)((long)p + 0x678) = (int)uVar19;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010ee94;
                          }
                        }
                        else {
LAB_00112085:
                          uVar38 = (ulong)(byte)*puVar17;
                          puVar17 = (uint *)((long)puVar17 + 1);
                        }
LAB_0011208f:
                        uVar44 = uVar38 << (0x38U - (char)uVar45 & 0x3f) | uVar44;
                        puStack_70 = puVar17;
                        uVar10 = uVar45 + 8;
                      }
                      uVar38 = uVar44 * 2;
                      if (-1 < (long)uVar44) break;
                      uVar26 = (int)uVar21 + 1;
                      uVar21 = (ulong)uVar26;
                      uVar44 = uVar38;
                      uVar10 = uVar45 - 1;
                    } while (uVar26 < 3);
                    iVar43 = uVar45 - 1;
                    while( true ) {
                      bVar18 = *(byte *)((long)&s_huge_match_code_len + uVar21);
                      uVar10 = iVar43 - (uint)bVar18;
                      if ((int)(uint)bVar18 <= iVar43) break;
                      puVar17 = puStack_70;
                      if (puStack_70 == *(uint **)((long)p + 0x30)) {
                        uVar44 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar8;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar38;
                          *(int *)((long)p + 0x60) = iVar43;
                          *(uint **)((long)p + 0x28) = puStack_70;
                          *(int *)((long)p + 0x6d4) = (int)uVar21;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(int *)((long)p + 0x678) = (int)uVar19;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_0010ed24;
                        }
                      }
                      else {
LAB_0010cd0b:
                        uVar44 = (ulong)(byte)*puVar17;
                        puStack_70 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010cd11:
                      cVar27 = (char)iVar43;
                      iVar43 = iVar43 + 8;
                      uVar38 = uVar38 | uVar44 << (0x38U - cVar27 & 0x3f);
                    }
                    uVar44 = uVar38 << (bVar18 & 0x3f);
                    uVar35 = (int)(uVar38 >> (-bVar18 & 0x3f)) +
                             *(int *)(s_huge_match_base_len + uVar21 * 4);
                  }
                  puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x648);
                  uVar45 = uStack_90;
                  uStack_90 = iVar47;
                  for (; uVar41 = (uint)uVar39, uStack_88 < 0x1000000; uStack_88 = uStack_88 << 8) {
                    *(ushort **)((long)p + 0xd0) = puVar14;
                    uVar21 = uVar44;
                    for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                      puVar17 = puStack_70;
                      if (puStack_70 == *(uint **)((long)p + 0x30)) {
                        uVar44 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar8;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puStack_70;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x690) = uVar45;
                          *(uint *)((long)p + 0x694) = uStack_90;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(int *)((long)p + 0x678) = (int)uVar19;
                          puVar17 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_0010ec8c;
                        }
                      }
                      else {
LAB_0010dbc9:
                        uVar44 = (ulong)(byte)*puVar17;
                        puStack_70 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010dbcf:
                      uVar21 = uVar21 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                    }
                    uVar44 = uVar21 << 8;
                    uVar10 = uVar10 - 8;
                    puVar14 = *(ushort **)((long)p + 0xd0);
                    uVar8 = uVar8 << 8 | (uint)(byte)(uVar21 >> 0x38);
                  }
                  uVar3 = *puVar14;
                  uVar37 = (uStack_88 >> 0xb) * (uint)uVar3;
                  puStack_68._0_4_ = uVar8 - uVar37;
                  if (uVar8 < uVar37) {
                    *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x660);
                    uVar26 = uStack_8c;
                    while( true ) {
                      uVar41 = (uint)uVar39;
                      uVar40 = (uint)uVar19;
                      if (0xffffff < uVar37) break;
                      *(ushort **)((long)p + 0xd0) = puVar14;
                      uVar19 = uVar44;
                      for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                        if (puStack_70 == *(uint **)((long)p + 0x30)) {
                          uVar44 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar8;
                            *(uint *)((long)p + 0xbc) = uVar37;
                            *(ulong *)((long)p + 0x58) = uVar19;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(uint **)((long)p + 0x28) = puStack_70;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(uint *)((long)p + 0x690) = uVar45;
                            *(uint *)((long)p + 0x694) = uStack_90;
                            *(uint *)((long)p + 0x698) = uVar26;
                            *(int *)((long)p + 0x69c) = iStack_84;
                            *(int *)((long)p + 0x6a0) = (int)uVar39;
                            *(uint *)((long)p + 0x678) = uVar40;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar17 = *(uint **)((long)p + 0x20);
                            goto LAB_0010eb88;
                          }
                        }
                        else {
LAB_0010c7f0:
                          uVar44 = (ulong)(byte)*puStack_70;
                          puStack_70 = (uint *)((long)puStack_70 + 1);
                        }
LAB_0010c7fe:
                        uVar19 = uVar19 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                      }
                      uVar44 = uVar19 << 8;
                      uVar10 = uVar10 - 8;
                      puVar14 = *(ushort **)((long)p + 0xd0);
                      uVar8 = uVar8 << 8 | (uint)(byte)(uVar19 >> 0x38);
                      uVar37 = uVar37 << 8;
                      uVar19 = (ulong)uVar40;
                    }
                    uVar3 = *puVar14;
                    uStack_88 = (uVar37 >> 0xb) * (uint)uVar3;
                    puStack_68._0_4_ = uVar8 - uStack_88;
                    if (uVar8 < uStack_88) {
                      *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                      uStack_8c = uStack_90;
                      puStack_68._0_4_ = uVar8;
                      uStack_90 = iStack_84;
                      iStack_84 = uVar26;
                    }
                    else {
                      *puVar14 = uVar3 - (uVar3 >> 5);
                      uStack_88 = uVar37 - uStack_88;
                      uStack_8c = uStack_90;
                      uStack_90 = uVar26;
                    }
                  }
                  else {
                    *puVar14 = uVar3 - (uVar3 >> 5);
                    uStack_88 = uStack_88 - uVar37;
                  }
                  uVar39 = (ulong)((uint)(6 < uVar41) * 3 + 8);
                  uVar8 = uStack_90;
                }
                else {
                  *puVar14 = uVar3 - (uVar3 >> 5);
                  puVar14 = (ushort *)((long)p + uVar39 * 2 + 0x630);
                  uVar45 = iVar47;
                  for (uVar26 = uVar26 - uStack_88; uVar26 < 0x1000000; uVar26 = uVar26 << 8) {
                    *(ushort **)((long)p + 0xd0) = puVar14;
                    uVar21 = uVar44;
                    for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                      if (puVar17 == *(uint **)((long)p + 0x30)) {
                        uVar44 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = uVar40;
                          *(uint *)((long)p + 0xbc) = uVar26;
                          *(ulong *)((long)p + 0x58) = uVar21;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(uint *)((long)p + 0x694) = uVar45;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar39;
                          *(int *)((long)p + 0x678) = (int)uVar19;
                          plVar12 = *(long **)((long)p + 0x108);
                          puVar16 = *(uint **)((long)p + 0x20);
                          goto LAB_0010ec44;
                        }
                      }
                      else {
LAB_0010da00:
                        uVar44 = (ulong)(byte)*puVar17;
                        puVar17 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010da06:
                      uVar21 = uVar21 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                    }
                    uVar44 = uVar21 << 8;
                    uVar10 = uVar10 - 8;
                    puVar14 = *(ushort **)((long)p + 0xd0);
                    uVar40 = uVar40 << 8 | (uint)(byte)(uVar21 >> 0x38);
                  }
                  uVar3 = *puVar14;
                  uStack_88 = (uVar26 >> 0xb) * (uint)uVar3;
                  puStack_68._0_4_ = uVar40 - uStack_88;
                  uVar8 = (uint)uVar39;
                  puStack_70 = puVar17;
                  if (uVar40 < uStack_88) {
                    *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    pqVar33 = (quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)((uint)(6 < uVar8) * 0x90) + 0x318);
                    pdVar24 = *(decoder_tables **)
                               ((long)p + (ulong)((uint)(6 < uVar8) * 0x90) + 0x380);
                    if ((int)uVar10 < 0x18) {
                      puVar16 = *(uint **)((long)p + 0x30);
                      if (puVar17 + 1 < puVar16) {
                        uVar8 = *puVar17;
                        uVar10 = uVar10 + 0x20;
                        uVar44 = uVar44 | (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                                  (uVar8 & 0xff00) << 8 | uVar8 << 0x18) <<
                                          (-(char)uVar10 & 0x3fU);
                        puStack_70 = puVar17 + 1;
                      }
                      else {
                        for (; puStack_70 = puVar17, (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                            *(uint *)((long)p + 0xb8) = uVar40;
                            *(uint *)((long)p + 0xbc) = uStack_88;
                            *(ulong *)((long)p + 0x58) = uVar44;
                            *(uint *)((long)p + 0x60) = uVar10;
                            *(uint **)((long)p + 0x28) = puVar17;
                            *(uint *)((long)p + 0x6d4) = uVar35;
                            *(uint *)((long)p + 0x690) = uStack_90;
                            *(uint *)((long)p + 0x694) = uVar45;
                            *(uint *)((long)p + 0x698) = uStack_8c;
                            *(int *)((long)p + 0x69c) = iStack_84;
                            *(int *)((long)p + 0x6a0) = (int)uVar39;
                            *(int *)((long)p + 0x678) = (int)uVar19;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar20 = *(uint **)((long)p + 0x20);
                            goto LAB_00111a65;
                          }
LAB_00111965:
                          uVar21 = 0;
                          if (puVar17 < puVar16) {
                            uVar21 = (ulong)(byte)*puVar17;
                            puVar17 = (uint *)((long)puVar17 + 1);
                          }
                          uVar44 = uVar44 | uVar21 << (0x38U - (char)uVar10 & 0x3f);
                        }
                      }
                    }
                    uVar8 = (uint)(ushort)(uVar44 >> 0x30);
                    if (uVar8 < pdVar24->m_table_max_code) {
                      uVar35 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar8 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                              0x10;
                    }
                    else {
                      iVar47 = pdVar24->m_decode_start_code_size - 0x41;
                      do {
                        iVar43 = iVar47;
                        iVar47 = iVar43 + 1;
                      } while (pdVar24->m_max_codes[iVar43 + 0x40U] <= uVar8);
                      uVar26 = (int)(uVar44 >> (-(char)(iVar43 + 1) & 0x3fU)) +
                               pdVar24->m_val_ptrs[iVar43 + 0x40U];
                      uVar8 = 0;
                      if (uVar26 < pqVar33->m_total_syms) {
                        uVar8 = uVar26;
                      }
                      uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar8];
                      uVar8 = iVar43 + 0x41;
                    }
                    uVar44 = uVar44 << ((byte)uVar8 & 0x3f);
                    puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                    *puVar2 = *puVar2 + 1;
                    uVar10 = uVar10 - uVar8;
                    puVar1 = &pqVar33->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                    }
                    uVar26 = (uint)uVar39;
                    uVar35 = uVar35 + 2;
                    uVar8 = 0;
                    if (uVar35 == 0x102) {
                      do {
                        while (uVar26 = uVar10, (int)uVar26 < 1) {
                          puVar17 = puStack_70;
                          if (puStack_70 == *(uint **)((long)p + 0x30)) {
                            uVar21 = 0;
                            if (*(char *)((long)p + 0x40) == '\0') {
                              *(uint *)((long)p + 0xb8) = uVar40;
                              *(uint *)((long)p + 0xbc) = uStack_88;
                              *(ulong *)((long)p + 0x58) = uVar44;
                              *(uint *)((long)p + 0x60) = uVar26;
                              *(uint **)((long)p + 0x28) = puStack_70;
                              *(uint *)((long)p + 0x6d4) = uVar8;
                              *(uint *)((long)p + 0x690) = uStack_90;
                              *(uint *)((long)p + 0x694) = uVar45;
                              *(uint *)((long)p + 0x698) = uStack_8c;
                              *(int *)((long)p + 0x69c) = iStack_84;
                              *(int *)((long)p + 0x6a0) = (int)uVar39;
                              *(int *)((long)p + 0x678) = (int)uVar19;
                              puVar17 = *(uint **)((long)p + 0x20);
                              plVar12 = *(long **)((long)p + 0x108);
                              goto LAB_0010ecb0;
                            }
                          }
                          else {
LAB_00111b94:
                            uVar21 = (ulong)(byte)*puVar17;
                            puStack_70 = (uint *)((long)puVar17 + 1);
                          }
LAB_00111b9b:
                          uVar44 = uVar21 << (0x38U - (char)uVar26 & 0x3f) | uVar44;
                          uVar10 = uVar26 + 8;
                        }
                        uVar21 = uVar44 * 2;
                        if (-1 < (long)uVar44) break;
                        uVar8 = uVar8 + 1;
                        uVar44 = uVar21;
                        uVar10 = uVar26 - 1;
                      } while (uVar8 < 3);
                      iVar47 = uVar26 - 1;
                      while( true ) {
                        uVar26 = (uint)uVar39;
                        bVar18 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar8);
                        uVar10 = iVar47 - (uint)bVar18;
                        if ((int)(uint)bVar18 <= iVar47) break;
                        puVar17 = puStack_70;
                        if (puStack_70 == *(uint **)((long)p + 0x30)) {
                          uVar44 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = uVar40;
                            *(uint *)((long)p + 0xbc) = uStack_88;
                            *(ulong *)((long)p + 0x58) = uVar21;
                            *(int *)((long)p + 0x60) = iVar47;
                            *(uint **)((long)p + 0x28) = puStack_70;
                            *(uint *)((long)p + 0x6d4) = uVar8;
                            *(uint *)((long)p + 0x690) = uStack_90;
                            *(uint *)((long)p + 0x694) = uVar45;
                            *(uint *)((long)p + 0x698) = uStack_8c;
                            *(int *)((long)p + 0x69c) = iStack_84;
                            *(uint *)((long)p + 0x6a0) = uVar26;
                            *(int *)((long)p + 0x678) = (int)uVar19;
                            puVar17 = *(uint **)((long)p + 0x20);
                            plVar12 = *(long **)((long)p + 0x108);
                            goto LAB_0010ebac;
                          }
                        }
                        else {
LAB_0010d0a4:
                          uVar44 = (ulong)(byte)*puVar17;
                          puStack_70 = (uint *)((long)puVar17 + 1);
                        }
LAB_0010d0aa:
                        cVar27 = (char)iVar47;
                        iVar47 = iVar47 + 8;
                        uVar21 = uVar21 | uVar44 << (0x38U - cVar27 & 0x3f);
                      }
                      uVar44 = uVar21 << (bVar18 & 0x3f);
                      uVar35 = (int)(uVar21 >> (-bVar18 & 0x3f)) +
                               *(int *)(s_huge_match_base_len + (ulong)uVar8 * 4);
                    }
                    uVar8 = (uint)(6 < uVar26) * 3 + 8;
                    puStack_68._0_4_ = uVar40;
                  }
                  else {
                    *puVar14 = uVar3 - (uVar3 >> 5);
                    uStack_88 = uVar26 - uStack_88;
                    uVar8 = (6 < uVar8) + 9 + (uint)(6 < uVar8);
                  }
                  uVar39 = (ulong)uVar8;
                  uVar8 = uStack_90;
                }
LAB_0011220e:
                uVar37 = (uint)uVar19;
                uVar40 = uVar37 - uVar8 & uVar11;
                uVar21 = (ulong)uVar40;
                uVar26 = uVar37;
                if (uVar37 < uVar40) {
                  uVar26 = uVar40;
                }
                pbVar30 = __dest_00 + uVar21;
                uVar38 = uVar19;
                uStack_90 = uVar8;
                if (uVar11 < uVar26 + uVar35) {
                  do {
                    pbVar31 = pbVar30 + 1;
                    uVar8 = (int)uVar38 + 1;
                    uVar19 = (ulong)uVar8;
                    __dest_00[uVar38] = *pbVar30;
                    pbVar30 = pbVar31;
                    if (pbVar31 == __dest_00 + lVar22) {
                      pbVar30 = __dest_00;
                    }
                    if (uVar11 < uVar8) {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(uint *)((long)p + 0x6d4) = uVar35;
                      *(int *)((long)p + 0x6e4) = (int)uVar21;
                      *(byte **)((long)p + 0x6e8) = pbVar30;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(uint *)((long)p + 0x694) = uVar45;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar39;
                      *(uint *)((long)p + 0x678) = uVar8;
                      pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) +
                                         *(long *)((long)p + 0xf0) +
                                        (ulong)*(uint *)((long)p + 0x67c));
                      *(void **)((long)p + 0x6b0) = pvVar29;
                      uVar44 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                                *(uint *)((long)p + 0x6c8)));
                      *(ulong *)((long)p + 0x6b8) = uVar44;
                      *(undefined4 *)((long)p + 0x6c8) = 0;
                      *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010d132:
                      if (uVar44 != 0) {
                        uVar19 = **(ulong **)((long)p + 0x118);
                        if (uVar19 <= uVar44) {
                          uVar44 = uVar19;
                        }
                        *(ulong *)((long)p + 0x6c0) = uVar44;
                        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                          memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
                        }
                        else if (uVar19 != 0) {
                          uVar19 = 0;
                          do {
                            sVar48 = uVar44 - uVar19;
                            if (0x1fff < sVar48) {
                              sVar48 = 0x2000;
                            }
                            memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                                   (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                            uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                            *(uint *)((long)p + 0xf8));
                            *(uint *)((long)p + 0xf8) = uVar9;
                            uVar19 = uVar19 + sVar48;
                            uVar44 = *(ulong *)((long)p + 0x6c0);
                          } while (uVar19 < uVar44);
                        }
                        **(long **)((long)p + 0x108) =
                             *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                        lVar22 = *(long *)((long)p + 0x6c0);
                        **(long **)((long)p + 0x118) = lVar22;
                        *(undefined4 *)((long)p + 8) = 0x40e;
                        goto LAB_001110a3;
                      }
                      uVar35 = *(uint *)((long)p + 0x6d4);
                      uVar21 = (ulong)*(uint *)((long)p + 0x6e4);
                      pbVar30 = *(byte **)((long)p + 0x6e8);
                      uStack_90 = *(int *)((long)p + 0x690);
                      uVar45 = *(int *)((long)p + 0x694);
                      uStack_8c = *(int *)((long)p + 0x698);
                      iStack_84 = *(int *)((long)p + 0x69c);
                      uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
                      puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                      uStack_88 = *(uint *)((long)p + 0xbc);
                      uVar44 = *(ulong *)((long)p + 0x58);
                      uVar10 = *(uint *)((long)p + 0x60);
                      uVar19 = 0;
                    }
                    uVar35 = uVar35 - 1;
                    uVar38 = uVar19;
                  } while (uVar35 != 0);
                }
                else {
                  if (uVar8 == 1) {
                    if ((7 < uVar35) || (uVar35 != 0)) {
                      memset(__dest_00 + uVar19,(uint)*pbVar30,(ulong)uVar35);
                    }
                  }
                  else if ((uVar35 < 8) || ((int)uVar8 < (int)uVar35)) {
                    if (0 < (int)uVar35) {
                      uVar8 = uVar35 + 1;
                      pbVar30 = __dest_00;
                      do {
                        pbVar30[uVar19] = pbVar30[uVar21];
                        uVar8 = uVar8 - 1;
                        pbVar30 = pbVar30 + 1;
                      } while (1 < uVar8);
                    }
                  }
                  else {
                    memcpy(__dest_00 + uVar19,pbVar30,(ulong)uVar35);
                  }
                  uVar19 = (ulong)(uVar37 + uVar35);
                }
                goto LAB_001107cf;
              }
              *puVar14 = (short)(0x800 - uVar3 >> 5) + uVar3;
              pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x288);
              pdVar24 = *(decoder_tables **)((long)p + 0x2f0);
              uVar21 = uVar39;
              if ((int)uVar10 < 0x18) {
                puStack_70 = *(uint **)((long)p + 0x30);
                if (puVar17 + 1 < puStack_70) {
                  uVar8 = *puVar17;
                  uVar10 = uVar10 + 0x20;
                  uVar44 = uVar44 | (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                            (uVar8 & 0xff00) << 8 | uVar8 << 0x18) <<
                                    (-(char)uVar10 & 0x3fU);
                  puVar17 = puVar17 + 1;
                }
                else {
                  for (; uVar21 = uVar39, (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                    uVar8 = (uint)uVar19;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puVar17;
                      *(uint *)((long)p + 0x6d4) = uVar35;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar39;
                      *(uint *)((long)p + 0x678) = uVar8;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar16 = *(uint **)((long)p + 0x20);
                      goto LAB_00112410;
                    }
LAB_001122e3:
                    uVar19 = 0;
                    if (puVar17 < puStack_70) {
                      uVar19 = (ulong)(byte)*puVar17;
                      puVar17 = (uint *)((long)puVar17 + 1);
                    }
                    uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
                    uVar19 = (ulong)uVar8;
                  }
                }
              }
              uVar8 = (uint)(ushort)(uVar44 >> 0x30);
              if (uVar8 < pdVar24->m_table_max_code) {
                uVar8 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff
                ;
                uVar45 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10
                ;
              }
              else {
                iVar43 = pdVar24->m_decode_start_code_size - 0x41;
                do {
                  iVar28 = iVar43;
                  iVar43 = iVar28 + 1;
                } while (pdVar24->m_max_codes[iVar28 + 0x40U] <= uVar8);
                uVar45 = (int)(uVar44 >> (-(char)(iVar28 + 1) & 0x3fU)) +
                         pdVar24->m_val_ptrs[iVar28 + 0x40U];
                uVar8 = 0;
                if (uVar45 < pqVar33->m_total_syms) {
                  uVar8 = uVar45;
                }
                uVar45 = iVar28 + 0x41;
                uVar8 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar8];
              }
              uVar44 = uVar44 << ((byte)uVar45 & 0x3f);
              puVar2 = (pqVar33->m_sym_freq).m_p + uVar8;
              *puVar2 = *puVar2 + 1;
              uVar10 = uVar10 - uVar45;
              puVar1 = &pqVar33->m_symbols_until_update;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
              }
              if (1 < uVar8) {
                uVar35 = (uVar8 - 2 & 7) + 2;
                uVar8 = (uVar8 - 2 >> 3) + 1;
                if (uVar35 == 9) {
                  bVar5 = 6 < (uint)uVar21;
                  pqVar33 = (quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)((uint)bVar5 * 0x90) + 0x438);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)((uint)bVar5 * 0x90) + 0x4a0);
                  iVar43 = 9;
                  if ((int)uVar10 < 0x18) {
                    puVar16 = *(uint **)((long)p + 0x30);
                    if (puVar17 + 1 < puVar16) {
                      uVar45 = *puVar17;
                      uVar10 = uVar10 + 0x20;
                      uVar44 = uVar44 | (ulong)(uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                                (uVar45 & 0xff00) << 8 | uVar45 << 0x18) <<
                                        (-(char)uVar10 & 0x3fU);
                      iVar43 = 9;
                      puVar17 = puVar17 + 1;
                    }
                    else {
                      iVar43 = 9;
                      for (; uVar45 = (uint)uVar19, (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                          *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(int *)((long)p + 0x6d4) = iVar43;
                          *(uint *)((long)p + 0x6d8) = uVar8;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar21;
                          *(uint *)((long)p + 0x678) = uVar45;
                          puVar20 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_001126c6;
                        }
LAB_001125a5:
                        uVar19 = (ulong)uVar45;
                        uVar39 = 0;
                        if (puVar17 < puVar16) {
                          uVar39 = (ulong)(byte)*puVar17;
                          puVar17 = (uint *)((long)puVar17 + 1);
                        }
                        uVar44 = uVar44 | uVar39 << (0x38U - (char)uVar10 & 0x3f);
                      }
                    }
                  }
                  uVar45 = (uint)(ushort)(uVar44 >> 0x30);
                  if (uVar45 < pdVar24->m_table_max_code) {
                    uVar35 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar45 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar28 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar32 = iVar28;
                      iVar28 = iVar32 + 1;
                    } while (pdVar24->m_max_codes[iVar32 + 0x40U] <= uVar45);
                    uVar26 = (int)(uVar44 >> (-(char)(iVar32 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar32 + 0x40U];
                    uVar45 = 0;
                    if (uVar26 < pqVar33->m_total_syms) {
                      uVar45 = uVar26;
                    }
                    uVar35 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar45];
                    uVar45 = iVar32 + 0x41;
                  }
                  uVar44 = uVar44 << ((byte)uVar45 & 0x3f);
                  puVar2 = (pqVar33->m_sym_freq).m_p + uVar35;
                  *puVar2 = *puVar2 + 1;
                  uVar10 = uVar10 - uVar45;
                  puVar1 = &pqVar33->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                  }
                  uVar35 = uVar35 + iVar43;
                  uVar26 = 0;
                  if (uVar35 == 0x102) {
                    do {
                      while (uVar45 = uVar10, (int)uVar45 < 1) {
                        if (puVar17 == *(uint **)((long)p + 0x30)) {
                          uVar39 = 0;
                          if (*(char *)((long)p + 0x40) == '\0') {
                            *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                            *(uint *)((long)p + 0xbc) = uStack_88;
                            *(ulong *)((long)p + 0x58) = uVar44;
                            *(uint *)((long)p + 0x60) = uVar45;
                            *(uint **)((long)p + 0x28) = puVar17;
                            *(uint *)((long)p + 0x6d4) = uVar26;
                            *(uint *)((long)p + 0x6d8) = uVar8;
                            *(uint *)((long)p + 0x690) = uStack_90;
                            *(int *)((long)p + 0x694) = iVar47;
                            *(uint *)((long)p + 0x698) = uStack_8c;
                            *(int *)((long)p + 0x69c) = iStack_84;
                            *(int *)((long)p + 0x6a0) = (int)uVar21;
                            *(int *)((long)p + 0x678) = (int)uVar19;
                            plVar12 = *(long **)((long)p + 0x108);
                            puVar16 = *(uint **)((long)p + 0x20);
                            goto LAB_0010edb4;
                          }
                        }
                        else {
LAB_001128dd:
                          uVar39 = (ulong)(byte)*puVar17;
                          puVar17 = (uint *)((long)puVar17 + 1);
                        }
LAB_001128e9:
                        uVar44 = uVar39 << (0x38U - (char)uVar45 & 0x3f) | uVar44;
                        uVar10 = uVar45 + 8;
                      }
                      uVar39 = uVar44 * 2;
                      if (-1 < (long)uVar44) break;
                      uVar26 = uVar26 + 1;
                      uVar44 = uVar39;
                      uVar10 = uVar45 - 1;
                    } while (uVar26 < 3);
                    iVar43 = uVar45 - 1;
                    while( true ) {
                      bVar18 = *(byte *)((long)&s_huge_match_code_len + (ulong)uVar26);
                      uVar10 = iVar43 - (uint)bVar18;
                      if ((int)(uint)bVar18 <= iVar43) break;
                      if (puVar17 == *(uint **)((long)p + 0x30)) {
                        uVar44 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar39;
                          *(int *)((long)p + 0x60) = iVar43;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(uint *)((long)p + 0x6d4) = uVar26;
                          *(uint *)((long)p + 0x6d8) = uVar8;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar21;
                          *(int *)((long)p + 0x678) = (int)uVar19;
                          puVar16 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_0010ee70;
                        }
                      }
                      else {
LAB_0010e46e:
                        uVar44 = (ulong)(byte)*puVar17;
                        puVar17 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010e479:
                      cVar27 = (char)iVar43;
                      iVar43 = iVar43 + 8;
                      uVar39 = uVar39 | uVar44 << (0x38U - cVar27 & 0x3f);
                    }
                    uVar44 = uVar39 << (bVar18 & 0x3f);
                    uVar35 = (int)(uVar39 >> (-bVar18 & 0x3f)) +
                             *(int *)(s_huge_match_base_len + (ulong)uVar26 * 4);
                  }
                }
                uVar40 = (uint)uVar19;
                uVar45 = (uint)(byte)CLZDecompBase::m_lzx_position_extra_bits[uVar8];
                if (uVar45 < 3) {
                  while( true ) {
                    uVar37 = (uint)uVar21;
                    uStack_78 = (uint *)(uVar19 << 0x20);
                    if ((int)uVar45 <= (int)uVar10) break;
                    if (puVar17 == *(uint **)((long)p + 0x30)) {
                      uVar39 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                        *(uint *)((long)p + 0xbc) = uStack_88;
                        *(ulong *)((long)p + 0x58) = uVar44;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puVar17;
                        *(uint *)((long)p + 0x6d4) = uVar35;
                        *(uint *)((long)p + 0x6d8) = uVar8;
                        *(uint *)((long)p + 0x6e0) = uVar45;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(int *)((long)p + 0x694) = iVar47;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(uint *)((long)p + 0x6a0) = uVar37;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        plVar12 = *(long **)((long)p + 0x108);
                        puVar16 = *(uint **)((long)p + 0x20);
                        goto LAB_0010ed00;
                      }
                    }
                    else {
LAB_0010cbfd:
                      uVar39 = (ulong)(byte)*puVar17;
                      puVar17 = (uint *)((long)puVar17 + 1);
                    }
LAB_0010cc03:
                    cVar27 = (char)uVar10;
                    uVar10 = uVar10 + 8;
                    uVar44 = uVar44 | uVar39 << (0x38U - cVar27 & 0x3f);
                  }
                  iVar43 = (int)(uVar44 >> (-(byte)uVar45 & 0x3f));
                  if (uVar45 == 0) {
                    iVar43 = 0;
                  }
                  uVar44 = uVar44 << ((byte)uVar45 & 0x3f);
                  uVar10 = uVar10 - uVar45;
                  puStack_70 = puVar17;
                }
                else {
                  iVar43 = 0;
                  uVar26 = uVar10;
                  if (4 < (byte)CLZDecompBase::m_lzx_position_extra_bits[uVar8]) {
                    while( true ) {
                      uVar40 = (uint)uVar19;
                      iVar28 = uVar45 - 4;
                      uVar26 = uVar10 - iVar28;
                      if (iVar28 <= (int)uVar10) break;
                      if (puVar17 == *(uint **)((long)p + 0x30)) {
                        uVar39 = 0;
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar10;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x6d8) = uVar8;
                          *(uint *)((long)p + 0x6e0) = uVar45;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(int *)((long)p + 0x6a0) = (int)uVar21;
                          *(uint *)((long)p + 0x678) = uVar40;
                          puVar16 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_0010ec68;
                        }
                      }
                      else {
LAB_0010db00:
                        uVar39 = (ulong)(byte)*puVar17;
                        puVar17 = (uint *)((long)puVar17 + 1);
                      }
LAB_0010db0f:
                      cVar27 = (char)uVar10;
                      uVar10 = uVar10 + 8;
                      uVar44 = uVar44 | uVar39 << (0x38U - cVar27 & 0x3f);
                    }
                    iVar43 = (int)(uVar44 >> (0x44U - (char)uVar45 & 0x3f)) << 4;
                    if (iVar28 == 0) {
                      iVar43 = 0;
                    }
                    uVar44 = uVar44 << ((byte)iVar28 & 0x3f);
                  }
                  uVar37 = (uint)uVar21;
                  pqVar33 = (quasi_adaptive_huffman_data_model *)((long)p + 0x558);
                  pdVar24 = *(decoder_tables **)((long)p + 0x5c0);
                  uStack_78 = (uint *)((ulong)uVar40 << 0x20);
                  if ((int)uVar26 < 0x18) {
                    puVar16 = *(uint **)((long)p + 0x30);
                    if (puVar17 + 1 < puVar16) {
                      uVar10 = *puVar17;
                      uVar26 = uVar26 + 0x20;
                      uVar44 = uVar44 | (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                                (uVar10 & 0xff00) << 8 | uVar10 << 0x18) <<
                                        (-(char)uVar26 & 0x3fU);
                      puVar17 = puVar17 + 1;
                    }
                    else {
                      for (; uVar37 = (uint)uVar21, (int)uVar26 < 0x18; uVar26 = uVar26 + 8) {
                        if (*(char *)((long)p + 0x40) == '\0') {
                          *(quasi_adaptive_huffman_data_model **)((long)p + 200) = pqVar33;
                          *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                          *(uint *)((long)p + 0xbc) = uStack_88;
                          *(ulong *)((long)p + 0x58) = uVar44;
                          *(uint *)((long)p + 0x60) = uVar26;
                          *(uint **)((long)p + 0x28) = puVar17;
                          *(uint *)((long)p + 0x6d4) = uVar35;
                          *(uint *)((long)p + 0x6d8) = uVar8;
                          *(int *)((long)p + 0x6dc) = iVar43;
                          *(uint *)((long)p + 0x690) = uStack_90;
                          *(int *)((long)p + 0x694) = iVar47;
                          *(uint *)((long)p + 0x698) = uStack_8c;
                          *(int *)((long)p + 0x69c) = iStack_84;
                          *(uint *)((long)p + 0x6a0) = uVar37;
                          *(uint *)((long)p + 0x678) = uStack_78._4_4_;
                          puVar20 = *(uint **)((long)p + 0x20);
                          plVar12 = *(long **)((long)p + 0x108);
                          goto LAB_00112c7a;
                        }
LAB_00112bc2:
                        uStack_78 = (uint *)((ulong)uStack_78._4_4_ << 0x20);
                        uVar19 = 0;
                        if (puVar17 < puVar16) {
                          uVar19 = (ulong)(byte)*puVar17;
                          puVar17 = (uint *)((long)puVar17 + 1);
                        }
                        uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar26 & 0x3f);
                      }
                    }
                  }
                  uVar10 = (uint)(ushort)(uVar44 >> 0x30);
                  if (uVar10 < pdVar24->m_table_max_code) {
                    uVar45 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                             0xffff;
                    uVar10 = pdVar24->m_lookup[uVar44 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                             0x10;
                  }
                  else {
                    iVar28 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar32 = iVar28;
                      iVar28 = iVar32 + 1;
                    } while (pdVar24->m_max_codes[iVar32 + 0x40U] <= uVar10);
                    uVar45 = (int)(uVar44 >> (-(char)(iVar32 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar32 + 0x40U];
                    uVar10 = 0;
                    if (uVar45 < pqVar33->m_total_syms) {
                      uVar10 = uVar45;
                    }
                    uVar45 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar10];
                    uVar10 = iVar32 + 0x41;
                  }
                  uVar44 = uVar44 << ((byte)uVar10 & 0x3f);
                  puVar2 = (pqVar33->m_sym_freq).m_p + uVar45;
                  *puVar2 = *puVar2 + 1;
                  puVar1 = &pqVar33->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    quasi_adaptive_huffman_data_model::update_tables(pqVar33,-1,false);
                  }
                  iVar43 = uVar45 + iVar43;
                  uVar10 = uVar26 - uVar10;
                  puStack_70 = puVar17;
                }
                uVar39 = (ulong)(6 < uVar37) * 3 + 7;
                iStack_84 = uStack_8c;
                uVar19 = (ulong)uStack_78 >> 0x20;
                uVar8 = iVar43 + *(int *)(CLZDecompBase::m_lzx_position_base + (ulong)uVar8 * 4);
                uStack_8c = iVar47;
                uVar45 = uStack_90;
                goto LAB_0011220e;
              }
              uVar39 = 0;
              puStack_70 = puVar17;
              if (uVar8 != 0) {
                iStack_84 = 1;
                uStack_8c = 1;
                uVar45 = 1;
                uStack_90 = 1;
                goto LAB_001107cf;
              }
              if ((uVar10 & 7) != 0) {
                for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
                  if (puVar17 == *(uint **)((long)p + 0x30)) {
                    uVar39 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puVar17;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      puVar16 = *(uint **)((long)p + 0x20);
                      plVar12 = *(long **)((long)p + 0x108);
                      goto LAB_0010ef7c;
                    }
                  }
                  else {
LAB_0010d6f2:
                    uVar39 = (ulong)(byte)*puVar17;
                    puVar17 = (uint *)((long)puVar17 + 1);
                  }
LAB_0010d6fc:
                  uVar44 = uVar44 | uVar39 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar44 = uVar44 << ((byte)uVar10 & 7);
                uVar10 = uVar10 & 0x7ffffff8;
                puStack_70 = puVar17;
              }
LAB_00110da9:
              *(int *)((long)p + 0x68c) = *(int *)((long)p + 0x68c) + 1;
              iVar43 = *(int *)((long)p + 0x160);
              uVar8 = (uint)uVar19;
              if (iVar43 != 0) {
                if (uVar8 == 0) {
                  uVar7 = 0;
                  goto LAB_00110f0f;
                }
                *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                *(uint *)((long)p + 0xbc) = uStack_88;
                *(ulong *)((long)p + 0x58) = uVar44;
                *(uint *)((long)p + 0x60) = uVar10;
                *(uint **)((long)p + 0x28) = puStack_70;
                *(uint *)((long)p + 0x690) = uStack_90;
                *(int *)((long)p + 0x694) = iVar47;
                *(uint *)((long)p + 0x698) = uStack_8c;
                *(int *)((long)p + 0x69c) = iStack_84;
                *(int *)((long)p + 0x6a0) = (int)uVar21;
                *(uint *)((long)p + 0x678) = uVar8;
                pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0) +
                                  (ulong)*(uint *)((long)p + 0x67c));
                *(void **)((long)p + 0x6b0) = pvVar29;
                uVar44 = (ulong)(uVar8 - (*(uint *)((long)p + 0x67c) + *(uint *)((long)p + 0x6c8)));
                *(ulong *)((long)p + 0x6b8) = uVar44;
                *(undefined4 *)((long)p + 0x6c8) = 0;
                *(uint *)((long)p + 0x67c) = uVar11 & uVar8;
                goto LAB_00110e69;
              }
LAB_00110d41:
              for (; (int)uVar10 < 2; uVar10 = uVar10 + 8) {
                if (puStack_70 == *(uint **)((long)p + 0x30)) {
                  uVar39 = 0;
                  if (*(char *)((long)p + 0x40) == '\0') {
                    *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                    *(uint *)((long)p + 0xbc) = uStack_88;
                    *(ulong *)((long)p + 0x58) = uVar44;
                    *(uint *)((long)p + 0x60) = uVar10;
                    *(uint **)((long)p + 0x28) = puStack_70;
                    *(uint *)((long)p + 0x690) = uStack_90;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(uint *)((long)p + 0x698) = uStack_8c;
                    *(int *)((long)p + 0x69c) = iStack_84;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(int *)((long)p + 0x678) = (int)uVar19;
                    puVar17 = *(uint **)((long)p + 0x20);
                    plVar12 = *(long **)((long)p + 0x108);
                    goto LAB_0010ebd8;
                  }
                }
                else {
LAB_0010c708:
                  uVar39 = (ulong)(byte)*puStack_70;
                  puStack_70 = (uint *)((long)puStack_70 + 1);
                }
LAB_0010c712:
                uVar44 = uVar44 | uVar39 << (0x38U - (char)uVar10 & 0x3f);
              }
              uVar39 = uVar44 >> 0x3e;
              *(uint *)((long)p + 0x6a8) = (uint)(uVar44 >> 0x3e);
              uVar44 = uVar44 << 2;
              uVar10 = uVar10 - 2;
              uVar7 = 0;
              uVar8 = 0;
              switch(uVar39) {
              case 1:
                puStack_68._0_4_ = 0;
                for (; uVar39 = uVar44, uVar8 < 4; uVar8 = uVar8 + 1) {
                  for (; (int)uVar10 < 8; uVar10 = uVar10 + 8) {
                    if (puStack_70 == *(uint **)((long)p + 0x30)) {
                      uVar44 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                        *(uint *)((long)p + 0xbc) = uVar8;
                        *(ulong *)((long)p + 0x58) = uVar39;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puStack_70;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(int *)((long)p + 0x694) = iVar47;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(int *)((long)p + 0x6a0) = (int)uVar21;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        plVar12 = *(long **)((long)p + 0x108);
                        puVar17 = *(uint **)((long)p + 0x20);
                        goto LAB_0010ef50;
                      }
                    }
                    else {
LAB_0010e9c6:
                      uVar44 = (ulong)(byte)*puStack_70;
                      puStack_70 = (uint *)((long)puStack_70 + 1);
                    }
LAB_0010e9d0:
                    cVar27 = (char)uVar10;
                    uVar39 = uVar39 | uVar44 << (0x38U - cVar27 & 0x3f);
                  }
                  uVar44 = uVar39 << 8;
                  uVar10 = uVar10 - 8;
                  puStack_68._0_4_ = (uint)puStack_68 << 8 | (uint)(byte)(uVar39 >> 0x38);
                }
                *(int *)((long)p + 0x6a4) = (int)uVar19;
                iStack_84 = 1;
                uVar39 = 0;
                uStack_88 = 0xffffffff;
                uStack_8c = 1;
                uVar45 = 1;
                uStack_90 = 1;
                uVar21 = uVar44;
                break;
              case 2:
                for (; (int)uVar10 < 0x18; uVar10 = uVar10 + 8) {
                  if (puStack_70 == *(uint **)((long)p + 0x30)) {
                    uVar39 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(undefined4 *)((long)p + 0x6f0) = uVar7;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar17 = *(uint **)((long)p + 0x20);
                      goto LAB_0010ec20;
                    }
                  }
                  else {
LAB_0010d485:
                    uVar39 = (ulong)(byte)*puStack_70;
                    puStack_70 = (uint *)((long)puStack_70 + 1);
                  }
LAB_0010d48f:
                  uVar44 = uVar44 | uVar39 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar39 = uVar44 >> 0x28;
                uVar44 = uVar44 << 0x18;
                for (uVar10 = uVar10 - 0x18; uVar45 = (uint)uVar39, (int)uVar10 < 8;
                    uVar10 = uVar10 + 8) {
                  if (puStack_70 == *(uint **)((long)p + 0x30)) {
                    uVar38 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(uint *)((long)p + 0x6f0) = uVar45;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      puVar17 = *(uint **)((long)p + 0x20);
                      plVar12 = *(long **)((long)p + 0x108);
                      goto LAB_0010ee28;
                    }
                  }
                  else {
LAB_0010e212:
                    uVar38 = (ulong)(byte)*puStack_70;
                    puStack_70 = (uint *)((long)puStack_70 + 1);
                  }
LAB_0010e21c:
                  uVar44 = uVar44 | uVar38 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar38 = uVar44 << 8;
                uVar8 = uVar10 - 8;
                if ((((uint)(uVar39 >> 0x10) ^ (uint)(uVar39 >> 8) ^ uVar45) & 0xff) !=
                    (uint)(byte)(uVar44 >> 0x38)) {
                  *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_88;
                  *(ulong *)((long)p + 0x58) = uVar38;
                  *(uint *)((long)p + 0x60) = uVar8;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  **(long **)((long)p + 0x108) = (long)puStack_70 - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = 0;
                  goto LAB_0010e2c5;
                }
                uVar39 = (ulong)(uVar45 + 1);
                if ((uVar10 & 7) != 0) {
                  for (; (int)uVar8 < 0; uVar8 = uVar8 + 8) {
                    if (puStack_70 == *(uint **)((long)p + 0x30)) {
                      uVar44 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                        *(uint *)((long)p + 0xbc) = uStack_88;
                        *(ulong *)((long)p + 0x58) = uVar38;
                        *(uint *)((long)p + 0x60) = uVar8;
                        *(uint **)((long)p + 0x28) = puStack_70;
                        *(int *)((long)p + 0x6f0) = (int)uVar39;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(int *)((long)p + 0x694) = iVar47;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(int *)((long)p + 0x6a0) = (int)uVar21;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        plVar12 = *(long **)((long)p + 0x108);
                        puVar17 = *(uint **)((long)p + 0x20);
                        goto LAB_0010ed48;
                      }
                    }
                    else {
LAB_0010cde8:
                      uVar44 = (ulong)(byte)*puStack_70;
                      puStack_70 = (uint *)((long)puStack_70 + 1);
                    }
LAB_0010cdf2:
                    uVar38 = uVar38 | uVar44 << (0x38U - (char)uVar8 & 0x3f);
                  }
                  uVar38 = uVar38 << ((byte)uVar8 & 7);
                  uVar8 = uVar8 & 0x7ffffff8;
                }
                do {
                  iVar43 = (int)uVar39;
                  if ((int)uVar8 < 8) goto LAB_00110c13;
                  uVar44 = uVar38 << 8;
                  uVar8 = uVar8 - 8;
                  uVar10 = (int)uVar19 + 1;
                  uVar34 = (ulong)uVar10;
                  __dest_00[uVar19] = (byte)(uVar38 >> 0x38);
                  if (uVar11 < uVar10) {
                    *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                    *(uint *)((long)p + 0xbc) = uStack_88;
                    *(ulong *)((long)p + 0x58) = uVar44;
                    *(uint *)((long)p + 0x60) = uVar8;
                    *(uint **)((long)p + 0x28) = puStack_70;
                    *(int *)((long)p + 0x6f0) = iVar43;
                    *(uint *)((long)p + 0x690) = uStack_90;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(uint *)((long)p + 0x698) = uStack_8c;
                    *(int *)((long)p + 0x69c) = iStack_84;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(uint *)((long)p + 0x678) = uVar10;
                    pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0)
                                      + (ulong)*(uint *)((long)p + 0x67c));
                    *(void **)((long)p + 0x6b0) = pvVar29;
                    uVar44 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                              *(uint *)((long)p + 0x6c8)));
                    *(ulong *)((long)p + 0x6b8) = uVar44;
                    *(undefined4 *)((long)p + 0x6c8) = 0;
                    *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010fb94:
                    if (uVar44 != 0) {
                      uVar19 = **(ulong **)((long)p + 0x118);
                      if (uVar19 <= uVar44) {
                        uVar44 = uVar19;
                      }
                      *(ulong *)((long)p + 0x6c0) = uVar44;
                      if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                        memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
                      }
                      else if (uVar19 != 0) {
                        uVar19 = 0;
                        do {
                          sVar48 = uVar44 - uVar19;
                          if (0x1fff < sVar48) {
                            sVar48 = 0x2000;
                          }
                          memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                                 (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                          uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                          *(uint *)((long)p + 0xf8));
                          *(uint *)((long)p + 0xf8) = uVar9;
                          uVar19 = uVar19 + sVar48;
                          uVar44 = *(ulong *)((long)p + 0x6c0);
                        } while (uVar19 < uVar44);
                      }
                      **(long **)((long)p + 0x108) =
                           *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                      lVar22 = *(long *)((long)p + 0x6c0);
                      **(long **)((long)p + 0x118) = lVar22;
                      *(undefined4 *)((long)p + 8) = 0x252;
                      goto LAB_001110a3;
                    }
                    iVar43 = *(int *)((long)p + 0x6f0);
                    uStack_90 = *(int *)((long)p + 0x690);
                    iVar47 = *(int *)((long)p + 0x694);
                    uStack_8c = *(int *)((long)p + 0x698);
                    iStack_84 = *(int *)((long)p + 0x69c);
                    uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
                    puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                    uStack_88 = *(uint *)((long)p + 0xbc);
                    uVar44 = *(ulong *)((long)p + 0x58);
                    uVar8 = *(uint *)((long)p + 0x60);
                    uVar34 = 0;
                  }
                  uVar39 = (ulong)(iVar43 - 1U);
                  uVar19 = uVar34;
                  uVar38 = uVar44;
                } while (iVar43 - 1U != 0);
                uVar39 = 0;
LAB_00110c13:
                *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                *(uint *)((long)p + 0xbc) = uStack_88;
                *(ulong *)((long)p + 0x58) = uVar38;
                *(uint *)((long)p + 0x60) = uVar8;
                *(uint **)((long)p + 0x28) = puStack_70;
                while ((int)uVar39 != 0) {
                  uVar38 = (long)puStack_70 - *(long *)((long)p + 0x20);
                  puVar13 = *(ulong **)((long)p + 0x108);
                  uVar44 = *puVar13 - uVar38;
LAB_0010fcc4:
                  uVar10 = (uint)uVar39;
                  iVar43 = (int)uVar19;
                  if (uVar44 == 0) {
                    *puVar13 = uVar38;
                    **(undefined8 **)((long)p + 0x118) = 0;
                    if (*(char *)((long)p + 0x120) != '\x01') {
                      *(uint *)((long)p + 0x6f0) = uVar10;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = iVar43;
                      *(undefined4 *)((long)p + 8) = 0x26f;
                      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
                    }
                    goto LAB_0010fe2c;
                  }
                  uVar8 = uVar10;
                  if (uVar44 < uVar39) {
                    uVar8 = (uint)uVar44;
                  }
                  uVar45 = uVar46 - iVar43;
                  if (uVar8 <= uVar46 - iVar43) {
                    uVar45 = uVar8;
                  }
                  memcpy(__dest_00 + uVar19,(void *)(*(long *)((long)p + 0x100) + uVar38),
                         (ulong)uVar45);
                  uVar39 = (ulong)(uVar10 - uVar45);
                  lVar49 = *(long *)((long)p + 0x100);
                  lVar4 = **(long **)((long)p + 0x108);
                  puStack_70 = (uint *)(uVar38 + lVar49 + (ulong)uVar45);
                  *(long *)((long)p + 0x20) = lVar49;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  *(long *)((long)p + 0x38) = lVar4;
                  *(long *)((long)p + 0x30) = lVar49 + lVar4;
                  *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
                  uVar8 = iVar43 + uVar45;
                  if (uVar11 < uVar8) {
                    *(uint *)((long)p + 0x6f0) = uVar10 - uVar45;
                    *(uint *)((long)p + 0x690) = uStack_90;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(uint *)((long)p + 0x698) = uStack_8c;
                    *(int *)((long)p + 0x69c) = iStack_84;
                    *(int *)((long)p + 0x6a0) = (int)uVar21;
                    *(uint *)((long)p + 0x678) = uVar8;
                    pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0)
                                      + (ulong)*(uint *)((long)p + 0x67c));
                    *(void **)((long)p + 0x6b0) = pvVar29;
                    uVar44 = (ulong)(uVar46 - (*(uint *)((long)p + 0x67c) +
                                              *(uint *)((long)p + 0x6c8)));
                    *(ulong *)((long)p + 0x6b8) = uVar44;
                    *(undefined4 *)((long)p + 0x6c8) = 0;
                    *(undefined4 *)((long)p + 0x67c) = 0;
LAB_0010fa7e:
                    if (uVar44 != 0) {
                      uVar19 = **(ulong **)((long)p + 0x118);
                      if (uVar19 <= uVar44) {
                        uVar44 = uVar19;
                      }
                      *(ulong *)((long)p + 0x6c0) = uVar44;
                      if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                        memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
                      }
                      else if (uVar19 != 0) {
                        uVar19 = 0;
                        do {
                          sVar48 = uVar44 - uVar19;
                          if (0x1fff < sVar48) {
                            sVar48 = 0x2000;
                          }
                          memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                                 (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                          uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                          *(uint *)((long)p + 0xf8));
                          *(uint *)((long)p + 0xf8) = uVar9;
                          uVar19 = uVar19 + sVar48;
                          uVar44 = *(ulong *)((long)p + 0x6c0);
                        } while (uVar19 < uVar44);
                      }
                      **(long **)((long)p + 0x108) =
                           *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                      lVar22 = *(long *)((long)p + 0x6c0);
                      **(long **)((long)p + 0x118) = lVar22;
                      *(undefined4 *)((long)p + 8) = 0x294;
                      goto LAB_001110a3;
                    }
                    uVar39 = (ulong)*(uint *)((long)p + 0x6f0);
                    uStack_90 = *(int *)((long)p + 0x690);
                    iVar47 = *(int *)((long)p + 0x694);
                    uStack_8c = *(int *)((long)p + 0x698);
                    iStack_84 = *(int *)((long)p + 0x69c);
                    uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
                    uVar19 = 0;
                  }
                  else {
                    uVar19 = (ulong)uVar8;
                  }
                }
                puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                uStack_88 = *(uint *)((long)p + 0xbc);
                uVar44 = *(ulong *)((long)p + 0x58);
                uVar10 = *(uint *)((long)p + 0x60);
                goto LAB_00110da9;
              case 3:
                *(undefined4 *)((long)p + 0x160) = 3;
                goto LAB_00110da9;
              default:
                for (; (int)uVar10 < 2; uVar10 = uVar10 + 8) {
                  if (puStack_70 == *(uint **)((long)p + 0x30)) {
                    uVar39 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar44;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      puVar17 = *(uint **)((long)p + 0x20);
                      plVar12 = *(long **)((long)p + 0x108);
                      goto LAB_0010ed90;
                    }
                  }
                  else {
LAB_0010ded4:
                    uVar39 = (ulong)(byte)*puStack_70;
                    puStack_70 = (uint *)((long)puStack_70 + 1);
                  }
LAB_0010dede:
                  uVar44 = uVar44 | uVar39 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar8 = (uint)(uVar44 >> 0x3e);
                *(uint *)((long)p + 0x71c) = uVar8;
                uVar39 = uVar44 << 2;
                uVar10 = uVar10 - 2;
                if (uVar44 >> 0x3e == 2) {
                  lzham_decompressor::reset_all_tables((lzham_decompressor *)p);
                }
                else if (uVar8 == 1) {
                  lzham_decompressor::reset_huffman_table_update_rates((lzham_decompressor *)p);
                }
                if ((uVar10 & 7) != 0) {
                  for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
                    if (puStack_70 == *(uint **)((long)p + 0x30)) {
                      uVar44 = 0;
                      if (*(char *)((long)p + 0x40) == '\0') {
                        *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                        *(uint *)((long)p + 0xbc) = uStack_88;
                        *(ulong *)((long)p + 0x58) = uVar39;
                        *(uint *)((long)p + 0x60) = uVar10;
                        *(uint **)((long)p + 0x28) = puStack_70;
                        *(uint *)((long)p + 0x690) = uStack_90;
                        *(int *)((long)p + 0x694) = iVar47;
                        *(uint *)((long)p + 0x698) = uStack_8c;
                        *(int *)((long)p + 0x69c) = iStack_84;
                        *(int *)((long)p + 0x6a0) = (int)uVar21;
                        *(int *)((long)p + 0x678) = (int)uVar19;
                        puVar17 = *(uint **)((long)p + 0x20);
                        plVar12 = *(long **)((long)p + 0x108);
                        goto LAB_0010ebfc;
                      }
                    }
                    else {
LAB_0010d3ab:
                      uVar44 = (ulong)(byte)*puStack_70;
                      puStack_70 = (uint *)((long)puStack_70 + 1);
                    }
LAB_0010d3b5:
                    uVar39 = uVar39 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                  }
                  uVar39 = uVar39 << ((byte)uVar10 & 7);
                  uVar10 = uVar10 & 0x7ffffff8;
                }
                for (; (int)uVar10 < 0x10; uVar10 = uVar10 + 8) {
                  if (puStack_70 == *(uint **)((long)p + 0x30)) {
                    uVar44 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar39;
                      *(uint *)((long)p + 0x60) = uVar10;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(int *)((long)p + 0x6a0) = (int)uVar21;
                      *(int *)((long)p + 0x678) = (int)uVar19;
                      puVar17 = *(uint **)((long)p + 0x20);
                      plVar12 = *(long **)((long)p + 0x108);
                      goto LAB_0010eeb8;
                    }
                  }
                  else {
LAB_0010e6ac:
                    uVar44 = (ulong)(byte)*puStack_70;
                    puStack_70 = (uint *)((long)puStack_70 + 1);
                  }
LAB_0010e6b6:
                  uVar39 = uVar39 | uVar44 << (0x38U - (char)uVar10 & 0x3f);
                }
                uVar38 = uVar39 << 0x10;
                iVar43 = uVar10 - 0x10;
                if (uVar39 >> 0x30 != 0) {
                  *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_88;
                  *(ulong *)((long)p + 0x58) = uVar38;
                  *(int *)((long)p + 0x60) = iVar43;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  **(long **)((long)p + 0x108) = (long)puStack_70 - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = 0;
                  goto LAB_001103f1;
                }
                while( true ) {
                  uVar8 = (uint)uVar19;
                  uVar7 = (undefined4)uVar21;
                  if (0xf < iVar43) break;
                  if (puStack_70 == *(uint **)((long)p + 0x30)) {
                    uVar44 = 0;
                    if (*(char *)((long)p + 0x40) == '\0') {
                      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                      *(uint *)((long)p + 0xbc) = uStack_88;
                      *(ulong *)((long)p + 0x58) = uVar38;
                      *(int *)((long)p + 0x60) = iVar43;
                      *(uint **)((long)p + 0x28) = puStack_70;
                      *(uint *)((long)p + 0x690) = uStack_90;
                      *(int *)((long)p + 0x694) = iVar47;
                      *(uint *)((long)p + 0x698) = uStack_8c;
                      *(int *)((long)p + 0x69c) = iStack_84;
                      *(undefined4 *)((long)p + 0x6a0) = uVar7;
                      *(uint *)((long)p + 0x678) = uVar8;
                      plVar12 = *(long **)((long)p + 0x108);
                      puVar17 = *(uint **)((long)p + 0x20);
                      goto LAB_0010ee04;
                    }
                  }
                  else {
LAB_0010cf92:
                    uVar44 = (ulong)(byte)*puStack_70;
                    puStack_70 = (uint *)((long)puStack_70 + 1);
                  }
LAB_0010cf9c:
                  cVar27 = (char)iVar43;
                  iVar43 = iVar43 + 8;
                  uVar38 = uVar38 | uVar44 << (0x38U - cVar27 & 0x3f);
                }
                uVar44 = uVar38 << 0x10;
                uVar10 = iVar43 - 0x10;
                if ((short)(uVar38 >> 0x30) != -1) {
                  *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_88;
                  *(ulong *)((long)p + 0x58) = uVar44;
                  *(uint *)((long)p + 0x60) = uVar10;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  **(long **)((long)p + 0x108) = (long)puStack_70 - *(long *)((long)p + 0x20);
                  **(undefined8 **)((long)p + 0x118) = 0;
                  goto LAB_001103ad;
                }
                if ((*(uint *)((long)p + 0x71c) & 0xfffffffe) == 2) {
                  *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                  *(uint *)((long)p + 0xbc) = uStack_88;
                  *(ulong *)((long)p + 0x58) = uVar44;
                  *(uint *)((long)p + 0x60) = uVar10;
                  *(uint **)((long)p + 0x28) = puStack_70;
                  if (uVar8 == 0) {
                    **(long **)((long)p + 0x108) = (long)puStack_70 - *(long *)((long)p + 0x20);
                    **(ulong **)((long)p + 0x118) = (ulong)(uint)-*(int *)((long)p + 0x67c);
                    *(uint *)((long)p + 0x690) = uStack_90;
                    *(int *)((long)p + 0x694) = iVar47;
                    *(uint *)((long)p + 0x698) = uStack_8c;
                    *(int *)((long)p + 0x69c) = iStack_84;
                    *(undefined4 *)((long)p + 0x6a0) = uVar7;
                    *(undefined8 *)((long)p + 0x678) = 0;
                    *(undefined4 *)((long)p + 8) = 0x213;
                    return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                  }
                  *(uint *)((long)p + 0x690) = uStack_90;
                  *(int *)((long)p + 0x694) = iVar47;
                  *(uint *)((long)p + 0x698) = uStack_8c;
                  *(int *)((long)p + 0x69c) = iStack_84;
                  *(undefined4 *)((long)p + 0x6a0) = uVar7;
                  *(uint *)((long)p + 0x678) = uVar8;
                  pvVar29 = (void *)((ulong)*(uint *)((long)p + 0x6c8) + *(long *)((long)p + 0xf0) +
                                    (ulong)*(uint *)((long)p + 0x67c));
                  *(void **)((long)p + 0x6b0) = pvVar29;
                  uVar44 = (ulong)(uVar8 - (*(uint *)((long)p + 0x67c) + *(uint *)((long)p + 0x6c8))
                                  );
                  *(ulong *)((long)p + 0x6b8) = uVar44;
                  *(undefined4 *)((long)p + 0x6c8) = 0;
                  *(uint *)((long)p + 0x67c) = uVar8 & uVar11;
LAB_00110315:
                  if (uVar44 != 0) {
                    uVar19 = **(ulong **)((long)p + 0x118);
                    if (uVar19 <= uVar44) {
                      uVar44 = uVar19;
                    }
                    *(ulong *)((long)p + 0x6c0) = uVar44;
                    if ((*(byte *)((long)p + 0x144) & 2) == 0) {
                      memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
                    }
                    else if (uVar19 != 0) {
                      uVar19 = 0;
                      do {
                        sVar48 = uVar44 - uVar19;
                        if (0x1fff < sVar48) {
                          sVar48 = 0x2000;
                        }
                        memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                               (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
                        uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                                        *(uint *)((long)p + 0xf8));
                        *(uint *)((long)p + 0xf8) = uVar9;
                        uVar19 = uVar19 + sVar48;
                        uVar44 = *(ulong *)((long)p + 0x6c0);
                      } while (uVar19 < uVar44);
                    }
                    **(long **)((long)p + 0x108) =
                         *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
                    lVar22 = *(long *)((long)p + 0x6c0);
                    **(long **)((long)p + 0x118) = lVar22;
                    *(undefined4 *)((long)p + 8) = 0x1fc;
                    goto LAB_001110a3;
                  }
                  uVar8 = *(uint *)((long)p + 0x678);
                  uStack_90 = *(int *)((long)p + 0x690);
                  iVar47 = *(int *)((long)p + 0x694);
                  uStack_8c = *(int *)((long)p + 0x698);
                  iStack_84 = *(int *)((long)p + 0x69c);
                  uVar10 = *(uint *)((long)p + 0x6a0);
LAB_00110350:
                  uVar21 = (ulong)uVar10;
                  uVar19 = (ulong)uVar8;
                  puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
                  uStack_88 = *(uint *)((long)p + 0xbc);
                  uVar44 = *(ulong *)((long)p + 0x58);
                  uVar10 = *(uint *)((long)p + 0x60);
                }
                goto LAB_00110da9;
              }
            }
            if (puStack_70 != *(uint **)((long)p + 0x30)) {
LAB_0010d56f:
              uVar44 = (ulong)(byte)*puStack_70;
              puStack_70 = (uint *)((long)puStack_70 + 1);
              goto LAB_0010d575;
            }
            uVar44 = 0;
          } while (*(char *)((long)p + 0x40) != '\0');
          *(uint *)((long)p + 0xb8) = (uint)puStack_68;
          *(uint *)((long)p + 0xbc) = uStack_88;
          *(ulong *)((long)p + 0x58) = uVar21;
          *(uint *)((long)p + 0x60) = uVar10;
          *(uint **)((long)p + 0x28) = puStack_70;
          *(uint *)((long)p + 0x690) = uStack_90;
          *(uint *)((long)p + 0x694) = uVar45;
          *(uint *)((long)p + 0x698) = uStack_8c;
          *(int *)((long)p + 0x69c) = iStack_84;
          *(int *)((long)p + 0x6a0) = (int)uVar39;
          *(int *)((long)p + 0x678) = (int)uVar19;
          puVar17 = *(uint **)((long)p + 0x20);
          plVar12 = *(long **)((long)p + 0x108);
        }
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x2ae;
      }
    }
    else if (iVar47 < 0x2ea) {
      if (iVar47 != 0x2cd) {
        if (iVar47 == 0x2e4) {
          *(undefined4 *)((long)p + 8) = 0x2e4;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        goto switchD_0010c873_caseD_458;
      }
      puStack_70 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puStack_70;
      *(uint **)((long)p + 0x28) = puStack_70;
      *(long *)((long)p + 0x38) = lVar49;
      *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar17 = puStack_70;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        uVar45 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar19 = (ulong)*(uint *)((long)p + 0x678);
        uVar8 = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar21 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar49) goto LAB_0010e8e2;
        uVar44 = 0;
        goto LAB_0010e8e8;
      }
LAB_0010ef2c:
      *plVar12 = (long)puStack_70 - (long)puVar17;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x2cd;
    }
    else if (iVar47 == 0x2ea) {
      puStack_70 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puStack_70;
      *(uint **)((long)p + 0x28) = puStack_70;
      *(long *)((long)p + 0x38) = lVar49;
      uStack_58 = (uint *)((long)puStack_70 + lVar49);
      *(uint **)((long)p + 0x30) = uStack_58;
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar17 = puStack_70;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        uVar45 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar26 = *(uint *)((long)p + 0x678);
        uVar8 = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
        pdVar24 = pqVar33->m_pDecode_tables;
        goto LAB_00111557;
      }
LAB_0011166a:
      *plVar12 = (long)puStack_70 - (long)puVar17;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x2ea;
    }
    else {
      if (iVar47 != 0x304) goto switchD_0010c873_caseD_458;
      puStack_70 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puStack_70;
      *(uint **)((long)p + 0x28) = puStack_70;
      *(long *)((long)p + 0x38) = lVar49;
      puVar17 = (uint *)((long)puStack_70 + lVar49);
      *(uint **)((long)p + 0x30) = puVar17;
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar16 = puStack_70;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        puStack_68._0_4_ = *(uint *)((long)p + 0x6d0);
        uStack_90 = *(int *)((long)p + 0x690);
        uVar45 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar35 = *(uint *)((long)p + 0x678);
        uVar8 = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
        pdVar24 = pqVar33->m_pDecode_tables;
        goto LAB_001116f3;
      }
LAB_0011181a:
      *plVar12 = (long)puStack_70 - (long)puVar16;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x304;
    }
  }
  else if (iVar47 < 0x3ae) {
    if (iVar47 < 0x34d) {
      if (iVar47 < 0x32f) {
        if (iVar47 == 0x318) {
          puStack_70 = *(uint **)((long)p + 0x100);
          lVar49 = **(long **)((long)p + 0x108);
          *(uint **)((long)p + 0x20) = puStack_70;
          *(uint **)((long)p + 0x28) = puStack_70;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
          *(void **)((long)p + 0x6b0) = pvVar29;
          uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          *(ulong *)((long)p + 0x6b8) = uVar44;
          goto LAB_0010dfb6;
        }
        if (iVar47 == 0x329) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar16 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
            uVar26 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010e37a;
            uVar44 = 0;
            goto LAB_0010e380;
          }
LAB_0010ee4c:
          *plVar12 = (long)puVar17 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x329;
        }
        else {
          if (iVar47 != 0x32c) goto switchD_0010c873_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar16 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_90 = *(int *)((long)p + 0x690);
            iVar47 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            uVar8 = *(uint *)((long)p + 0xb8);
            uVar26 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010cada;
            uVar44 = 0;
            goto LAB_0010cae0;
          }
LAB_0010ecdc:
          *plVar12 = (long)puVar17 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x32c;
        }
      }
      else if (iVar47 < 0x33f) {
        if (iVar47 == 0x32f) {
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar16 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_90 = *(int *)((long)p + 0x690);
            uVar45 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            uVar40 = *(uint *)((long)p + 0xb8);
            uVar26 = *(uint *)((long)p + 0xbc);
            uVar21 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            if (0 < lVar49) goto LAB_0010da00;
            uVar44 = 0;
            goto LAB_0010da06;
          }
LAB_0010ec44:
          *plVar12 = (long)puVar17 - (long)puVar16;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x32f;
        }
        else {
          if (iVar47 != 0x336) goto switchD_0010c873_caseD_458;
          puVar17 = *(uint **)((long)p + 0x100);
          plVar12 = *(long **)((long)p + 0x108);
          lVar49 = *plVar12;
          *(uint **)((long)p + 0x20) = puVar17;
          *(uint **)((long)p + 0x28) = puVar17;
          *(long *)((long)p + 0x38) = lVar49;
          puVar16 = (uint *)((long)puVar17 + lVar49);
          *(uint **)((long)p + 0x30) = puVar16;
          *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
          puVar20 = puVar17;
          if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
            uVar35 = *(uint *)((long)p + 0x6d4);
            uStack_90 = *(int *)((long)p + 0x690);
            uVar45 = *(int *)((long)p + 0x694);
            uStack_8c = *(int *)((long)p + 0x698);
            iStack_84 = *(int *)((long)p + 0x69c);
            uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
            uVar19 = (ulong)*(uint *)((long)p + 0x678);
            uVar40 = *(uint *)((long)p + 0xb8);
            uStack_88 = *(uint *)((long)p + 0xbc);
            uVar44 = *(ulong *)((long)p + 0x58);
            uVar10 = *(uint *)((long)p + 0x60);
            pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
            pdVar24 = pqVar33->m_pDecode_tables;
            goto LAB_00111965;
          }
LAB_00111a65:
          *plVar12 = (long)puVar17 - (long)puVar20;
          **(undefined8 **)((long)p + 0x118) = 0;
          *(undefined4 *)((long)p + 8) = 0x336;
        }
      }
      else if (iVar47 == 0x33f) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x6d4);
          uStack_90 = *(int *)((long)p + 0x690);
          uVar45 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          uVar40 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar26 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_00111b94;
          uVar21 = 0;
          goto LAB_00111b9b;
        }
LAB_0010ecb0:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x33f;
      }
      else {
        if (iVar47 != 0x344) goto switchD_0010c873_caseD_458;
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar8 = *(uint *)((long)p + 0x6d4);
          uStack_90 = *(int *)((long)p + 0x690);
          uVar45 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          uVar40 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar21 = *(ulong *)((long)p + 0x58);
          iVar47 = *(int *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010d0a4;
          uVar44 = 0;
          goto LAB_0010d0aa;
        }
LAB_0010ebac:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x344;
      }
    }
    else if (iVar47 < 0x35f) {
      if (iVar47 == 0x34d) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        puVar16 = (uint *)((long)puVar17 + lVar49);
        *(uint **)((long)p + 0x30) = puVar16;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar20 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar45 = *(uint *)((long)p + 0x678);
          uVar8 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_00111d1c;
        }
LAB_00111e24:
        *plVar12 = (long)puVar17 - (long)puVar20;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x34d;
      }
      else if (iVar47 == 0x356) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          uVar8 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar45 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_00112085;
          uVar38 = 0;
          goto LAB_0011208f;
        }
LAB_0010ee94:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x356;
      }
      else {
        if (iVar47 != 0x35b) goto switchD_0010c873_caseD_458;
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar21 = (ulong)*(uint *)((long)p + 0x6d4);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          uVar8 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar38 = *(ulong *)((long)p + 0x58);
          iVar43 = *(int *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010cd0b;
          uVar44 = 0;
          goto LAB_0010cd11;
        }
LAB_0010ed24:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x35b;
      }
    }
    else if (iVar47 < 899) {
      if (iVar47 == 0x35f) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puStack_70 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar45 = *(int *)((long)p + 0x690);
          uStack_90 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          uVar8 = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar21 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010dbc9;
          uVar44 = 0;
          goto LAB_0010dbcf;
        }
LAB_0010ec8c:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x35f;
      }
      else {
        if (iVar47 != 0x368) goto switchD_0010c873_caseD_458;
        puStack_70 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puStack_70;
        *(uint **)((long)p + 0x28) = puStack_70;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puStack_70 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puStack_70;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar45 = *(int *)((long)p + 0x690);
          uStack_90 = *(int *)((long)p + 0x694);
          uVar26 = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar40 = *(uint *)((long)p + 0x678);
          uVar8 = *(uint *)((long)p + 0xb8);
          uVar37 = *(uint *)((long)p + 0xbc);
          uVar19 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010c7f0;
          uVar44 = 0;
          goto LAB_0010c7fe;
        }
LAB_0010eb88:
        *plVar12 = (long)puStack_70 - (long)puVar17;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x368;
      }
    }
    else if (iVar47 == 899) {
      puVar17 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar17;
      *(uint **)((long)p + 0x28) = puVar17;
      *(long *)((long)p + 0x38) = lVar49;
      puStack_70 = (uint *)((long)puVar17 + lVar49);
      *(uint **)((long)p + 0x30) = puStack_70;
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar16 = puVar17;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uVar35 = *(uint *)((long)p + 0x6d4);
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar39 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar8 = *(uint *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
        pdVar24 = pqVar33->m_pDecode_tables;
        goto LAB_001122e3;
      }
LAB_00112410:
      *plVar12 = (long)puVar17 - (long)puVar16;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 899;
    }
    else {
      if (iVar47 != 0x3a5) goto switchD_0010c873_caseD_458;
      puVar20 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar20;
      *(uint **)((long)p + 0x28) = puVar20;
      *(long *)((long)p + 0x38) = lVar49;
      puVar16 = (uint *)((long)puVar20 + lVar49);
      *(uint **)((long)p + 0x30) = puVar16;
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar17 = puVar20;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        iVar43 = *(int *)((long)p + 0x6d4);
        uVar8 = *(uint *)((long)p + 0x6d8);
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar45 = *(uint *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
        pdVar24 = pqVar33->m_pDecode_tables;
        goto LAB_001125a5;
      }
LAB_001126c6:
      *plVar12 = (long)puVar17 - (long)puVar20;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x3a5;
    }
  }
  else if (iVar47 < 0x442) {
    if (iVar47 < 0x3cb) {
      if (iVar47 == 0x3ae) {
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar16 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar26 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x6d8);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar45 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_001128dd;
          uVar39 = 0;
          goto LAB_001128e9;
        }
LAB_0010edb4:
        *plVar12 = (long)puVar17 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3ae;
      }
      else if (iVar47 == 0x3b3) {
        puVar16 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar16;
        *(uint **)((long)p + 0x28) = puVar16;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar16 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puVar16;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar26 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x6d8);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar39 = *(ulong *)((long)p + 0x58);
          iVar43 = *(int *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010e46e;
          uVar44 = 0;
          goto LAB_0010e479;
        }
LAB_0010ee70:
        *plVar12 = (long)puVar17 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3b3;
      }
      else {
        if (iVar47 != 0x3c4) goto switchD_0010c873_caseD_458;
        puVar17 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar17;
        *(uint **)((long)p + 0x28) = puVar17;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar16 = puVar17;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x6d8);
          uVar45 = *(uint *)((long)p + 0x6e0);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010cbfd;
          uVar39 = 0;
          goto LAB_0010cc03;
        }
LAB_0010ed00:
        *plVar12 = (long)puVar17 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3c4;
      }
    }
    else {
      if (0x3f3 < iVar47) {
        if (iVar47 == 0x3f4) {
          *(undefined4 *)((long)p + 8) = 0x3f4;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
        }
        if (iVar47 == 0x40e) {
          puStack_70 = *(uint **)((long)p + 0x100);
          lVar49 = **(long **)((long)p + 0x108);
          *(uint **)((long)p + 0x20) = puStack_70;
          *(uint **)((long)p + 0x28) = puStack_70;
          *(long *)((long)p + 0x38) = lVar49;
          *(byte **)((long)p + 0x30) = (byte *)(lVar49 + (long)puStack_70);
          *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
          pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
          *(void **)((long)p + 0x6b0) = pvVar29;
          uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
          *(ulong *)((long)p + 0x6b8) = uVar44;
          goto LAB_0010d132;
        }
        goto switchD_0010c873_caseD_458;
      }
      if (iVar47 == 0x3cb) {
        puVar16 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar16;
        *(uint **)((long)p + 0x28) = puVar16;
        *(long *)((long)p + 0x38) = lVar49;
        *(byte **)((long)p + 0x30) = (byte *)((long)puVar16 + lVar49);
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puVar16;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x6d8);
          uVar45 = *(uint *)((long)p + 0x6e0);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uVar19 = (ulong)*(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar10 = *(uint *)((long)p + 0x60);
          if (0 < lVar49) goto LAB_0010db00;
          uVar39 = 0;
          goto LAB_0010db0f;
        }
LAB_0010ec68:
        *plVar12 = (long)puVar17 - (long)puVar16;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3cb;
      }
      else {
        if (iVar47 != 0x3d4) goto switchD_0010c873_caseD_458;
        puVar20 = *(uint **)((long)p + 0x100);
        plVar12 = *(long **)((long)p + 0x108);
        lVar49 = *plVar12;
        *(uint **)((long)p + 0x20) = puVar20;
        *(uint **)((long)p + 0x28) = puVar20;
        *(long *)((long)p + 0x38) = lVar49;
        puVar16 = (uint *)((long)puVar20 + lVar49);
        *(uint **)((long)p + 0x30) = puVar16;
        *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
        puVar17 = puVar20;
        if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
          uVar35 = *(uint *)((long)p + 0x6d4);
          uVar8 = *(uint *)((long)p + 0x6d8);
          iVar43 = *(int *)((long)p + 0x6dc);
          uStack_90 = *(int *)((long)p + 0x690);
          iVar47 = *(int *)((long)p + 0x694);
          uStack_8c = *(int *)((long)p + 0x698);
          iStack_84 = *(int *)((long)p + 0x69c);
          uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
          uStack_78._4_4_ = *(uint *)((long)p + 0x678);
          puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
          uStack_88 = *(uint *)((long)p + 0xbc);
          uVar44 = *(ulong *)((long)p + 0x58);
          uVar26 = *(uint *)((long)p + 0x60);
          pqVar33 = *(quasi_adaptive_huffman_data_model **)((long)p + 200);
          pdVar24 = pqVar33->m_pDecode_tables;
          goto LAB_00112bc2;
        }
LAB_00112c7a:
        *plVar12 = (long)puVar17 - (long)puVar20;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x3d4;
      }
    }
  }
  else {
    if (0x47b < iVar47) {
      if ((iVar47 == 0x47c) || (iVar47 == 0x482)) {
        **(undefined8 **)((long)p + 0x108) = 0;
        **(undefined8 **)((long)p + 0x118) = 0;
        *(undefined4 *)((long)p + 8) = 0x482;
      }
switchD_0010c873_caseD_458:
      return *(lzham_decompress_status_t *)((long)p + 0x160);
    }
    switch(iVar47) {
    case 0x457:
      puStack_70 = *(uint **)((long)p + 0x100);
      lVar22 = **(long **)((long)p + 0x108);
      *(uint **)((long)p + 0x20) = puStack_70;
      *(uint **)((long)p + 0x28) = puStack_70;
      *(long *)((long)p + 0x38) = lVar22;
      *(byte **)((long)p + 0x30) = (byte *)(lVar22 + (long)puStack_70);
      *(undefined1 *)((long)p + 0x40) = *(undefined1 *)((long)p + 0x120);
      pvVar29 = (void *)(*(long *)((long)p + 0x6b0) + *(long *)((long)p + 0x6c0));
      *(void **)((long)p + 0x6b0) = pvVar29;
      uVar44 = *(long *)((long)p + 0x6b8) - *(long *)((long)p + 0x6c0);
      *(ulong *)((long)p + 0x6b8) = uVar44;
LAB_00110e69:
      if (uVar44 != 0) {
        uVar19 = **(ulong **)((long)p + 0x118);
        if (uVar19 <= uVar44) {
          uVar44 = uVar19;
        }
        *(ulong *)((long)p + 0x6c0) = uVar44;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          memcpy(*(void **)((long)p + 0x110),pvVar29,uVar44);
        }
        else if (uVar19 != 0) {
          uVar19 = 0;
          do {
            sVar48 = uVar44 - uVar19;
            if (0x1fff < sVar48) {
              sVar48 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x110) + uVar19),
                   (void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48);
            uVar9 = adler32((void *)(*(long *)((long)p + 0x6b0) + uVar19),sVar48,
                            *(uint *)((long)p + 0xf8));
            *(uint *)((long)p + 0xf8) = uVar9;
            uVar19 = uVar19 + sVar48;
            uVar44 = *(ulong *)((long)p + 0x6c0);
          } while (uVar19 < uVar44);
        }
        **(long **)((long)p + 0x108) = *(long *)((long)p + 0x28) - *(long *)((long)p + 0x20);
        lVar22 = *(long *)((long)p + 0x6c0);
        **(long **)((long)p + 0x118) = lVar22;
        *(undefined4 *)((long)p + 8) = 0x457;
LAB_001110a3:
        return (uint)(lVar22 == 0);
      }
      uStack_90 = *(int *)((long)p + 0x690);
      iVar47 = *(int *)((long)p + 0x694);
      uStack_8c = *(int *)((long)p + 0x698);
      iStack_84 = *(int *)((long)p + 0x69c);
      uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
      uVar7 = *(undefined4 *)((long)p + 0x678);
      puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
      uStack_88 = *(uint *)((long)p + 0xbc);
      uVar44 = *(ulong *)((long)p + 0x58);
      uVar10 = *(uint *)((long)p + 0x60);
      iVar43 = *(int *)((long)p + 0x160);
LAB_00110f0f:
      if (iVar43 == 3) {
        if ((uVar10 & 7) != 0) {
          for (; (int)uVar10 < 0; uVar10 = uVar10 + 8) {
            if (puStack_70 == *(uint **)((long)p + 0x30)) {
              uVar19 = 0;
              if (*(char *)((long)p + 0x40) == '\0') {
                *(uint *)((long)p + 0xb8) = (uint)puStack_68;
                *(uint *)((long)p + 0xbc) = uStack_88;
                *(ulong *)((long)p + 0x58) = uVar44;
                *(uint *)((long)p + 0x60) = uVar10;
                *(uint **)((long)p + 0x28) = puStack_70;
                *(uint *)((long)p + 0x690) = uStack_90;
                *(int *)((long)p + 0x694) = iVar47;
                *(uint *)((long)p + 0x698) = uStack_8c;
                *(int *)((long)p + 0x69c) = iStack_84;
                *(int *)((long)p + 0x6a0) = (int)uVar21;
                *(undefined4 *)((long)p + 0x678) = uVar7;
                puVar17 = *(uint **)((long)p + 0x20);
                plVar12 = *(long **)((long)p + 0x108);
                goto LAB_0010eb30;
              }
            }
            else {
LAB_0010d87e:
              uVar19 = (ulong)(byte)*puStack_70;
              puStack_70 = (uint *)((long)puStack_70 + 1);
            }
LAB_0010d889:
            uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
          }
          uVar44 = uVar44 << ((byte)uVar10 & 7);
          uVar10 = uVar10 & 0x7ffffff8;
        }
        for (; (int)uVar10 < 0x10; uVar10 = uVar10 + 8) {
          if (puStack_70 == *(uint **)((long)p + 0x30)) {
            uVar19 = 0;
            if (*(char *)((long)p + 0x40) == '\0') {
              *(uint *)((long)p + 0xb8) = (uint)puStack_68;
              *(uint *)((long)p + 0xbc) = uStack_88;
              *(ulong *)((long)p + 0x58) = uVar44;
              *(uint *)((long)p + 0x60) = uVar10;
              *(uint **)((long)p + 0x28) = puStack_70;
              *(uint *)((long)p + 0x690) = uStack_90;
              *(int *)((long)p + 0x694) = iVar47;
              *(uint *)((long)p + 0x698) = uStack_8c;
              *(int *)((long)p + 0x69c) = iStack_84;
              *(int *)((long)p + 0x6a0) = (int)uVar21;
              *(undefined4 *)((long)p + 0x678) = uVar7;
              puVar17 = *(uint **)((long)p + 0x20);
              plVar12 = *(long **)((long)p + 0x108);
              goto LAB_0010eb54;
            }
          }
          else {
LAB_0010d938:
            uVar19 = (ulong)(byte)*puStack_70;
            puStack_70 = (uint *)((long)puStack_70 + 1);
          }
LAB_0010d943:
          uVar44 = uVar44 | uVar19 << (0x38U - (char)uVar10 & 0x3f);
        }
        *(uint *)((long)p + 0x6cc) = (uint)(ushort)(uVar44 >> 0x30);
        uVar19 = uVar44 << 0x10;
        for (iVar43 = uVar10 - 0x10; iVar43 < 0x10; iVar43 = iVar43 + 8) {
          if (puStack_70 == *(uint **)((long)p + 0x30)) {
            uVar44 = 0;
            if (*(char *)((long)p + 0x40) == '\0') {
              *(uint *)((long)p + 0xb8) = (uint)puStack_68;
              *(uint *)((long)p + 0xbc) = uStack_88;
              *(ulong *)((long)p + 0x58) = uVar19;
              *(int *)((long)p + 0x60) = iVar43;
              *(uint **)((long)p + 0x28) = puStack_70;
              *(uint *)((long)p + 0x690) = uStack_90;
              *(int *)((long)p + 0x694) = iVar47;
              *(uint *)((long)p + 0x698) = uStack_8c;
              *(int *)((long)p + 0x69c) = iStack_84;
              *(int *)((long)p + 0x6a0) = (int)uVar21;
              *(undefined4 *)((long)p + 0x678) = uVar7;
              puVar17 = *(uint **)((long)p + 0x20);
              plVar12 = *(long **)((long)p + 0x108);
              goto LAB_0010eb0c;
            }
          }
          else {
LAB_0010d7c4:
            uVar44 = (ulong)(byte)*puStack_70;
            puStack_70 = (uint *)((long)puStack_70 + 1);
          }
LAB_0010d7cf:
          uVar19 = uVar19 | uVar44 << (0x38U - (char)iVar43 & 0x3f);
        }
        uVar44 = uVar19 << 0x10;
        uVar10 = iVar43 - 0x10;
        uVar46 = *(int *)((long)p + 0x6cc) << 0x10 | (uint)(ushort)(uVar19 >> 0x30);
        *(uint *)((long)p + 0x6cc) = uVar46;
        if ((*(byte *)((long)p + 0x144) & 2) == 0) {
          *(uint *)((long)p + 0xf8) = uVar46;
        }
        else if (uVar46 != *(uint *)((long)p + 0xf8)) {
          *(undefined4 *)((long)p + 0x160) = 8;
        }
      }
      *(uint *)((long)p + 0xb8) = (uint)puStack_68;
      *(uint *)((long)p + 0xbc) = uStack_88;
      *(ulong *)((long)p + 0x58) = uVar44;
      *(uint *)((long)p + 0x60) = uVar10;
      *(uint **)((long)p + 0x28) = puStack_70;
      uVar15 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x18));
      **(uint64 **)((long)p + 0x108) = uVar15;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 0x67c) = uVar7;
      *(undefined4 *)((long)p + 8) = 0x47c;
      return *(lzham_decompress_status_t *)((long)p + 0x160);
    case 0x458:
    case 0x459:
    case 0x45a:
    case 0x45b:
    case 0x45c:
    case 0x45e:
      goto switchD_0010c873_caseD_458;
    case 0x45d:
      puVar17 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar22 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar17;
      *(uint **)((long)p + 0x28) = puVar17;
      *(long *)((long)p + 0x38) = lVar22;
      *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puStack_70 = puVar17;
      if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar7 = *(undefined4 *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar22) goto LAB_0010d87e;
        uVar19 = 0;
        goto LAB_0010d889;
      }
LAB_0010eb30:
      *plVar12 = (long)puStack_70 - (long)puVar17;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x45d;
      break;
    case 0x45f:
      puVar17 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar22 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar17;
      *(uint **)((long)p + 0x28) = puVar17;
      *(long *)((long)p + 0x38) = lVar22;
      *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puStack_70 = puVar17;
      if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar7 = *(undefined4 *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar22) goto LAB_0010d938;
        uVar19 = 0;
        goto LAB_0010d943;
      }
LAB_0010eb54:
      *plVar12 = (long)puStack_70 - (long)puVar17;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x45f;
      break;
    case 0x460:
      puVar17 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar22 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar17;
      *(uint **)((long)p + 0x28) = puVar17;
      *(long *)((long)p + 0x38) = lVar22;
      *(byte **)((long)p + 0x30) = (byte *)((long)puVar17 + lVar22);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puStack_70 = puVar17;
      if ((lVar22 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar7 = *(undefined4 *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar19 = *(ulong *)((long)p + 0x58);
        iVar43 = *(int *)((long)p + 0x60);
        if (0 < lVar22) goto LAB_0010d7c4;
        uVar44 = 0;
        goto LAB_0010d7cf;
      }
LAB_0010eb0c:
      *plVar12 = (long)puStack_70 - (long)puVar17;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x460;
      break;
    default:
      if (iVar47 != 0x442) goto switchD_0010c873_caseD_458;
      puVar16 = *(uint **)((long)p + 0x100);
      plVar12 = *(long **)((long)p + 0x108);
      lVar49 = *plVar12;
      *(uint **)((long)p + 0x20) = puVar16;
      *(uint **)((long)p + 0x28) = puVar16;
      *(long *)((long)p + 0x38) = lVar49;
      *(byte **)((long)p + 0x30) = (byte *)((long)puVar16 + lVar49);
      *(byte *)((long)p + 0x40) = *(byte *)((long)p + 0x120);
      puVar17 = puVar16;
      if ((lVar49 != 0 | *(byte *)((long)p + 0x120)) == 1) {
        uStack_90 = *(int *)((long)p + 0x690);
        iVar47 = *(int *)((long)p + 0x694);
        uStack_8c = *(int *)((long)p + 0x698);
        iStack_84 = *(int *)((long)p + 0x69c);
        uVar21 = (ulong)*(uint *)((long)p + 0x6a0);
        uVar19 = (ulong)*(uint *)((long)p + 0x678);
        puStack_68._0_4_ = *(uint *)((long)p + 0xb8);
        uStack_88 = *(uint *)((long)p + 0xbc);
        uVar44 = *(ulong *)((long)p + 0x58);
        uVar10 = *(uint *)((long)p + 0x60);
        if (0 < lVar49) goto LAB_0010d6f2;
        uVar39 = 0;
        goto LAB_0010d6fc;
      }
LAB_0010ef7c:
      *plVar12 = (long)puVar17 - (long)puVar16;
      **(undefined8 **)((long)p + 0x118) = 0;
      *(undefined4 *)((long)p + 8) = 0x442;
    }
  }
  return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
switchD_0010a0da_caseD_1:
  uVar11 = 0;
  for (; uVar21 = uVar19, uVar45 < 4; uVar45 = uVar45 + 1) {
    for (; (int)uVar46 < 8; uVar46 = uVar46 + 8) {
      if (puStack_48 == *(uint **)((long)p + 0x30)) {
        uVar19 = 0;
        if (*(char *)((long)p + 0x40) == '\0') {
          *(uint *)((long)p + 0xb8) = uVar11;
          *(uint *)((long)p + 0xbc) = uVar45;
          *(ulong *)((long)p + 0x58) = uVar21;
          *(uint *)((long)p + 0x60) = uVar46;
          *(uint **)((long)p + 0x28) = puStack_48;
          *(uint *)((long)p + 0x690) = uVar8;
          *(uint *)((long)p + 0x694) = uStack_8c;
          *(int *)((long)p + 0x698) = (int)((ulong)lVar49 >> 0x20);
          *(uint *)((long)p + 0x69c) = uStack_90;
          *(uint *)((long)p + 0x6a0) = uStack_80._4_4_;
          *(int *)((long)p + 0x678) = (int)uStack_40;
          puVar17 = *(uint **)((long)p + 0x20);
          plVar12 = *(long **)((long)p + 0x108);
          goto LAB_0010897f;
        }
      }
      else {
LAB_00108365:
        uVar19 = (ulong)(byte)*puStack_48;
        puStack_48 = (uint *)((long)puStack_48 + 1);
      }
LAB_0010836b:
      cVar27 = (char)uVar46;
      uVar21 = uVar21 | uVar19 << (0x38U - cVar27 & 0x3f);
    }
    uVar19 = uVar21 << 8;
    uVar46 = uVar46 - 8;
    uVar11 = uVar11 << 8 | (uint)(byte)(uVar21 >> 0x38);
  }
  *(int *)((long)p + 0x6a4) = (int)uStack_40;
  uStack_90 = 1;
  uVar45 = 0;
  uVar10 = 0xffffffff;
  lVar49 = 0x100000000;
  uStack_8c = 1;
  uVar8 = 1;
  puStack_68 = puStack_48;
  goto LAB_0010aa52;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            // In unbuffered mode, the caller is not allowed to move the output buffer and the output pointer MUST always point to the beginning of the output buffer.
            // Also, the output buffer size must indicate the full size of the output buffer. The decompressor will track the current output offset, and during partial/sync
            // flushes it'll report how many bytes it has written since the call. 
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();
      
      return status;
   }